

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_step(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  int iVar3;
  int iVar4;
  ggml_type gVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  void *pvVar13;
  ggml_tensor *pgVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  byte bVar29;
  char cVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong in_RCX;
  char *pcVar37;
  long lVar38;
  long lVar39;
  ushort uVar40;
  undefined8 uVar41;
  ggml_tensor *pgVar42;
  ggml_tensor *pgVar43;
  ggml_tensor *pgVar44;
  ggml_tensor *pgVar45;
  ggml_tensor *pgVar46;
  uint uVar47;
  ggml_tensor *pgVar48;
  ggml_tensor *pgVar49;
  ggml_tensor *pgVar50;
  ulong uVar51;
  long in_R9;
  ulong uVar52;
  int64_t ir;
  long lVar53;
  long lVar54;
  ggml_tensor *src0;
  long lVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  anon_union_4_2_947300a4 u;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auStack_7c0 [64];
  undefined8 uStack_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  ggml_tensor *pgStack_660;
  ggml_tensor *pgStack_658;
  ggml_tensor *pgStack_650;
  long lStack_648;
  long lStack_640;
  size_t sStack_638;
  size_t sStack_630;
  size_t sStack_628;
  size_t sStack_620;
  size_t sStack_618;
  size_t sStack_610;
  ggml_tensor *pgStack_608;
  ggml_tensor *pgStack_600;
  size_t sStack_5f8;
  ggml_tensor *pgStack_5f0;
  ggml_tensor *pgStack_5e8;
  ggml_tensor *pgStack_5e0;
  ggml_tensor *pgStack_5d8;
  ggml_tensor *pgStack_5d0;
  ggml_tensor *pgStack_5c8;
  long lStack_5c0;
  long lStack_5b8;
  size_t sStack_5b0;
  size_t sStack_5a8;
  size_t sStack_5a0;
  size_t sStack_598;
  size_t sStack_590;
  size_t sStack_588;
  ggml_tensor *pgStack_580;
  ggml_tensor *pgStack_578;
  size_t sStack_570;
  ggml_tensor *pgStack_568;
  ggml_tensor *pgStack_560;
  ggml_tensor *pgStack_558;
  ggml_tensor *pgStack_550;
  ggml_tensor *pgStack_548;
  ggml_tensor *pgStack_540;
  long lStack_538;
  long lStack_530;
  size_t sStack_528;
  size_t sStack_520;
  size_t sStack_518;
  size_t sStack_510;
  size_t sStack_508;
  size_t sStack_500;
  ggml_tensor *pgStack_4f8;
  ggml_tensor *pgStack_4f0;
  size_t sStack_4e8;
  ggml_tensor *pgStack_4e0;
  ggml_tensor *pgStack_4d8;
  ggml_tensor *pgStack_4d0;
  ggml_tensor *pgStack_4c8;
  ggml_tensor *pgStack_4c0;
  ggml_tensor *pgStack_4b8;
  long lStack_4b0;
  long lStack_4a8;
  size_t sStack_4a0;
  size_t sStack_498;
  size_t sStack_490;
  size_t sStack_488;
  size_t sStack_480;
  size_t sStack_478;
  ggml_tensor *pgStack_470;
  ggml_tensor *pgStack_468;
  size_t sStack_460;
  ggml_tensor *pgStack_458;
  ggml_tensor *pgStack_450;
  ggml_tensor *pgStack_448;
  ggml_tensor *pgStack_440;
  ggml_tensor *pgStack_438;
  ggml_tensor *pgStack_430;
  ggml_tensor *pgStack_428;
  size_t sStack_420;
  size_t sStack_418;
  size_t sStack_410;
  size_t sStack_408;
  size_t sStack_400;
  ggml_tensor *pgStack_3f8;
  ggml_tensor *pgStack_3f0;
  ggml_tensor *pgStack_3e8;
  ggml_tensor *pgStack_3e0;
  ggml_tensor *pgStack_3d8;
  ggml_tensor *pgStack_3d0;
  
  pgVar42 = dst->src[0];
  gVar2 = pgVar42->type;
  if ((gVar2 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar30 = ggml_is_contiguous_1(pgVar42);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012a7c9;
      if (pgVar42->nb[0] == 4) {
        lVar39 = pgVar42->ne[1];
        lVar54 = pgVar42->ne[2];
        sVar6 = pgVar42->nb[1];
        sVar7 = pgVar42->nb[2];
        sVar8 = pgVar42->nb[3];
        lVar36 = dst->ne[0];
        sVar9 = dst->nb[1];
        sVar10 = dst->nb[2];
        sVar11 = dst->nb[3];
        iVar3 = params->ith;
        iVar4 = params->nth;
        lVar32 = ggml_nrows(pgVar42);
        lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
        lVar53 = iVar3 * lVar33;
        lVar33 = lVar33 + lVar53;
        if (lVar32 <= lVar33) {
          lVar33 = lVar32;
        }
        if (lVar33 <= lVar53) {
          return;
        }
        lVar54 = lVar54 * lVar39;
        pvVar12 = dst->data;
        pvVar13 = pgVar42->data;
        do {
          lVar32 = lVar53 / lVar54;
          lVar38 = lVar53 % lVar54;
          lVar34 = lVar38 / lVar39;
          lVar38 = lVar38 % lVar39;
          if (0 < lVar36) {
            lVar35 = 0;
            do {
              uVar41 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                      ZEXT416(*(uint *)((long)pvVar13 +
                                                       lVar35 * 4 +
                                                       lVar34 * sVar7 +
                                                       lVar38 * sVar6 + lVar32 * sVar8)),1);
              *(uint *)((long)pvVar12 +
                       lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                   (uint)((byte)uVar41 & 1) * 0x3f800000;
              lVar35 = lVar35 + 1;
            } while (lVar36 != lVar35);
          }
          lVar53 = lVar53 + 1;
        } while (lVar53 != lVar33);
        return;
      }
LAB_0012a7e5:
      pcVar37 = "nb00 == sizeof(src0_t)";
      uVar41 = 0x56;
      goto LAB_0012a7ff;
    }
  }
  else if ((gVar2 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar30 = ggml_is_contiguous_1(pgVar42);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar42->nb[0] == 2) {
          lVar39 = pgVar42->ne[1];
          lVar54 = pgVar42->ne[2];
          sVar6 = pgVar42->nb[1];
          sVar7 = pgVar42->nb[2];
          sVar8 = pgVar42->nb[3];
          lVar36 = dst->ne[0];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar32 = ggml_nrows();
          lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
          lVar53 = iVar3 * lVar33;
          lVar33 = lVar33 + lVar53;
          if (lVar32 <= lVar33) {
            lVar33 = lVar32;
          }
          if (lVar33 <= lVar53) {
            return;
          }
          lVar54 = lVar54 * lVar39;
          do {
            lVar32 = lVar53 % lVar54;
            if (0 < lVar36) {
              lVar34 = 0;
              do {
                uVar41 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                        ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pgVar42->data +
                                                                 lVar34 * 2 +
                                                                 (lVar32 / lVar39) * sVar7 +
                                                                 (lVar32 % lVar39) * sVar6 +
                                                                 (lVar53 / lVar54) * sVar8) * 4)),1)
                ;
                auVar73 = vcvtps2ph_f16c(ZEXT416((uint)((byte)uVar41 & 1) * 0x3f800000),0);
                vpextrw_avx(auVar73,0);
                lVar34 = lVar34 + 1;
              } while (lVar36 != lVar34);
            }
            lVar53 = lVar53 + 1;
          } while (lVar53 != lVar33);
          return;
        }
        goto LAB_0012a7e5;
      }
      goto LAB_0012a7c9;
    }
  }
  else if (gVar2 == GGML_TYPE_BF16) {
    gVar5 = dst->type;
    in_RCX = (ulong)gVar5;
    if (gVar5 == GGML_TYPE_F32) {
      cVar30 = ggml_is_contiguous_1(pgVar42);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar42->nb[0] == 2) {
            lVar39 = pgVar42->ne[1];
            lVar54 = pgVar42->ne[2];
            sVar6 = pgVar42->nb[1];
            sVar7 = pgVar42->nb[2];
            sVar8 = pgVar42->nb[3];
            lVar36 = dst->ne[0];
            sVar9 = dst->nb[1];
            sVar10 = dst->nb[2];
            sVar11 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar32 = ggml_nrows(pgVar42);
            lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
            lVar53 = iVar3 * lVar33;
            lVar33 = lVar33 + lVar53;
            if (lVar32 <= lVar33) {
              lVar33 = lVar32;
            }
            if (lVar33 <= lVar53) {
              return;
            }
            lVar54 = lVar54 * lVar39;
            pvVar12 = dst->data;
            pvVar13 = pgVar42->data;
            auVar69 = vpbroadcastq_avx512f();
            auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              lVar32 = lVar53 / lVar54;
              lVar38 = lVar53 % lVar54;
              lVar34 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                uVar52 = 0;
                do {
                  auVar67 = vpbroadcastq_avx512f();
                  auVar68 = vporq_avx512f(auVar67,auVar65);
                  auVar67 = vporq_avx512f(auVar67,auVar66);
                  uVar41 = vpcmpuq_avx512f(auVar67,auVar69,2);
                  bVar28 = (byte)uVar41;
                  uVar41 = vpcmpuq_avx512f(auVar68,auVar69,2);
                  bVar29 = (byte)uVar41;
                  uVar40 = CONCAT11(bVar29,bVar28);
                  auVar61 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                ((long)pvVar13 +
                                                uVar52 * 2 +
                                                lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8));
                  auVar56._2_2_ = (ushort)((byte)(uVar40 >> 1) & 1) * auVar61._2_2_;
                  auVar56._0_2_ = (ushort)(bVar28 & 1) * auVar61._0_2_;
                  auVar56._4_2_ = (ushort)((byte)(uVar40 >> 2) & 1) * auVar61._4_2_;
                  auVar56._6_2_ = (ushort)((byte)(uVar40 >> 3) & 1) * auVar61._6_2_;
                  auVar56._8_2_ = (ushort)((byte)(uVar40 >> 4) & 1) * auVar61._8_2_;
                  auVar56._10_2_ = (ushort)((byte)(uVar40 >> 5) & 1) * auVar61._10_2_;
                  auVar56._12_2_ = (ushort)((byte)(uVar40 >> 6) & 1) * auVar61._12_2_;
                  auVar56._14_2_ = (ushort)((byte)(uVar40 >> 7) & 1) * auVar61._14_2_;
                  auVar56._16_2_ = (ushort)(bVar29 & 1) * auVar61._16_2_;
                  auVar56._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar61._18_2_;
                  auVar56._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar61._20_2_;
                  auVar56._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar61._22_2_;
                  auVar56._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar61._24_2_;
                  auVar56._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar61._26_2_;
                  auVar56._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar61._28_2_;
                  auVar56._30_2_ = (ushort)(bVar29 >> 7) * auVar61._30_2_;
                  auVar67 = vpmovzxwd_avx512f(auVar56);
                  auVar67 = vpslld_avx512f(auVar67,0x10);
                  uVar51 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar67,1);
                  auVar67 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  puVar1 = (uint *)((long)pvVar12 +
                                   uVar52 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11);
                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                  bVar16 = (bool)((byte)(uVar40 >> 2) & 1);
                  bVar17 = (bool)((byte)(uVar40 >> 3) & 1);
                  bVar18 = (bool)((byte)(uVar40 >> 4) & 1);
                  bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
                  bVar20 = (bool)((byte)(uVar40 >> 6) & 1);
                  bVar21 = (bool)((byte)(uVar40 >> 7) & 1);
                  bVar22 = (bool)(bVar29 >> 1 & 1);
                  bVar23 = (bool)(bVar29 >> 2 & 1);
                  bVar24 = (bool)(bVar29 >> 3 & 1);
                  bVar25 = (bool)(bVar29 >> 4 & 1);
                  bVar26 = (bool)(bVar29 >> 5 & 1);
                  bVar27 = (bool)(bVar29 >> 6 & 1);
                  *puVar1 = (uint)(bVar28 & 1) * (uint)((byte)uVar51 & 1) * auVar67._0_4_ |
                            (uint)!(bool)(bVar28 & 1) * *puVar1;
                  puVar1[1] = (uint)bVar15 * (uint)((byte)(uVar51 >> 1) & 1) * auVar67._4_4_ |
                              (uint)!bVar15 * puVar1[1];
                  puVar1[2] = (uint)bVar16 * (uint)((byte)(uVar51 >> 2) & 1) * auVar67._8_4_ |
                              (uint)!bVar16 * puVar1[2];
                  puVar1[3] = (uint)bVar17 * (uint)((byte)(uVar51 >> 3) & 1) * auVar67._12_4_ |
                              (uint)!bVar17 * puVar1[3];
                  puVar1[4] = (uint)bVar18 * (uint)((byte)(uVar51 >> 4) & 1) * auVar67._16_4_ |
                              (uint)!bVar18 * puVar1[4];
                  puVar1[5] = (uint)bVar19 * (uint)((byte)(uVar51 >> 5) & 1) * auVar67._20_4_ |
                              (uint)!bVar19 * puVar1[5];
                  puVar1[6] = (uint)bVar20 * (uint)((byte)(uVar51 >> 6) & 1) * auVar67._24_4_ |
                              (uint)!bVar20 * puVar1[6];
                  puVar1[7] = (uint)bVar21 * (uint)((byte)(uVar51 >> 7) & 1) * auVar67._28_4_ |
                              (uint)!bVar21 * puVar1[7];
                  puVar1[8] = (uint)(bVar29 & 1) * (uint)((byte)(uVar51 >> 8) & 1) * auVar67._32_4_
                              | (uint)!(bool)(bVar29 & 1) * puVar1[8];
                  puVar1[9] = (uint)bVar22 * (uint)((byte)(uVar51 >> 9) & 1) * auVar67._36_4_ |
                              (uint)!bVar22 * puVar1[9];
                  puVar1[10] = (uint)bVar23 * (uint)((byte)(uVar51 >> 10) & 1) * auVar67._40_4_ |
                               (uint)!bVar23 * puVar1[10];
                  puVar1[0xb] = (uint)bVar24 * (uint)((byte)(uVar51 >> 0xb) & 1) * auVar67._44_4_ |
                                (uint)!bVar24 * puVar1[0xb];
                  puVar1[0xc] = (uint)bVar25 * (uint)((byte)(uVar51 >> 0xc) & 1) * auVar67._48_4_ |
                                (uint)!bVar25 * puVar1[0xc];
                  puVar1[0xd] = (uint)bVar26 * (uint)((byte)(uVar51 >> 0xd) & 1) * auVar67._52_4_ |
                                (uint)!bVar26 * puVar1[0xd];
                  puVar1[0xe] = (uint)bVar27 * (uint)((byte)(uVar51 >> 0xe) & 1) * auVar67._56_4_ |
                                (uint)!bVar27 * puVar1[0xe];
                  puVar1[0xf] = (uint)(bVar29 >> 7) * (uint)(byte)(uVar51 >> 0xf) * auVar67._60_4_ |
                                (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                  uVar52 = uVar52 + 0x10;
                } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar52);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar33);
            return;
          }
          goto LAB_0012a7e5;
        }
        goto LAB_0012a7c9;
      }
    }
    else {
      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012a2db;
      cVar30 = ggml_is_contiguous_1(pgVar42);
      if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
         (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar42->nb[0] == 2) {
            lVar39 = pgVar42->ne[1];
            lVar54 = pgVar42->ne[2];
            sVar6 = pgVar42->nb[1];
            sVar7 = pgVar42->nb[2];
            sVar8 = pgVar42->nb[3];
            lVar36 = dst->ne[0];
            sVar9 = dst->nb[1];
            sVar10 = dst->nb[2];
            sVar11 = dst->nb[3];
            iVar3 = params->ith;
            iVar4 = params->nth;
            lVar32 = ggml_nrows(pgVar42);
            lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
            lVar53 = iVar3 * lVar33;
            lVar33 = lVar33 + lVar53;
            if (lVar32 <= lVar33) {
              lVar33 = lVar32;
            }
            if (lVar33 <= lVar53) {
              return;
            }
            lVar54 = lVar54 * lVar39;
            pvVar12 = dst->data;
            pvVar13 = pgVar42->data;
            do {
              lVar32 = lVar53 / lVar54;
              lVar38 = lVar53 % lVar54;
              lVar34 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                lVar35 = 0;
                do {
                  uVar41 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                          ZEXT216(*(ushort *)
                                                   ((long)pvVar13 +
                                                   lVar35 * 2 +
                                                   lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8)
                                                 ) << 0x10,1);
                  uVar31 = (uint)((byte)uVar41 & 1) * 0x3f800000;
                  if (uVar31 < 0x7f800001) {
                    uVar40 = (ushort)(uVar31 + 0x7fff >> 0x10);
                  }
                  else {
                    uVar40 = (ushort)(uVar31 >> 0x10) | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar12 + lVar35 * 2 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11)
                       = uVar40;
                  lVar35 = lVar35 + 1;
                } while (lVar36 != lVar35);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar33);
            return;
          }
          goto LAB_0012a7e5;
        }
        goto LAB_0012a7c9;
      }
    }
  }
  else {
LAB_0012a2db:
    if ((gVar2 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      ggml_compute_forward_step_cold_1();
      pgVar43 = pgVar42->src[0];
      gVar2 = pgVar43->type;
      if ((gVar2 == GGML_TYPE_F32) && (pgVar42->type == GGML_TYPE_F32)) {
        cVar30 = ggml_is_contiguous_1(pgVar43);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
          if (pgVar42->nb[0] != 4) goto LAB_0012b055;
          if (pgVar43->nb[0] == 4) {
            lVar39 = pgVar43->ne[1];
            lVar54 = pgVar43->ne[2];
            sVar6 = pgVar43->nb[1];
            sVar7 = pgVar43->nb[2];
            sVar8 = pgVar43->nb[3];
            lVar36 = pgVar42->ne[0];
            sVar9 = pgVar42->nb[1];
            sVar10 = pgVar42->nb[2];
            sVar11 = pgVar42->nb[3];
            gVar2 = dst->type;
            iVar3 = *(int *)&dst->field_0x4;
            lVar32 = ggml_nrows(pgVar43);
            lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
            lVar53 = (int)gVar2 * lVar33;
            lVar33 = lVar33 + lVar53;
            if (lVar32 <= lVar33) {
              lVar33 = lVar32;
            }
            if (lVar33 <= lVar53) {
              return;
            }
            lVar54 = lVar54 * lVar39;
            do {
              lVar32 = lVar53 / lVar54;
              lVar38 = lVar53 % lVar54;
              lVar34 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                pvVar12 = pgVar42->data;
                pvVar13 = pgVar43->data;
                lVar35 = 0;
                do {
                  fVar70 = tanhf(*(float *)((long)pvVar13 +
                                           lVar35 * 4 +
                                           lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8));
                  *(float *)((long)pvVar12 +
                            lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                       fVar70;
                  lVar35 = lVar35 + 1;
                } while (lVar36 != lVar35);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar33);
            return;
          }
LAB_0012b071:
          pcVar37 = "nb00 == sizeof(src0_t)";
          uVar41 = 0x56;
          goto LAB_0012b08b;
        }
      }
      else if ((gVar2 == GGML_TYPE_F16) && (pgVar42->type == GGML_TYPE_F16)) {
        cVar30 = ggml_is_contiguous_1(pgVar43);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
          if (pgVar42->nb[0] == 2) {
            if (pgVar43->nb[0] == 2) {
              lVar39 = pgVar43->ne[1];
              lVar54 = pgVar43->ne[2];
              sVar6 = pgVar43->nb[1];
              sVar7 = pgVar43->nb[2];
              sVar8 = pgVar43->nb[3];
              lVar36 = pgVar42->ne[0];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar32 = ggml_nrows(pgVar43);
              lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
              lVar53 = (int)gVar2 * lVar33;
              lVar33 = lVar33 + lVar53;
              if (lVar32 <= lVar33) {
                lVar33 = lVar32;
              }
              if (lVar33 <= lVar53) {
                return;
              }
              lVar54 = lVar54 * lVar39;
              do {
                lVar32 = lVar53 % lVar54;
                if (0 < lVar36) {
                  pvVar12 = pgVar43->data;
                  lVar34 = 0;
                  do {
                    auVar64._0_4_ =
                         tanhf(*(float *)(&ggml_table_f32_f16 +
                                         (ulong)*(ushort *)
                                                 ((long)pvVar12 +
                                                 lVar34 * 2 +
                                                 (lVar32 / lVar39) * sVar7 +
                                                 (lVar32 % lVar39) * sVar6 +
                                                 (lVar53 / lVar54) * sVar8) * 4));
                    auVar64._4_60_ = extraout_var;
                    auVar73 = vcvtps2ph_f16c(auVar64._0_16_,0);
                    vpextrw_avx(auVar73,0);
                    lVar34 = lVar34 + 1;
                  } while (lVar36 != lVar34);
                }
                lVar53 = lVar53 + 1;
              } while (lVar53 != lVar33);
              return;
            }
            goto LAB_0012b071;
          }
          goto LAB_0012b055;
        }
      }
      else if (gVar2 == GGML_TYPE_BF16) {
        gVar5 = pgVar42->type;
        in_RCX = (ulong)gVar5;
        if (gVar5 == GGML_TYPE_F32) {
          cVar30 = ggml_is_contiguous_1(pgVar43);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
            if (pgVar42->nb[0] == 4) {
              if (pgVar43->nb[0] == 2) {
                lVar39 = pgVar43->ne[1];
                lVar54 = pgVar43->ne[2];
                sVar6 = pgVar43->nb[1];
                sVar7 = pgVar43->nb[2];
                sVar8 = pgVar43->nb[3];
                lVar36 = pgVar42->ne[0];
                sVar9 = pgVar42->nb[1];
                sVar10 = pgVar42->nb[2];
                sVar11 = pgVar42->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar32 = ggml_nrows(pgVar43);
                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                lVar53 = (int)gVar2 * lVar33;
                lVar33 = lVar33 + lVar53;
                if (lVar32 <= lVar33) {
                  lVar33 = lVar32;
                }
                if (lVar33 <= lVar53) {
                  return;
                }
                lVar54 = lVar54 * lVar39;
                do {
                  lVar32 = lVar53 / lVar54;
                  lVar38 = lVar53 % lVar54;
                  lVar34 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    pvVar12 = pgVar42->data;
                    pvVar13 = pgVar43->data;
                    lVar35 = 0;
                    do {
                      fVar70 = tanhf((float)((uint)*(ushort *)
                                                    ((long)pvVar13 +
                                                    lVar35 * 2 +
                                                    lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8
                                                    ) << 0x10));
                      *(float *)((long)pvVar12 +
                                lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                           fVar70;
                      lVar35 = lVar35 + 1;
                    } while (lVar36 != lVar35);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar33);
                return;
              }
              goto LAB_0012b071;
            }
            goto LAB_0012b055;
          }
        }
        else {
          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012abaa;
          cVar30 = ggml_is_contiguous_1(pgVar43);
          if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
             (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
            if (pgVar42->nb[0] == 2) {
              if (pgVar43->nb[0] == 2) {
                lVar39 = pgVar43->ne[1];
                lVar54 = pgVar43->ne[2];
                sVar6 = pgVar43->nb[1];
                sVar7 = pgVar43->nb[2];
                sVar8 = pgVar43->nb[3];
                lVar36 = pgVar42->ne[0];
                sVar9 = pgVar42->nb[1];
                sVar10 = pgVar42->nb[2];
                sVar11 = pgVar42->nb[3];
                gVar2 = dst->type;
                iVar3 = *(int *)&dst->field_0x4;
                lVar32 = ggml_nrows(pgVar43);
                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                lVar53 = (int)gVar2 * lVar33;
                lVar33 = lVar33 + lVar53;
                if (lVar32 <= lVar33) {
                  lVar33 = lVar32;
                }
                if (lVar33 <= lVar53) {
                  return;
                }
                lVar54 = lVar54 * lVar39;
                do {
                  lVar32 = lVar53 / lVar54;
                  lVar38 = lVar53 % lVar54;
                  lVar34 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    pvVar12 = pgVar42->data;
                    pvVar13 = pgVar43->data;
                    lVar35 = 0;
                    do {
                      fVar70 = tanhf((float)((uint)*(ushort *)
                                                    ((long)pvVar13 +
                                                    lVar35 * 2 +
                                                    lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8
                                                    ) << 0x10));
                      if ((uint)ABS(fVar70) < 0x7f800001) {
                        uVar40 = (ushort)((int)fVar70 + 0x7fff + ((uint)fVar70 >> 0x10 & 1) >> 0x10)
                        ;
                      }
                      else {
                        uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                      }
                      *(ushort *)
                       ((long)pvVar12 +
                       lVar35 * 2 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) = uVar40;
                      lVar35 = lVar35 + 1;
                    } while (lVar36 != lVar35);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar33);
                return;
              }
              goto LAB_0012b071;
            }
            goto LAB_0012b055;
          }
        }
      }
      else {
LAB_0012abaa:
        if ((gVar2 != GGML_TYPE_F16) || (pgVar42->type != GGML_TYPE_F32)) {
          ggml_compute_forward_tanh_cold_1();
          pgVar46 = pgVar43->src[0];
          gVar2 = pgVar46->type;
          if ((gVar2 == GGML_TYPE_F32) && (pgVar43->type == GGML_TYPE_F32)) {
            cVar30 = ggml_is_contiguous_1(pgVar46);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar46,pgVar43), cVar30 != '\0')) {
              if (pgVar43->nb[0] != 4) goto LAB_0012b92f;
              if (pgVar46->nb[0] == 4) {
                lVar39 = pgVar46->ne[1];
                lVar54 = pgVar46->ne[2];
                sVar6 = pgVar46->nb[1];
                sVar7 = pgVar46->nb[2];
                sVar8 = pgVar46->nb[3];
                lVar36 = pgVar43->ne[0];
                sVar9 = pgVar43->nb[1];
                sVar10 = pgVar43->nb[2];
                sVar11 = pgVar43->nb[3];
                gVar2 = pgVar42->type;
                iVar3 = *(int *)&pgVar42->field_0x4;
                lVar32 = ggml_nrows(pgVar46);
                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                lVar53 = (int)gVar2 * lVar33;
                lVar33 = lVar33 + lVar53;
                if (lVar32 <= lVar33) {
                  lVar33 = lVar32;
                }
                if (lVar33 <= lVar53) {
                  return;
                }
                lVar54 = lVar54 * lVar39;
                do {
                  lVar32 = lVar53 / lVar54;
                  lVar38 = lVar53 % lVar54;
                  lVar34 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    pvVar12 = pgVar43->data;
                    pvVar13 = pgVar46->data;
                    lVar35 = 0;
                    do {
                      fVar70 = *(float *)((long)pvVar13 +
                                         lVar35 * 4 +
                                         lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8);
                      if (fVar70 <= 0.0) {
                        fVar70 = expm1f(fVar70);
                      }
                      *(float *)((long)pvVar12 +
                                lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                           fVar70;
                      lVar35 = lVar35 + 1;
                    } while (lVar36 != lVar35);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar33);
                return;
              }
LAB_0012b94b:
              pcVar37 = "nb00 == sizeof(src0_t)";
              uVar41 = 0x56;
              goto LAB_0012b965;
            }
          }
          else if ((gVar2 == GGML_TYPE_F16) && (pgVar43->type == GGML_TYPE_F16)) {
            cVar30 = ggml_is_contiguous_1(pgVar46);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar46,pgVar43), cVar30 != '\0')) {
              if (pgVar43->nb[0] == 2) {
                if (pgVar46->nb[0] == 2) {
                  lVar39 = pgVar46->ne[1];
                  lVar54 = pgVar46->ne[2];
                  sVar6 = pgVar46->nb[1];
                  sVar7 = pgVar46->nb[2];
                  sVar8 = pgVar46->nb[3];
                  lVar36 = pgVar43->ne[0];
                  gVar2 = pgVar42->type;
                  iVar3 = *(int *)&pgVar42->field_0x4;
                  lVar32 = ggml_nrows(pgVar46);
                  lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                  lVar53 = (int)gVar2 * lVar33;
                  lVar33 = lVar33 + lVar53;
                  if (lVar32 <= lVar33) {
                    lVar33 = lVar32;
                  }
                  if (lVar33 <= lVar53) {
                    return;
                  }
                  lVar54 = lVar54 * lVar39;
                  do {
                    lVar32 = lVar53 % lVar54;
                    if (0 < lVar36) {
                      pvVar12 = pgVar46->data;
                      lVar34 = 0;
                      do {
                        fVar70 = *(float *)(&ggml_table_f32_f16 +
                                           (ulong)*(ushort *)
                                                   ((long)pvVar12 +
                                                   lVar34 * 2 +
                                                   (lVar32 / lVar39) * sVar7 +
                                                   (lVar32 % lVar39) * sVar6 +
                                                   (lVar53 / lVar54) * sVar8) * 4);
                        auVar73 = ZEXT416((uint)fVar70);
                        if (fVar70 <= 0.0) {
                          auVar63._0_4_ = expm1f(fVar70);
                          auVar63._4_60_ = extraout_var_00;
                          auVar73 = auVar63._0_16_;
                        }
                        auVar73 = vcvtps2ph_f16c(auVar73,0);
                        vpextrw_avx(auVar73,0);
                        lVar34 = lVar34 + 1;
                      } while (lVar36 != lVar34);
                    }
                    lVar53 = lVar53 + 1;
                  } while (lVar53 != lVar33);
                  return;
                }
                goto LAB_0012b94b;
              }
              goto LAB_0012b92f;
            }
          }
          else if (gVar2 == GGML_TYPE_BF16) {
            gVar5 = pgVar43->type;
            in_RCX = (ulong)gVar5;
            if (gVar5 == GGML_TYPE_F32) {
              cVar30 = ggml_is_contiguous_1(pgVar46);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar46,pgVar43), cVar30 != '\0')) {
                if (pgVar43->nb[0] == 4) {
                  if (pgVar46->nb[0] == 2) {
                    lVar39 = pgVar46->ne[1];
                    lVar54 = pgVar46->ne[2];
                    sVar6 = pgVar46->nb[1];
                    sVar7 = pgVar46->nb[2];
                    sVar8 = pgVar46->nb[3];
                    lVar36 = pgVar43->ne[0];
                    sVar9 = pgVar43->nb[1];
                    sVar10 = pgVar43->nb[2];
                    sVar11 = pgVar43->nb[3];
                    gVar2 = pgVar42->type;
                    iVar3 = *(int *)&pgVar42->field_0x4;
                    lVar32 = ggml_nrows(pgVar46);
                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                    lVar53 = (int)gVar2 * lVar33;
                    lVar33 = lVar33 + lVar53;
                    if (lVar32 <= lVar33) {
                      lVar33 = lVar32;
                    }
                    if (lVar33 <= lVar53) {
                      return;
                    }
                    lVar54 = lVar54 * lVar39;
                    do {
                      lVar32 = lVar53 / lVar54;
                      lVar38 = lVar53 % lVar54;
                      lVar34 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        pvVar12 = pgVar43->data;
                        pvVar13 = pgVar46->data;
                        lVar35 = 0;
                        do {
                          fVar70 = (float)((uint)*(ushort *)
                                                  ((long)pvVar13 +
                                                  lVar35 * 2 +
                                                  lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8)
                                          << 0x10);
                          if (fVar70 <= 0.0) {
                            fVar70 = expm1f(fVar70);
                          }
                          *(float *)((long)pvVar12 +
                                    lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11)
                               = fVar70;
                          lVar35 = lVar35 + 1;
                        } while (lVar36 != lVar35);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar33);
                    return;
                  }
                  goto LAB_0012b94b;
                }
                goto LAB_0012b92f;
              }
            }
            else {
              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012b456;
              cVar30 = ggml_is_contiguous_1(pgVar46);
              if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                 (cVar30 = ggml_are_same_shape(pgVar46,pgVar43), cVar30 != '\0')) {
                if (pgVar43->nb[0] == 2) {
                  if (pgVar46->nb[0] == 2) {
                    lVar39 = pgVar46->ne[1];
                    lVar54 = pgVar46->ne[2];
                    sVar6 = pgVar46->nb[1];
                    sVar7 = pgVar46->nb[2];
                    sVar8 = pgVar46->nb[3];
                    lVar36 = pgVar43->ne[0];
                    sVar9 = pgVar43->nb[1];
                    sVar10 = pgVar43->nb[2];
                    sVar11 = pgVar43->nb[3];
                    gVar2 = pgVar42->type;
                    iVar3 = *(int *)&pgVar42->field_0x4;
                    lVar32 = ggml_nrows(pgVar46);
                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                    lVar53 = (int)gVar2 * lVar33;
                    lVar33 = lVar33 + lVar53;
                    if (lVar32 <= lVar33) {
                      lVar33 = lVar32;
                    }
                    if (lVar33 <= lVar53) {
                      return;
                    }
                    lVar54 = lVar54 * lVar39;
                    do {
                      lVar32 = lVar53 / lVar54;
                      lVar38 = lVar53 % lVar54;
                      lVar34 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        pvVar12 = pgVar43->data;
                        pvVar13 = pgVar46->data;
                        lVar35 = 0;
                        do {
                          fVar70 = (float)((uint)*(ushort *)
                                                  ((long)pvVar13 +
                                                  lVar35 * 2 +
                                                  lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8)
                                          << 0x10);
                          if (fVar70 <= 0.0) {
                            fVar70 = expm1f(fVar70);
                          }
                          if ((uint)ABS(fVar70) < 0x7f800001) {
                            uVar40 = (ushort)((int)fVar70 + 0x7fff + ((uint)fVar70 >> 0x10 & 1) >>
                                             0x10);
                          }
                          else {
                            uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                          }
                          *(ushort *)
                           ((long)pvVar12 +
                           lVar35 * 2 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) = uVar40
                          ;
                          lVar35 = lVar35 + 1;
                        } while (lVar36 != lVar35);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar33);
                    return;
                  }
                  goto LAB_0012b94b;
                }
                goto LAB_0012b92f;
              }
            }
          }
          else {
LAB_0012b456:
            if ((gVar2 != GGML_TYPE_F16) || (pgVar43->type != GGML_TYPE_F32)) {
              pgVar44 = pgVar46;
              ggml_compute_forward_elu_cold_1();
              pgVar42 = pgVar44->src[0];
              gVar2 = pgVar42->type;
              if ((gVar2 == GGML_TYPE_F32) && (pgVar44->type == GGML_TYPE_F32)) {
                cVar30 = ggml_is_contiguous_1(pgVar42);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                  if (pgVar44->nb[0] != 4) goto LAB_0012c1b5;
                  if (pgVar42->nb[0] == 4) {
                    lVar39 = pgVar42->ne[1];
                    lVar54 = pgVar42->ne[2];
                    sVar6 = pgVar42->nb[1];
                    sVar7 = pgVar42->nb[2];
                    sVar8 = pgVar42->nb[3];
                    lVar36 = pgVar44->ne[0];
                    sVar9 = pgVar44->nb[1];
                    sVar10 = pgVar44->nb[2];
                    sVar11 = pgVar44->nb[3];
                    gVar2 = pgVar43->type;
                    iVar3 = *(int *)&pgVar43->field_0x4;
                    lVar32 = ggml_nrows(pgVar42);
                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                    lVar53 = (int)gVar2 * lVar33;
                    lVar33 = lVar33 + lVar53;
                    if (lVar32 <= lVar33) {
                      lVar33 = lVar32;
                    }
                    if (lVar33 <= lVar53) {
                      return;
                    }
                    lVar54 = lVar54 * lVar39;
                    pvVar12 = pgVar44->data;
                    pvVar13 = pgVar42->data;
                    do {
                      lVar32 = lVar53 / lVar54;
                      lVar38 = lVar53 % lVar54;
                      lVar34 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        lVar35 = 0;
                        do {
                          auVar73 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar13 +
                                                                lVar35 * 4 +
                                                                lVar34 * sVar7 +
                                                                lVar38 * sVar6 + lVar32 * sVar8)),
                                               ZEXT816(0) << 0x40);
                          *(int *)((long)pvVar12 +
                                  lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                               auVar73._0_4_;
                          lVar35 = lVar35 + 1;
                        } while (lVar36 != lVar35);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar33);
                    return;
                  }
LAB_0012c1d1:
                  pcVar37 = "nb00 == sizeof(src0_t)";
                  uVar41 = 0x56;
                  goto LAB_0012c1eb;
                }
              }
              else if ((gVar2 == GGML_TYPE_F16) && (pgVar44->type == GGML_TYPE_F16)) {
                cVar30 = ggml_is_contiguous_1(pgVar42);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                  if (pgVar44->nb[0] == 2) {
                    if (pgVar42->nb[0] == 2) {
                      lVar39 = pgVar42->ne[1];
                      lVar54 = pgVar42->ne[2];
                      sVar6 = pgVar42->nb[1];
                      sVar7 = pgVar42->nb[2];
                      sVar8 = pgVar42->nb[3];
                      lVar36 = pgVar44->ne[0];
                      gVar2 = pgVar43->type;
                      iVar3 = *(int *)&pgVar43->field_0x4;
                      lVar32 = ggml_nrows();
                      lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                      lVar53 = (int)gVar2 * lVar33;
                      lVar33 = lVar33 + lVar53;
                      if (lVar32 <= lVar33) {
                        lVar33 = lVar32;
                      }
                      if (lVar33 <= lVar53) {
                        return;
                      }
                      lVar54 = lVar54 * lVar39;
                      do {
                        lVar32 = lVar53 % lVar54;
                        if (0 < lVar36) {
                          lVar34 = 0;
                          do {
                            auVar73 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pgVar42->data +
                                                                          lVar34 * 2 +
                                                                          (lVar32 / lVar39) * sVar7
                                                                          + (lVar32 % lVar39) *
                                                                            sVar6 + (lVar53 / lVar54
                                                                                    ) * sVar8) * 4))
                                                 ,ZEXT816(0) << 0x40);
                            auVar73 = vcvtps2ph_f16c(auVar73,0);
                            vpextrw_avx(auVar73,0);
                            lVar34 = lVar34 + 1;
                          } while (lVar36 != lVar34);
                        }
                        lVar53 = lVar53 + 1;
                      } while (lVar53 != lVar33);
                      return;
                    }
                    goto LAB_0012c1d1;
                  }
                  goto LAB_0012c1b5;
                }
              }
              else if (gVar2 == GGML_TYPE_BF16) {
                gVar5 = pgVar44->type;
                in_RCX = (ulong)gVar5;
                if (gVar5 == GGML_TYPE_F32) {
                  cVar30 = ggml_is_contiguous_1(pgVar42);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                    if (pgVar44->nb[0] == 4) {
                      if (pgVar42->nb[0] == 2) {
                        lVar39 = pgVar42->ne[1];
                        lVar54 = pgVar42->ne[2];
                        sVar6 = pgVar42->nb[1];
                        sVar7 = pgVar42->nb[2];
                        sVar8 = pgVar42->nb[3];
                        lVar36 = pgVar44->ne[0];
                        sVar9 = pgVar44->nb[1];
                        sVar10 = pgVar44->nb[2];
                        sVar11 = pgVar44->nb[3];
                        gVar2 = pgVar43->type;
                        iVar3 = *(int *)&pgVar43->field_0x4;
                        lVar32 = ggml_nrows(pgVar42);
                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                        lVar53 = (int)gVar2 * lVar33;
                        lVar33 = lVar33 + lVar53;
                        if (lVar32 <= lVar33) {
                          lVar33 = lVar32;
                        }
                        if (lVar33 <= lVar53) {
                          return;
                        }
                        lVar54 = lVar54 * lVar39;
                        pvVar12 = pgVar44->data;
                        pvVar13 = pgVar42->data;
                        auVar69 = vpbroadcastq_avx512f();
                        auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        do {
                          lVar32 = lVar53 / lVar54;
                          lVar38 = lVar53 % lVar54;
                          lVar34 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            uVar52 = 0;
                            do {
                              auVar67 = vpbroadcastq_avx512f();
                              auVar68 = vporq_avx512f(auVar67,auVar65);
                              auVar67 = vporq_avx512f(auVar67,auVar66);
                              uVar41 = vpcmpuq_avx512f(auVar67,auVar69,2);
                              bVar28 = (byte)uVar41;
                              uVar41 = vpcmpuq_avx512f(auVar68,auVar69,2);
                              bVar29 = (byte)uVar41;
                              uVar40 = CONCAT11(bVar29,bVar28);
                              auVar61 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                            ((long)pvVar13 +
                                                            uVar52 * 2 +
                                                            lVar34 * sVar7 +
                                                            lVar38 * sVar6 + lVar32 * sVar8));
                              auVar57._2_2_ = (ushort)((byte)(uVar40 >> 1) & 1) * auVar61._2_2_;
                              auVar57._0_2_ = (ushort)(bVar28 & 1) * auVar61._0_2_;
                              auVar57._4_2_ = (ushort)((byte)(uVar40 >> 2) & 1) * auVar61._4_2_;
                              auVar57._6_2_ = (ushort)((byte)(uVar40 >> 3) & 1) * auVar61._6_2_;
                              auVar57._8_2_ = (ushort)((byte)(uVar40 >> 4) & 1) * auVar61._8_2_;
                              auVar57._10_2_ = (ushort)((byte)(uVar40 >> 5) & 1) * auVar61._10_2_;
                              auVar57._12_2_ = (ushort)((byte)(uVar40 >> 6) & 1) * auVar61._12_2_;
                              auVar57._14_2_ = (ushort)((byte)(uVar40 >> 7) & 1) * auVar61._14_2_;
                              auVar57._16_2_ = (ushort)(bVar29 & 1) * auVar61._16_2_;
                              auVar57._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar61._18_2_;
                              auVar57._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar61._20_2_;
                              auVar57._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar61._22_2_;
                              auVar57._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar61._24_2_;
                              auVar57._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar61._26_2_;
                              auVar57._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar61._28_2_;
                              auVar57._30_2_ = (ushort)(bVar29 >> 7) * auVar61._30_2_;
                              auVar67 = vpmovzxwd_avx512f(auVar57);
                              auVar67 = vpslld_avx512f(auVar67,0x10);
                              auVar67 = vmaxps_avx512f(auVar67,ZEXT1664(ZEXT816(0) << 0x40));
                              puVar1 = (uint *)((long)pvVar12 +
                                               uVar52 * 4 +
                                               lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11);
                              bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                              bVar16 = (bool)((byte)(uVar40 >> 2) & 1);
                              bVar17 = (bool)((byte)(uVar40 >> 3) & 1);
                              bVar18 = (bool)((byte)(uVar40 >> 4) & 1);
                              bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
                              bVar20 = (bool)((byte)(uVar40 >> 6) & 1);
                              bVar21 = (bool)((byte)(uVar40 >> 7) & 1);
                              bVar22 = (bool)(bVar29 >> 1 & 1);
                              bVar23 = (bool)(bVar29 >> 2 & 1);
                              bVar24 = (bool)(bVar29 >> 3 & 1);
                              bVar25 = (bool)(bVar29 >> 4 & 1);
                              bVar26 = (bool)(bVar29 >> 5 & 1);
                              bVar27 = (bool)(bVar29 >> 6 & 1);
                              *puVar1 = (uint)(bVar28 & 1) * auVar67._0_4_ |
                                        (uint)!(bool)(bVar28 & 1) * *puVar1;
                              puVar1[1] = (uint)bVar15 * auVar67._4_4_ | (uint)!bVar15 * puVar1[1];
                              puVar1[2] = (uint)bVar16 * auVar67._8_4_ | (uint)!bVar16 * puVar1[2];
                              puVar1[3] = (uint)bVar17 * auVar67._12_4_ | (uint)!bVar17 * puVar1[3];
                              puVar1[4] = (uint)bVar18 * auVar67._16_4_ | (uint)!bVar18 * puVar1[4];
                              puVar1[5] = (uint)bVar19 * auVar67._20_4_ | (uint)!bVar19 * puVar1[5];
                              puVar1[6] = (uint)bVar20 * auVar67._24_4_ | (uint)!bVar20 * puVar1[6];
                              puVar1[7] = (uint)bVar21 * auVar67._28_4_ | (uint)!bVar21 * puVar1[7];
                              puVar1[8] = (uint)(bVar29 & 1) * auVar67._32_4_ |
                                          (uint)!(bool)(bVar29 & 1) * puVar1[8];
                              puVar1[9] = (uint)bVar22 * auVar67._36_4_ | (uint)!bVar22 * puVar1[9];
                              puVar1[10] = (uint)bVar23 * auVar67._40_4_ |
                                           (uint)!bVar23 * puVar1[10];
                              puVar1[0xb] = (uint)bVar24 * auVar67._44_4_ |
                                            (uint)!bVar24 * puVar1[0xb];
                              puVar1[0xc] = (uint)bVar25 * auVar67._48_4_ |
                                            (uint)!bVar25 * puVar1[0xc];
                              puVar1[0xd] = (uint)bVar26 * auVar67._52_4_ |
                                            (uint)!bVar26 * puVar1[0xd];
                              puVar1[0xe] = (uint)bVar27 * auVar67._56_4_ |
                                            (uint)!bVar27 * puVar1[0xe];
                              puVar1[0xf] = (uint)(bVar29 >> 7) * auVar67._60_4_ |
                                            (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                              uVar52 = uVar52 + 0x10;
                            } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar52);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar33);
                        return;
                      }
                      goto LAB_0012c1d1;
                    }
                    goto LAB_0012c1b5;
                  }
                }
                else {
                  if (gVar5 != GGML_TYPE_BF16) goto LAB_0012bce7;
                  cVar30 = ggml_is_contiguous_1(pgVar42);
                  if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                     && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                    if (pgVar44->nb[0] == 2) {
                      if (pgVar42->nb[0] == 2) {
                        lVar39 = pgVar42->ne[1];
                        lVar54 = pgVar42->ne[2];
                        sVar6 = pgVar42->nb[1];
                        sVar7 = pgVar42->nb[2];
                        sVar8 = pgVar42->nb[3];
                        lVar36 = pgVar44->ne[0];
                        sVar9 = pgVar44->nb[1];
                        sVar10 = pgVar44->nb[2];
                        sVar11 = pgVar44->nb[3];
                        gVar2 = pgVar43->type;
                        iVar3 = *(int *)&pgVar43->field_0x4;
                        lVar32 = ggml_nrows(pgVar42);
                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                        lVar53 = (int)gVar2 * lVar33;
                        lVar33 = lVar33 + lVar53;
                        if (lVar32 <= lVar33) {
                          lVar33 = lVar32;
                        }
                        if (lVar33 <= lVar53) {
                          return;
                        }
                        lVar54 = lVar54 * lVar39;
                        pvVar12 = pgVar44->data;
                        pvVar13 = pgVar42->data;
                        do {
                          lVar32 = lVar53 / lVar54;
                          lVar38 = lVar53 % lVar54;
                          lVar34 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar35 = 0;
                            do {
                              auVar73 = vmaxss_avx(ZEXT216(*(ushort *)
                                                            ((long)pvVar13 +
                                                            lVar35 * 2 +
                                                            lVar34 * sVar7 +
                                                            lVar38 * sVar6 + lVar32 * sVar8)) <<
                                                   0x10,ZEXT816(0) << 0x40);
                              uVar31 = auVar73._0_4_;
                              if (uVar31 < 0x7f800001) {
                                uVar40 = (ushort)(uVar31 + 0x7fff + (uVar31 >> 0x10 & 1) >> 0x10);
                              }
                              else {
                                uVar40 = auVar73._2_2_ | 0x40;
                              }
                              *(ushort *)
                               ((long)pvVar12 +
                               lVar35 * 2 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                   uVar40;
                              lVar35 = lVar35 + 1;
                            } while (lVar36 != lVar35);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar33);
                        return;
                      }
                      goto LAB_0012c1d1;
                    }
                    goto LAB_0012c1b5;
                  }
                }
              }
              else {
LAB_0012bce7:
                if ((gVar2 != GGML_TYPE_F16) || (pgVar44->type != GGML_TYPE_F32)) {
                  ggml_compute_forward_relu_cold_1();
                  pgVar43 = pgVar42->src[0];
                  gVar2 = pgVar43->type;
                  if ((gVar2 == GGML_TYPE_F32) && (pgVar42->type == GGML_TYPE_F32)) {
                    cVar30 = ggml_is_contiguous_1(pgVar43);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                      if (pgVar42->nb[0] != 4) goto LAB_0012cb39;
                      if (pgVar43->nb[0] == 4) {
                        lVar39 = pgVar43->ne[1];
                        lVar54 = pgVar43->ne[2];
                        sVar6 = pgVar43->nb[1];
                        sVar7 = pgVar43->nb[2];
                        sVar8 = pgVar43->nb[3];
                        lVar36 = pgVar42->ne[0];
                        sVar9 = pgVar42->nb[1];
                        sVar10 = pgVar42->nb[2];
                        sVar11 = pgVar42->nb[3];
                        gVar2 = pgVar44->type;
                        iVar3 = *(int *)&pgVar44->field_0x4;
                        lVar32 = ggml_nrows(pgVar43);
                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                        lVar53 = (int)gVar2 * lVar33;
                        lVar33 = lVar33 + lVar53;
                        if (lVar32 <= lVar33) {
                          lVar33 = lVar32;
                        }
                        if (lVar33 <= lVar53) {
                          return;
                        }
                        lVar54 = lVar54 * lVar39;
                        pvVar12 = pgVar42->data;
                        pvVar13 = pgVar43->data;
                        do {
                          lVar32 = lVar53 / lVar54;
                          lVar38 = lVar53 % lVar54;
                          lVar34 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar35 = 0;
                            do {
                              fVar70 = expf(-*(float *)((long)pvVar13 +
                                                       lVar35 * 4 +
                                                       lVar34 * sVar7 +
                                                       lVar38 * sVar6 + lVar32 * sVar8));
                              *(float *)((long)pvVar12 +
                                        lVar35 * 4 +
                                        lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                   1.0 / (fVar70 + 1.0);
                              lVar35 = lVar35 + 1;
                            } while (lVar36 != lVar35);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar33);
                        return;
                      }
LAB_0012cb55:
                      pcVar37 = "nb00 == sizeof(src0_t)";
                      uVar41 = 0x56;
                      goto LAB_0012cb6f;
                    }
                  }
                  else if ((gVar2 == GGML_TYPE_F16) && (pgVar42->type == GGML_TYPE_F16)) {
                    cVar30 = ggml_is_contiguous_1(pgVar43);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                      if (pgVar42->nb[0] == 2) {
                        if (pgVar43->nb[0] == 2) {
                          lVar39 = pgVar43->ne[1];
                          lVar54 = pgVar43->ne[2];
                          sVar6 = pgVar43->nb[1];
                          sVar7 = pgVar43->nb[2];
                          sVar8 = pgVar43->nb[3];
                          lVar36 = pgVar42->ne[0];
                          gVar2 = pgVar44->type;
                          iVar3 = *(int *)&pgVar44->field_0x4;
                          lVar32 = ggml_nrows(pgVar43);
                          lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                          lVar53 = (int)gVar2 * lVar33;
                          lVar33 = lVar33 + lVar53;
                          if (lVar32 <= lVar33) {
                            lVar33 = lVar32;
                          }
                          if (lVar33 <= lVar53) {
                            return;
                          }
                          lVar54 = lVar54 * lVar39;
                          pvVar12 = pgVar43->data;
                          do {
                            lVar32 = lVar53 % lVar54;
                            if (0 < lVar36) {
                              lVar34 = 0;
                              do {
                                fVar70 = expf(-*(float *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pvVar12 +
                                                                 lVar34 * 2 +
                                                                 (lVar32 / lVar39) * sVar7 +
                                                                 (lVar32 % lVar39) * sVar6 +
                                                                 (lVar53 / lVar54) * sVar8) * 4));
                                auVar73 = vcvtps2ph_f16c(ZEXT416((uint)(1.0 / (fVar70 + 1.0))),0);
                                vpextrw_avx(auVar73,0);
                                lVar34 = lVar34 + 1;
                              } while (lVar36 != lVar34);
                            }
                            lVar53 = lVar53 + 1;
                          } while (lVar53 != lVar33);
                          return;
                        }
                        goto LAB_0012cb55;
                      }
                      goto LAB_0012cb39;
                    }
                  }
                  else if (gVar2 == GGML_TYPE_BF16) {
                    gVar5 = pgVar42->type;
                    in_RCX = (ulong)gVar5;
                    if (gVar5 == GGML_TYPE_F32) {
                      cVar30 = ggml_is_contiguous_1(pgVar43);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                        if (pgVar42->nb[0] == 4) {
                          if (pgVar43->nb[0] == 2) {
                            lVar39 = pgVar43->ne[1];
                            lVar54 = pgVar43->ne[2];
                            sVar6 = pgVar43->nb[1];
                            sVar7 = pgVar43->nb[2];
                            sVar8 = pgVar43->nb[3];
                            lVar36 = pgVar42->ne[0];
                            sVar9 = pgVar42->nb[1];
                            sVar10 = pgVar42->nb[2];
                            sVar11 = pgVar42->nb[3];
                            gVar2 = pgVar44->type;
                            iVar3 = *(int *)&pgVar44->field_0x4;
                            lVar32 = ggml_nrows(pgVar43);
                            lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                            lVar53 = (int)gVar2 * lVar33;
                            lVar33 = lVar33 + lVar53;
                            if (lVar32 <= lVar33) {
                              lVar33 = lVar32;
                            }
                            if (lVar33 <= lVar53) {
                              return;
                            }
                            lVar54 = lVar54 * lVar39;
                            pvVar12 = pgVar42->data;
                            pvVar13 = pgVar43->data;
                            do {
                              lVar32 = lVar53 / lVar54;
                              lVar38 = lVar53 % lVar54;
                              lVar34 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar35 = 0;
                                do {
                                  fVar70 = expf((float)((uint)*(ushort *)
                                                               ((long)pvVar13 +
                                                               lVar35 * 2 +
                                                               lVar34 * sVar7 +
                                                               lVar38 * sVar6 + lVar32 * sVar8) *
                                                        0x10000 + -0x80000000));
                                  *(float *)((long)pvVar12 +
                                            lVar35 * 4 +
                                            lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                       1.0 / (fVar70 + 1.0);
                                  lVar35 = lVar35 + 1;
                                } while (lVar36 != lVar35);
                              }
                              lVar53 = lVar53 + 1;
                            } while (lVar53 != lVar33);
                            return;
                          }
                          goto LAB_0012cb55;
                        }
                        goto LAB_0012cb39;
                      }
                    }
                    else {
                      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012c5f1;
                      cVar30 = ggml_is_contiguous_1(pgVar43);
                      if (((cVar30 != '\0') &&
                          (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                         (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                        if (pgVar42->nb[0] == 2) {
                          if (pgVar43->nb[0] == 2) {
                            lVar39 = pgVar43->ne[1];
                            lVar54 = pgVar43->ne[2];
                            sVar6 = pgVar43->nb[1];
                            sVar7 = pgVar43->nb[2];
                            sVar8 = pgVar43->nb[3];
                            lVar36 = pgVar42->ne[0];
                            sVar9 = pgVar42->nb[1];
                            sVar10 = pgVar42->nb[2];
                            sVar11 = pgVar42->nb[3];
                            gVar2 = pgVar44->type;
                            iVar3 = *(int *)&pgVar44->field_0x4;
                            lVar32 = ggml_nrows(pgVar43);
                            lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                            lVar53 = (int)gVar2 * lVar33;
                            lVar33 = lVar33 + lVar53;
                            if (lVar32 <= lVar33) {
                              lVar33 = lVar32;
                            }
                            if (lVar33 <= lVar53) {
                              return;
                            }
                            lVar54 = lVar54 * lVar39;
                            pvVar12 = pgVar42->data;
                            pvVar13 = pgVar43->data;
                            do {
                              lVar32 = lVar53 / lVar54;
                              lVar38 = lVar53 % lVar54;
                              lVar34 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar35 = 0;
                                do {
                                  fVar70 = expf((float)((uint)*(ushort *)
                                                               ((long)pvVar13 +
                                                               lVar35 * 2 +
                                                               lVar34 * sVar7 +
                                                               lVar38 * sVar6 + lVar32 * sVar8) *
                                                        0x10000 + -0x80000000));
                                  fVar70 = 1.0 / (fVar70 + 1.0);
                                  if ((uint)ABS(fVar70) < 0x7f800001) {
                                    uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                      ((uint)fVar70 >> 0x10 & 1) >> 0x10);
                                  }
                                  else {
                                    uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                                  }
                                  *(ushort *)
                                   ((long)pvVar12 +
                                   lVar35 * 2 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11)
                                       = uVar40;
                                  lVar35 = lVar35 + 1;
                                } while (lVar36 != lVar35);
                              }
                              lVar53 = lVar53 + 1;
                            } while (lVar53 != lVar33);
                            return;
                          }
                          goto LAB_0012cb55;
                        }
                        goto LAB_0012cb39;
                      }
                    }
                  }
                  else {
LAB_0012c5f1:
                    if ((gVar2 != GGML_TYPE_F16) || (pgVar42->type != GGML_TYPE_F32)) {
                      ggml_compute_forward_sigmoid_cold_1();
                      pgVar44 = pgVar43->src[0];
                      gVar2 = pgVar44->type;
                      if ((gVar2 == GGML_TYPE_F32) && (pgVar43->type == GGML_TYPE_F32)) {
                        cVar30 = ggml_is_contiguous_1(pgVar44);
                        if (((cVar30 != '\0') &&
                            (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                           (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
                          if (pgVar43->nb[0] != 4) goto LAB_0012d47e;
                          if (pgVar44->nb[0] == 4) {
                            lVar39 = pgVar44->ne[1];
                            lVar54 = pgVar44->ne[2];
                            sVar6 = pgVar44->nb[1];
                            sVar7 = pgVar44->nb[2];
                            sVar8 = pgVar44->nb[3];
                            lVar36 = pgVar43->ne[0];
                            sVar9 = pgVar43->nb[1];
                            sVar10 = pgVar43->nb[2];
                            sVar11 = pgVar43->nb[3];
                            gVar2 = pgVar42->type;
                            iVar3 = *(int *)&pgVar42->field_0x4;
                            lVar32 = ggml_nrows(pgVar44);
                            lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                            lVar53 = (int)gVar2 * lVar33;
                            lVar33 = lVar33 + lVar53;
                            if (lVar32 <= lVar33) {
                              lVar33 = lVar32;
                            }
                            if (lVar33 <= lVar53) {
                              return;
                            }
                            lVar54 = lVar54 * lVar39;
                            pvVar12 = pgVar43->data;
                            pvVar13 = pgVar44->data;
                            do {
                              lVar32 = lVar53 / lVar54;
                              lVar38 = lVar53 % lVar54;
                              lVar34 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar35 = 0;
                                do {
                                  auVar77._0_4_ =
                                       (*(float *)((long)pvVar13 +
                                                  lVar35 * 4 +
                                                  lVar34 * sVar7 + lVar38 * sVar6 + lVar32 * sVar8)
                                       + 3.0) / 6.0;
                                  auVar77._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                  auVar73 = vmaxss_avx(auVar77,ZEXT816(0) << 0x40);
                                  auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(0x3f800000),0));
                                  *(int *)((long)pvVar12 +
                                          lVar35 * 4 +
                                          lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                       auVar73._0_4_;
                                  lVar35 = lVar35 + 1;
                                } while (lVar36 != lVar35);
                              }
                              lVar53 = lVar53 + 1;
                            } while (lVar53 != lVar33);
                            return;
                          }
LAB_0012d49a:
                          pcVar37 = "nb00 == sizeof(src0_t)";
                          uVar41 = 0x56;
                          goto LAB_0012d4b4;
                        }
                      }
                      else if ((gVar2 == GGML_TYPE_F16) && (pgVar43->type == GGML_TYPE_F16)) {
                        cVar30 = ggml_is_contiguous_1(pgVar44);
                        if (((cVar30 != '\0') &&
                            (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                           (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
                          if (pgVar43->nb[0] == 2) {
                            if (pgVar44->nb[0] == 2) {
                              lVar39 = pgVar44->ne[1];
                              lVar54 = pgVar44->ne[2];
                              sVar6 = pgVar44->nb[1];
                              sVar7 = pgVar44->nb[2];
                              sVar8 = pgVar44->nb[3];
                              lVar36 = pgVar43->ne[0];
                              gVar2 = pgVar42->type;
                              iVar3 = *(int *)&pgVar42->field_0x4;
                              lVar32 = ggml_nrows();
                              lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                              lVar53 = (int)gVar2 * lVar33;
                              lVar33 = lVar33 + lVar53;
                              if (lVar32 <= lVar33) {
                                lVar33 = lVar32;
                              }
                              if (lVar33 <= lVar53) {
                                return;
                              }
                              lVar54 = lVar54 * lVar39;
                              do {
                                lVar32 = lVar53 % lVar54;
                                if (0 < lVar36) {
                                  lVar34 = 0;
                                  do {
                                    auVar74._0_4_ =
                                         (*(float *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)pgVar44->data +
                                                            lVar34 * 2 +
                                                            (lVar32 / lVar39) * sVar7 +
                                                            (lVar32 % lVar39) * sVar6 +
                                                            (lVar53 / lVar54) * sVar8) * 4) + 3.0) /
                                         6.0;
                                    auVar74._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                    auVar73 = vmaxss_avx(auVar74,ZEXT816(0) << 0x40);
                                    auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(0x3f800000),0));
                                    auVar73 = vcvtps2ph_f16c(auVar73,0);
                                    vpextrw_avx(auVar73,0);
                                    lVar34 = lVar34 + 1;
                                  } while (lVar36 != lVar34);
                                }
                                lVar53 = lVar53 + 1;
                              } while (lVar53 != lVar33);
                              return;
                            }
                            goto LAB_0012d49a;
                          }
                          goto LAB_0012d47e;
                        }
                      }
                      else if (gVar2 == GGML_TYPE_BF16) {
                        gVar5 = pgVar43->type;
                        in_RCX = (ulong)gVar5;
                        if (gVar5 == GGML_TYPE_F32) {
                          cVar30 = ggml_is_contiguous_1(pgVar44);
                          if (((cVar30 != '\0') &&
                              (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                             (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
                            if (pgVar43->nb[0] == 4) {
                              if (pgVar44->nb[0] == 2) {
                                lVar39 = pgVar44->ne[1];
                                lVar54 = pgVar44->ne[2];
                                sVar6 = pgVar44->nb[1];
                                sVar7 = pgVar44->nb[2];
                                sVar8 = pgVar44->nb[3];
                                lVar36 = pgVar43->ne[0];
                                sVar9 = pgVar43->nb[1];
                                sVar10 = pgVar43->nb[2];
                                sVar11 = pgVar43->nb[3];
                                gVar2 = pgVar42->type;
                                iVar3 = *(int *)&pgVar42->field_0x4;
                                lVar32 = ggml_nrows(pgVar44);
                                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                lVar53 = (int)gVar2 * lVar33;
                                lVar33 = lVar33 + lVar53;
                                if (lVar32 <= lVar33) {
                                  lVar33 = lVar32;
                                }
                                if (lVar33 <= lVar53) {
                                  return;
                                }
                                lVar54 = lVar54 * lVar39;
                                pvVar12 = pgVar43->data;
                                pvVar13 = pgVar44->data;
                                auVar69 = vpbroadcastq_avx512f();
                                auVar65 = vbroadcastss_avx512f(ZEXT416(0x40400000));
                                auVar66 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
                                auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                auVar62 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                do {
                                  lVar32 = lVar53 / lVar54;
                                  lVar38 = lVar53 % lVar54;
                                  lVar34 = lVar38 / lVar39;
                                  lVar38 = lVar38 % lVar39;
                                  if (0 < lVar36) {
                                    uVar52 = 0;
                                    do {
                                      auVar63 = vpbroadcastq_avx512f();
                                      auVar64 = vporq_avx512f(auVar63,auVar67);
                                      auVar63 = vporq_avx512f(auVar63,auVar68);
                                      uVar41 = vpcmpuq_avx512f(auVar63,auVar69,2);
                                      bVar28 = (byte)uVar41;
                                      uVar41 = vpcmpuq_avx512f(auVar64,auVar69,2);
                                      bVar29 = (byte)uVar41;
                                      uVar40 = CONCAT11(bVar29,bVar28);
                                      auVar61 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                                    ((long)pvVar13 +
                                                                    uVar52 * 2 +
                                                                    lVar34 * sVar7 +
                                                                    lVar38 * sVar6 + lVar32 * sVar8)
                                                                  );
                                      auVar58._2_2_ =
                                           (ushort)((byte)(uVar40 >> 1) & 1) * auVar61._2_2_;
                                      auVar58._0_2_ = (ushort)(bVar28 & 1) * auVar61._0_2_;
                                      auVar58._4_2_ =
                                           (ushort)((byte)(uVar40 >> 2) & 1) * auVar61._4_2_;
                                      auVar58._6_2_ =
                                           (ushort)((byte)(uVar40 >> 3) & 1) * auVar61._6_2_;
                                      auVar58._8_2_ =
                                           (ushort)((byte)(uVar40 >> 4) & 1) * auVar61._8_2_;
                                      auVar58._10_2_ =
                                           (ushort)((byte)(uVar40 >> 5) & 1) * auVar61._10_2_;
                                      auVar58._12_2_ =
                                           (ushort)((byte)(uVar40 >> 6) & 1) * auVar61._12_2_;
                                      auVar58._14_2_ =
                                           (ushort)((byte)(uVar40 >> 7) & 1) * auVar61._14_2_;
                                      auVar58._16_2_ = (ushort)(bVar29 & 1) * auVar61._16_2_;
                                      auVar58._18_2_ = (ushort)(bVar29 >> 1 & 1) * auVar61._18_2_;
                                      auVar58._20_2_ = (ushort)(bVar29 >> 2 & 1) * auVar61._20_2_;
                                      auVar58._22_2_ = (ushort)(bVar29 >> 3 & 1) * auVar61._22_2_;
                                      auVar58._24_2_ = (ushort)(bVar29 >> 4 & 1) * auVar61._24_2_;
                                      auVar58._26_2_ = (ushort)(bVar29 >> 5 & 1) * auVar61._26_2_;
                                      auVar58._28_2_ = (ushort)(bVar29 >> 6 & 1) * auVar61._28_2_;
                                      auVar58._30_2_ = (ushort)(bVar29 >> 7) * auVar61._30_2_;
                                      auVar63 = vpmovzxwd_avx512f(auVar58);
                                      auVar63 = vpslld_avx512f(auVar63,0x10);
                                      auVar63 = vaddps_avx512f(auVar63,auVar65);
                                      auVar63 = vdivps_avx512f(auVar63,auVar66);
                                      auVar63 = vmaxps_avx512f(auVar63,ZEXT1664(ZEXT816(0) << 0x40))
                                      ;
                                      auVar63 = vminps_avx512f(auVar63,auVar62);
                                      puVar1 = (uint *)((long)pvVar12 +
                                                       uVar52 * 4 +
                                                       lVar34 * sVar10 +
                                                       lVar38 * sVar9 + lVar32 * sVar11);
                                      bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                                      bVar16 = (bool)((byte)(uVar40 >> 2) & 1);
                                      bVar17 = (bool)((byte)(uVar40 >> 3) & 1);
                                      bVar18 = (bool)((byte)(uVar40 >> 4) & 1);
                                      bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
                                      bVar20 = (bool)((byte)(uVar40 >> 6) & 1);
                                      bVar21 = (bool)((byte)(uVar40 >> 7) & 1);
                                      bVar22 = (bool)(bVar29 >> 1 & 1);
                                      bVar23 = (bool)(bVar29 >> 2 & 1);
                                      bVar24 = (bool)(bVar29 >> 3 & 1);
                                      bVar25 = (bool)(bVar29 >> 4 & 1);
                                      bVar26 = (bool)(bVar29 >> 5 & 1);
                                      bVar27 = (bool)(bVar29 >> 6 & 1);
                                      *puVar1 = (uint)(bVar28 & 1) * auVar63._0_4_ |
                                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                                      puVar1[1] = (uint)bVar15 * auVar63._4_4_ |
                                                  (uint)!bVar15 * puVar1[1];
                                      puVar1[2] = (uint)bVar16 * auVar63._8_4_ |
                                                  (uint)!bVar16 * puVar1[2];
                                      puVar1[3] = (uint)bVar17 * auVar63._12_4_ |
                                                  (uint)!bVar17 * puVar1[3];
                                      puVar1[4] = (uint)bVar18 * auVar63._16_4_ |
                                                  (uint)!bVar18 * puVar1[4];
                                      puVar1[5] = (uint)bVar19 * auVar63._20_4_ |
                                                  (uint)!bVar19 * puVar1[5];
                                      puVar1[6] = (uint)bVar20 * auVar63._24_4_ |
                                                  (uint)!bVar20 * puVar1[6];
                                      puVar1[7] = (uint)bVar21 * auVar63._28_4_ |
                                                  (uint)!bVar21 * puVar1[7];
                                      puVar1[8] = (uint)(bVar29 & 1) * auVar63._32_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar22 * auVar63._36_4_ |
                                                  (uint)!bVar22 * puVar1[9];
                                      puVar1[10] = (uint)bVar23 * auVar63._40_4_ |
                                                   (uint)!bVar23 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar24 * auVar63._44_4_ |
                                                    (uint)!bVar24 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar25 * auVar63._48_4_ |
                                                    (uint)!bVar25 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar26 * auVar63._52_4_ |
                                                    (uint)!bVar26 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar27 * auVar63._56_4_ |
                                                    (uint)!bVar27 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar63._60_4_ |
                                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                      uVar52 = uVar52 + 0x10;
                                    } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar52);
                                  }
                                  lVar53 = lVar53 + 1;
                                } while (lVar53 != lVar33);
                                return;
                              }
                              goto LAB_0012d49a;
                            }
                            goto LAB_0012d47e;
                          }
                        }
                        else {
                          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012cf3f;
                          cVar30 = ggml_is_contiguous_1(pgVar44);
                          if (((cVar30 != '\0') &&
                              (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                             (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
                            if (pgVar43->nb[0] == 2) {
                              if (pgVar44->nb[0] == 2) {
                                lVar39 = pgVar44->ne[1];
                                lVar54 = pgVar44->ne[2];
                                sVar6 = pgVar44->nb[1];
                                sVar7 = pgVar44->nb[2];
                                sVar8 = pgVar44->nb[3];
                                lVar36 = pgVar43->ne[0];
                                sVar9 = pgVar43->nb[1];
                                sVar10 = pgVar43->nb[2];
                                sVar11 = pgVar43->nb[3];
                                gVar2 = pgVar42->type;
                                iVar3 = *(int *)&pgVar42->field_0x4;
                                lVar32 = ggml_nrows(pgVar44);
                                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                lVar53 = (int)gVar2 * lVar33;
                                lVar33 = lVar33 + lVar53;
                                if (lVar32 <= lVar33) {
                                  lVar33 = lVar32;
                                }
                                if (lVar33 <= lVar53) {
                                  return;
                                }
                                lVar54 = lVar54 * lVar39;
                                pvVar12 = pgVar43->data;
                                pvVar13 = pgVar44->data;
                                do {
                                  lVar32 = lVar53 / lVar54;
                                  lVar38 = lVar53 % lVar54;
                                  lVar34 = lVar38 / lVar39;
                                  lVar38 = lVar38 % lVar39;
                                  if (0 < lVar36) {
                                    lVar35 = 0;
                                    do {
                                      auVar75._0_4_ =
                                           ((float)((uint)*(ushort *)
                                                           ((long)pvVar13 +
                                                           lVar35 * 2 +
                                                           lVar34 * sVar7 +
                                                           lVar38 * sVar6 + lVar32 * sVar8) << 0x10)
                                           + 3.0) / 6.0;
                                      auVar75._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                      auVar73 = vmaxss_avx(auVar75,ZEXT816(0) << 0x40);
                                      auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(0x3f800000),0));
                                      uVar31 = auVar73._0_4_;
                                      if ((uVar31 & 0x7fffffff) < 0x7f800001) {
                                        uVar40 = (ushort)(uVar31 + 0x7fff + (uVar31 >> 0x10 & 1) >>
                                                         0x10);
                                      }
                                      else {
                                        uVar40 = auVar73._2_2_ | 0x40;
                                      }
                                      *(ushort *)
                                       ((long)pvVar12 +
                                       lVar35 * 2 +
                                       lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) = uVar40;
                                      lVar35 = lVar35 + 1;
                                    } while (lVar36 != lVar35);
                                  }
                                  lVar53 = lVar53 + 1;
                                } while (lVar53 != lVar33);
                                return;
                              }
                              goto LAB_0012d49a;
                            }
                            goto LAB_0012d47e;
                          }
                        }
                      }
                      else {
LAB_0012cf3f:
                        if ((gVar2 != GGML_TYPE_F16) || (pgVar43->type != GGML_TYPE_F32)) {
                          ggml_compute_forward_hardsigmoid_cold_1();
                          pgVar42 = pgVar44->src[0];
                          gVar2 = pgVar42->type;
                          if ((gVar2 == GGML_TYPE_F32) && (pgVar44->type == GGML_TYPE_F32)) {
                            cVar30 = ggml_is_contiguous_1(pgVar42);
                            if (((cVar30 != '\0') &&
                                (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0')) &&
                               (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                              if (pgVar44->nb[0] != 4) goto LAB_0012dd5e;
                              if (pgVar42->nb[0] == 4) {
                                lVar39 = pgVar42->ne[1];
                                lVar54 = pgVar42->ne[2];
                                sVar6 = pgVar42->nb[1];
                                sVar7 = pgVar42->nb[2];
                                sVar8 = pgVar42->nb[3];
                                lVar36 = pgVar44->ne[0];
                                sVar9 = pgVar44->nb[1];
                                sVar10 = pgVar44->nb[2];
                                sVar11 = pgVar44->nb[3];
                                gVar2 = pgVar43->type;
                                iVar3 = *(int *)&pgVar43->field_0x4;
                                lVar32 = ggml_nrows(pgVar42);
                                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                lVar53 = (int)gVar2 * lVar33;
                                lVar33 = lVar33 + lVar53;
                                if (lVar32 <= lVar33) {
                                  lVar33 = lVar32;
                                }
                                if (lVar33 <= lVar53) {
                                  return;
                                }
                                lVar54 = lVar54 * lVar39;
                                pvVar12 = pgVar44->data;
                                pvVar13 = pgVar42->data;
                                do {
                                  lVar32 = lVar53 / lVar54;
                                  lVar38 = lVar53 % lVar54;
                                  lVar34 = lVar38 / lVar39;
                                  lVar38 = lVar38 % lVar39;
                                  if (0 < lVar36) {
                                    lVar35 = 0;
                                    do {
                                      fVar70 = expf(*(float *)((long)pvVar13 +
                                                              lVar35 * 4 +
                                                              lVar34 * sVar7 +
                                                              lVar38 * sVar6 + lVar32 * sVar8));
                                      *(float *)((long)pvVar12 +
                                                lVar35 * 4 +
                                                lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11)
                                           = fVar70;
                                      lVar35 = lVar35 + 1;
                                    } while (lVar36 != lVar35);
                                  }
                                  lVar53 = lVar53 + 1;
                                } while (lVar53 != lVar33);
                                return;
                              }
LAB_0012dd7a:
                              pcVar37 = "nb00 == sizeof(src0_t)";
                              uVar41 = 0x56;
                              goto LAB_0012dd94;
                            }
                          }
                          else if ((gVar2 == GGML_TYPE_F16) && (pgVar44->type == GGML_TYPE_F16)) {
                            cVar30 = ggml_is_contiguous_1(pgVar42);
                            if (((cVar30 != '\0') &&
                                (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0')) &&
                               (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                              if (pgVar44->nb[0] == 2) {
                                if (pgVar42->nb[0] == 2) {
                                  lVar39 = pgVar42->ne[1];
                                  lVar54 = pgVar42->ne[2];
                                  sVar6 = pgVar42->nb[1];
                                  sVar7 = pgVar42->nb[2];
                                  sVar8 = pgVar42->nb[3];
                                  lVar36 = pgVar44->ne[0];
                                  gVar2 = pgVar43->type;
                                  iVar3 = *(int *)&pgVar43->field_0x4;
                                  lVar32 = ggml_nrows(pgVar42);
                                  lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                  lVar53 = (int)gVar2 * lVar33;
                                  lVar33 = lVar33 + lVar53;
                                  if (lVar32 <= lVar33) {
                                    lVar33 = lVar32;
                                  }
                                  if (lVar33 <= lVar53) {
                                    return;
                                  }
                                  lVar54 = lVar54 * lVar39;
                                  pvVar12 = pgVar42->data;
                                  do {
                                    lVar32 = lVar53 % lVar54;
                                    if (0 < lVar36) {
                                      lVar34 = 0;
                                      do {
                                        auVar62._0_4_ =
                                             expf(*(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pvVar12 +
                                                                    lVar34 * 2 +
                                                                    (lVar32 / lVar39) * sVar7 +
                                                                    (lVar32 % lVar39) * sVar6 +
                                                                    (lVar53 / lVar54) * sVar8) * 4))
                                        ;
                                        auVar62._4_60_ = extraout_var_01;
                                        auVar73 = vcvtps2ph_f16c(auVar62._0_16_,0);
                                        vpextrw_avx(auVar73,0);
                                        lVar34 = lVar34 + 1;
                                      } while (lVar36 != lVar34);
                                    }
                                    lVar53 = lVar53 + 1;
                                  } while (lVar53 != lVar33);
                                  return;
                                }
                                goto LAB_0012dd7a;
                              }
                              goto LAB_0012dd5e;
                            }
                          }
                          else if (gVar2 == GGML_TYPE_BF16) {
                            gVar5 = pgVar44->type;
                            in_RCX = (ulong)gVar5;
                            if (gVar5 == GGML_TYPE_F32) {
                              cVar30 = ggml_is_contiguous_1(pgVar42);
                              if (((cVar30 != '\0') &&
                                  (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0')) &&
                                 (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                                if (pgVar44->nb[0] == 4) {
                                  if (pgVar42->nb[0] == 2) {
                                    lVar39 = pgVar42->ne[1];
                                    lVar54 = pgVar42->ne[2];
                                    sVar6 = pgVar42->nb[1];
                                    sVar7 = pgVar42->nb[2];
                                    sVar8 = pgVar42->nb[3];
                                    lVar36 = pgVar44->ne[0];
                                    sVar9 = pgVar44->nb[1];
                                    sVar10 = pgVar44->nb[2];
                                    sVar11 = pgVar44->nb[3];
                                    gVar2 = pgVar43->type;
                                    iVar3 = *(int *)&pgVar43->field_0x4;
                                    lVar32 = ggml_nrows(pgVar42);
                                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                    lVar53 = (int)gVar2 * lVar33;
                                    lVar33 = lVar33 + lVar53;
                                    if (lVar32 <= lVar33) {
                                      lVar33 = lVar32;
                                    }
                                    if (lVar33 <= lVar53) {
                                      return;
                                    }
                                    lVar54 = lVar54 * lVar39;
                                    pvVar12 = pgVar44->data;
                                    pvVar13 = pgVar42->data;
                                    do {
                                      lVar32 = lVar53 / lVar54;
                                      lVar38 = lVar53 % lVar54;
                                      lVar34 = lVar38 / lVar39;
                                      lVar38 = lVar38 % lVar39;
                                      if (0 < lVar36) {
                                        lVar35 = 0;
                                        do {
                                          fVar70 = expf((float)((uint)*(ushort *)
                                                                       ((long)pvVar13 +
                                                                       lVar35 * 2 +
                                                                       lVar34 * sVar7 +
                                                                       lVar38 * sVar6 +
                                                                       lVar32 * sVar8) << 0x10));
                                          *(float *)((long)pvVar12 +
                                                    lVar35 * 4 +
                                                    lVar34 * sVar10 +
                                                    lVar38 * sVar9 + lVar32 * sVar11) = fVar70;
                                          lVar35 = lVar35 + 1;
                                        } while (lVar36 != lVar35);
                                      }
                                      lVar53 = lVar53 + 1;
                                    } while (lVar53 != lVar33);
                                    return;
                                  }
                                  goto LAB_0012dd7a;
                                }
                                goto LAB_0012dd5e;
                              }
                            }
                            else {
                              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012d87b;
                              cVar30 = ggml_is_contiguous_1(pgVar42);
                              if (((cVar30 != '\0') &&
                                  (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0')) &&
                                 (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                                if (pgVar44->nb[0] == 2) {
                                  if (pgVar42->nb[0] == 2) {
                                    lVar39 = pgVar42->ne[1];
                                    lVar54 = pgVar42->ne[2];
                                    sVar6 = pgVar42->nb[1];
                                    sVar7 = pgVar42->nb[2];
                                    sVar8 = pgVar42->nb[3];
                                    lVar36 = pgVar44->ne[0];
                                    sVar9 = pgVar44->nb[1];
                                    sVar10 = pgVar44->nb[2];
                                    sVar11 = pgVar44->nb[3];
                                    gVar2 = pgVar43->type;
                                    iVar3 = *(int *)&pgVar43->field_0x4;
                                    lVar32 = ggml_nrows(pgVar42);
                                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                    lVar53 = (int)gVar2 * lVar33;
                                    lVar33 = lVar33 + lVar53;
                                    if (lVar32 <= lVar33) {
                                      lVar33 = lVar32;
                                    }
                                    if (lVar33 <= lVar53) {
                                      return;
                                    }
                                    lVar54 = lVar54 * lVar39;
                                    pvVar12 = pgVar44->data;
                                    pvVar13 = pgVar42->data;
                                    do {
                                      lVar32 = lVar53 / lVar54;
                                      lVar38 = lVar53 % lVar54;
                                      lVar34 = lVar38 / lVar39;
                                      lVar38 = lVar38 % lVar39;
                                      if (0 < lVar36) {
                                        lVar35 = 0;
                                        do {
                                          fVar70 = expf((float)((uint)*(ushort *)
                                                                       ((long)pvVar13 +
                                                                       lVar35 * 2 +
                                                                       lVar34 * sVar7 +
                                                                       lVar38 * sVar6 +
                                                                       lVar32 * sVar8) << 0x10));
                                          if ((uint)ABS(fVar70) < 0x7f800001) {
                                            uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                              ((uint)fVar70 >> 0x10 & 1) >> 0x10);
                                          }
                                          else {
                                            uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                                          }
                                          *(ushort *)
                                           ((long)pvVar12 +
                                           lVar35 * 2 +
                                           lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                               uVar40;
                                          lVar35 = lVar35 + 1;
                                        } while (lVar36 != lVar35);
                                      }
                                      lVar53 = lVar53 + 1;
                                    } while (lVar53 != lVar33);
                                    return;
                                  }
                                  goto LAB_0012dd7a;
                                }
                                goto LAB_0012dd5e;
                              }
                            }
                          }
                          else {
LAB_0012d87b:
                            if ((gVar2 != GGML_TYPE_F16) || (pgVar44->type != GGML_TYPE_F32)) {
                              ggml_compute_forward_exp_cold_1();
                              pgVar14 = pgVar42->src[0];
                              gVar2 = pgVar14->type;
                              if ((gVar2 == GGML_TYPE_F32) && (pgVar42->type == GGML_TYPE_F32)) {
                                cVar30 = ggml_is_contiguous_1(pgVar14);
                                if (((cVar30 != '\0') &&
                                    (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                                   (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0'))
                                {
                                  if (pgVar42->nb[0] != 4) goto LAB_0012e6c9;
                                  if (pgVar14->nb[0] == 4) {
                                    lVar39 = pgVar14->ne[1];
                                    lVar54 = pgVar14->ne[2];
                                    sVar6 = pgVar14->nb[1];
                                    sVar7 = pgVar14->nb[2];
                                    sVar8 = pgVar14->nb[3];
                                    lVar36 = pgVar42->ne[0];
                                    sVar9 = pgVar42->nb[1];
                                    sVar10 = pgVar42->nb[2];
                                    sVar11 = pgVar42->nb[3];
                                    gVar2 = pgVar44->type;
                                    iVar3 = *(int *)&pgVar44->field_0x4;
                                    lVar32 = ggml_nrows(pgVar14);
                                    lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                    lVar53 = (int)gVar2 * lVar33;
                                    lVar33 = lVar33 + lVar53;
                                    if (lVar32 <= lVar33) {
                                      lVar33 = lVar32;
                                    }
                                    if (lVar33 <= lVar53) {
                                      return;
                                    }
                                    lVar54 = lVar54 * lVar39;
                                    pvVar12 = pgVar42->data;
                                    pvVar13 = pgVar14->data;
                                    do {
                                      lVar32 = lVar53 / lVar54;
                                      lVar38 = lVar53 % lVar54;
                                      lVar34 = lVar38 / lVar39;
                                      lVar38 = lVar38 % lVar39;
                                      if (0 < lVar36) {
                                        lVar35 = 0;
                                        do {
                                          fVar70 = *(float *)((long)pvVar13 +
                                                             lVar35 * 4 +
                                                             lVar34 * sVar7 +
                                                             lVar38 * sVar6 + lVar32 * sVar8);
                                          auVar80._0_4_ = (fVar70 + 3.0) / 6.0;
                                          auVar80._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                          auVar73 = vmaxss_avx(auVar80,ZEXT816(0) << 0x40);
                                          auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(0x3f800000),0
                                                                              ));
                                          *(float *)((long)pvVar12 +
                                                    lVar35 * 4 +
                                                    lVar34 * sVar10 +
                                                    lVar38 * sVar9 + lVar32 * sVar11) =
                                               fVar70 * auVar73._0_4_;
                                          lVar35 = lVar35 + 1;
                                        } while (lVar36 != lVar35);
                                      }
                                      lVar53 = lVar53 + 1;
                                    } while (lVar53 != lVar33);
                                    return;
                                  }
LAB_0012e6e5:
                                  pcVar37 = "nb00 == sizeof(src0_t)";
                                  uVar41 = 0x56;
                                  goto LAB_0012e6ff;
                                }
                              }
                              else if ((gVar2 == GGML_TYPE_F16) && (pgVar42->type == GGML_TYPE_F16))
                              {
                                cVar30 = ggml_is_contiguous_1(pgVar14);
                                if (((cVar30 != '\0') &&
                                    (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                                   (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0'))
                                {
                                  if (pgVar42->nb[0] == 2) {
                                    if (pgVar14->nb[0] == 2) {
                                      lVar39 = pgVar14->ne[1];
                                      lVar54 = pgVar14->ne[2];
                                      sVar6 = pgVar14->nb[1];
                                      sVar7 = pgVar14->nb[2];
                                      sVar8 = pgVar14->nb[3];
                                      lVar36 = pgVar42->ne[0];
                                      gVar2 = pgVar44->type;
                                      iVar3 = *(int *)&pgVar44->field_0x4;
                                      lVar32 = ggml_nrows();
                                      lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                      lVar53 = (int)gVar2 * lVar33;
                                      lVar33 = lVar33 + lVar53;
                                      if (lVar32 <= lVar33) {
                                        lVar33 = lVar32;
                                      }
                                      if (lVar33 <= lVar53) {
                                        return;
                                      }
                                      lVar54 = lVar54 * lVar39;
                                      do {
                                        lVar32 = lVar53 % lVar54;
                                        if (0 < lVar36) {
                                          lVar34 = 0;
                                          do {
                                            auVar78._0_4_ =
                                                 (*(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pgVar14->data +
                                                                    lVar34 * 2 +
                                                                    (lVar32 / lVar39) * sVar7 +
                                                                    (lVar32 % lVar39) * sVar6 +
                                                                    (lVar53 / lVar54) * sVar8) * 4)
                                                 + 3.0) / 6.0;
                                            auVar78._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                            auVar73 = vmaxss_avx(auVar78,ZEXT816(0) << 0x40);
                                            auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(0x3f800000)
                                                                                 ,0));
                                            auVar73 = vcvtps2ph_f16c(ZEXT416((uint)(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar14->data +
                                                          lVar34 * 2 +
                                                          (lVar32 / lVar39) * sVar7 +
                                                          (lVar32 % lVar39) * sVar6 +
                                                          (lVar53 / lVar54) * sVar8) * 4) *
                                                  auVar73._0_4_)),0);
                                            vpextrw_avx(auVar73,0);
                                            lVar34 = lVar34 + 1;
                                          } while (lVar36 != lVar34);
                                        }
                                        lVar53 = lVar53 + 1;
                                      } while (lVar53 != lVar33);
                                      return;
                                    }
                                    goto LAB_0012e6e5;
                                  }
                                  goto LAB_0012e6c9;
                                }
                              }
                              else if (gVar2 == GGML_TYPE_BF16) {
                                gVar5 = pgVar42->type;
                                in_RCX = (ulong)gVar5;
                                if (gVar5 == GGML_TYPE_F32) {
                                  cVar30 = ggml_is_contiguous_1(pgVar14);
                                  if (((cVar30 != '\0') &&
                                      (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                                     (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0')
                                     ) {
                                    if (pgVar42->nb[0] == 4) {
                                      if (pgVar14->nb[0] == 2) {
                                        lVar39 = pgVar14->ne[1];
                                        lVar54 = pgVar14->ne[2];
                                        sVar6 = pgVar14->nb[1];
                                        sVar7 = pgVar14->nb[2];
                                        sVar8 = pgVar14->nb[3];
                                        lVar36 = pgVar42->ne[0];
                                        sVar9 = pgVar42->nb[1];
                                        sVar10 = pgVar42->nb[2];
                                        sVar11 = pgVar42->nb[3];
                                        gVar2 = pgVar44->type;
                                        iVar3 = *(int *)&pgVar44->field_0x4;
                                        lVar32 = ggml_nrows(pgVar14);
                                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                        lVar53 = (int)gVar2 * lVar33;
                                        lVar33 = lVar33 + lVar53;
                                        if (lVar32 <= lVar33) {
                                          lVar33 = lVar32;
                                        }
                                        if (lVar33 <= lVar53) {
                                          return;
                                        }
                                        lVar54 = lVar54 * lVar39;
                                        pvVar12 = pgVar42->data;
                                        pvVar13 = pgVar14->data;
                                        auVar69 = vpbroadcastq_avx512f();
                                        auVar65 = vbroadcastss_avx512f(ZEXT416(0x40400000));
                                        auVar66 = vbroadcastss_avx512f(ZEXT416(0x40c00000));
                                        auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                        auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                        auVar62 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                        do {
                                          lVar32 = lVar53 / lVar54;
                                          lVar38 = lVar53 % lVar54;
                                          lVar34 = lVar38 / lVar39;
                                          lVar38 = lVar38 % lVar39;
                                          if (0 < lVar36) {
                                            uVar52 = 0;
                                            do {
                                              auVar63 = vpbroadcastq_avx512f();
                                              auVar64 = vporq_avx512f(auVar63,auVar67);
                                              auVar63 = vporq_avx512f(auVar63,auVar68);
                                              uVar41 = vpcmpuq_avx512f(auVar63,auVar69,2);
                                              bVar28 = (byte)uVar41;
                                              uVar41 = vpcmpuq_avx512f(auVar64,auVar69,2);
                                              bVar29 = (byte)uVar41;
                                              uVar40 = CONCAT11(bVar29,bVar28);
                                              auVar61 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                                            ((long)pvVar13 +
                                                                            uVar52 * 2 +
                                                                            lVar34 * sVar7 +
                                                                            lVar38 * sVar6 +
                                                                            lVar32 * sVar8));
                                              auVar59._2_2_ =
                                                   (ushort)((byte)(uVar40 >> 1) & 1) * auVar61._2_2_
                                              ;
                                              auVar59._0_2_ = (ushort)(bVar28 & 1) * auVar61._0_2_;
                                              auVar59._4_2_ =
                                                   (ushort)((byte)(uVar40 >> 2) & 1) * auVar61._4_2_
                                              ;
                                              auVar59._6_2_ =
                                                   (ushort)((byte)(uVar40 >> 3) & 1) * auVar61._6_2_
                                              ;
                                              auVar59._8_2_ =
                                                   (ushort)((byte)(uVar40 >> 4) & 1) * auVar61._8_2_
                                              ;
                                              auVar59._10_2_ =
                                                   (ushort)((byte)(uVar40 >> 5) & 1) *
                                                   auVar61._10_2_;
                                              auVar59._12_2_ =
                                                   (ushort)((byte)(uVar40 >> 6) & 1) *
                                                   auVar61._12_2_;
                                              auVar59._14_2_ =
                                                   (ushort)((byte)(uVar40 >> 7) & 1) *
                                                   auVar61._14_2_;
                                              auVar59._16_2_ = (ushort)(bVar29 & 1) * auVar61._16_2_
                                              ;
                                              auVar59._18_2_ =
                                                   (ushort)(bVar29 >> 1 & 1) * auVar61._18_2_;
                                              auVar59._20_2_ =
                                                   (ushort)(bVar29 >> 2 & 1) * auVar61._20_2_;
                                              auVar59._22_2_ =
                                                   (ushort)(bVar29 >> 3 & 1) * auVar61._22_2_;
                                              auVar59._24_2_ =
                                                   (ushort)(bVar29 >> 4 & 1) * auVar61._24_2_;
                                              auVar59._26_2_ =
                                                   (ushort)(bVar29 >> 5 & 1) * auVar61._26_2_;
                                              auVar59._28_2_ =
                                                   (ushort)(bVar29 >> 6 & 1) * auVar61._28_2_;
                                              auVar59._30_2_ =
                                                   (ushort)(bVar29 >> 7) * auVar61._30_2_;
                                              auVar63 = vpmovzxwd_avx512f(auVar59);
                                              auVar63 = vpslld_avx512f(auVar63,0x10);
                                              auVar64 = vaddps_avx512f(auVar63,auVar65);
                                              auVar64 = vdivps_avx512f(auVar64,auVar66);
                                              auVar64 = vmaxps_avx512f(auVar64,ZEXT1664(ZEXT816(0)
                                                                                        << 0x40));
                                              auVar64 = vminps_avx512f(auVar64,auVar62);
                                              auVar63 = vmulps_avx512f(auVar64,auVar63);
                                              puVar1 = (uint *)((long)pvVar12 +
                                                               uVar52 * 4 +
                                                               lVar34 * sVar10 +
                                                               lVar38 * sVar9 + lVar32 * sVar11);
                                              bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                                              bVar16 = (bool)((byte)(uVar40 >> 2) & 1);
                                              bVar17 = (bool)((byte)(uVar40 >> 3) & 1);
                                              bVar18 = (bool)((byte)(uVar40 >> 4) & 1);
                                              bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
                                              bVar20 = (bool)((byte)(uVar40 >> 6) & 1);
                                              bVar21 = (bool)((byte)(uVar40 >> 7) & 1);
                                              bVar22 = (bool)(bVar29 >> 1 & 1);
                                              bVar23 = (bool)(bVar29 >> 2 & 1);
                                              bVar24 = (bool)(bVar29 >> 3 & 1);
                                              bVar25 = (bool)(bVar29 >> 4 & 1);
                                              bVar26 = (bool)(bVar29 >> 5 & 1);
                                              bVar27 = (bool)(bVar29 >> 6 & 1);
                                              *puVar1 = (uint)(bVar28 & 1) * auVar63._0_4_ |
                                                        (uint)!(bool)(bVar28 & 1) * *puVar1;
                                              puVar1[1] = (uint)bVar15 * auVar63._4_4_ |
                                                          (uint)!bVar15 * puVar1[1];
                                              puVar1[2] = (uint)bVar16 * auVar63._8_4_ |
                                                          (uint)!bVar16 * puVar1[2];
                                              puVar1[3] = (uint)bVar17 * auVar63._12_4_ |
                                                          (uint)!bVar17 * puVar1[3];
                                              puVar1[4] = (uint)bVar18 * auVar63._16_4_ |
                                                          (uint)!bVar18 * puVar1[4];
                                              puVar1[5] = (uint)bVar19 * auVar63._20_4_ |
                                                          (uint)!bVar19 * puVar1[5];
                                              puVar1[6] = (uint)bVar20 * auVar63._24_4_ |
                                                          (uint)!bVar20 * puVar1[6];
                                              puVar1[7] = (uint)bVar21 * auVar63._28_4_ |
                                                          (uint)!bVar21 * puVar1[7];
                                              puVar1[8] = (uint)(bVar29 & 1) * auVar63._32_4_ |
                                                          (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                              puVar1[9] = (uint)bVar22 * auVar63._36_4_ |
                                                          (uint)!bVar22 * puVar1[9];
                                              puVar1[10] = (uint)bVar23 * auVar63._40_4_ |
                                                           (uint)!bVar23 * puVar1[10];
                                              puVar1[0xb] = (uint)bVar24 * auVar63._44_4_ |
                                                            (uint)!bVar24 * puVar1[0xb];
                                              puVar1[0xc] = (uint)bVar25 * auVar63._48_4_ |
                                                            (uint)!bVar25 * puVar1[0xc];
                                              puVar1[0xd] = (uint)bVar26 * auVar63._52_4_ |
                                                            (uint)!bVar26 * puVar1[0xd];
                                              puVar1[0xe] = (uint)bVar27 * auVar63._56_4_ |
                                                            (uint)!bVar27 * puVar1[0xe];
                                              puVar1[0xf] = (uint)(bVar29 >> 7) * auVar63._60_4_ |
                                                            (uint)!(bool)(bVar29 >> 7) * puVar1[0xf]
                                              ;
                                              uVar52 = uVar52 + 0x10;
                                            } while ((lVar36 + 0xfU & 0xfffffffffffffff0) != uVar52)
                                            ;
                                          }
                                          lVar53 = lVar53 + 1;
                                        } while (lVar53 != lVar33);
                                        return;
                                      }
                                      goto LAB_0012e6e5;
                                    }
                                    goto LAB_0012e6c9;
                                  }
                                }
                                else {
                                  if (gVar5 != GGML_TYPE_BF16) goto LAB_0012e170;
                                  cVar30 = ggml_is_contiguous_1(pgVar14);
                                  if (((cVar30 != '\0') &&
                                      (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                                     (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0')
                                     ) {
                                    if (pgVar42->nb[0] == 2) {
                                      if (pgVar14->nb[0] == 2) {
                                        lVar39 = pgVar14->ne[1];
                                        lVar54 = pgVar14->ne[2];
                                        sVar6 = pgVar14->nb[1];
                                        sVar7 = pgVar14->nb[2];
                                        sVar8 = pgVar14->nb[3];
                                        lVar36 = pgVar42->ne[0];
                                        sVar9 = pgVar42->nb[1];
                                        sVar10 = pgVar42->nb[2];
                                        sVar11 = pgVar42->nb[3];
                                        gVar2 = pgVar44->type;
                                        iVar3 = *(int *)&pgVar44->field_0x4;
                                        lVar32 = ggml_nrows(pgVar14);
                                        lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                        lVar53 = (int)gVar2 * lVar33;
                                        lVar33 = lVar33 + lVar53;
                                        if (lVar32 <= lVar33) {
                                          lVar33 = lVar32;
                                        }
                                        if (lVar33 <= lVar53) {
                                          return;
                                        }
                                        lVar54 = lVar54 * lVar39;
                                        pvVar12 = pgVar42->data;
                                        pvVar13 = pgVar14->data;
                                        do {
                                          lVar32 = lVar53 / lVar54;
                                          lVar38 = lVar53 % lVar54;
                                          lVar34 = lVar38 / lVar39;
                                          lVar38 = lVar38 % lVar39;
                                          if (0 < lVar36) {
                                            lVar35 = 0;
                                            do {
                                              fVar70 = (float)((uint)*(ushort *)
                                                                      ((long)pvVar13 +
                                                                      lVar35 * 2 +
                                                                      lVar34 * sVar7 +
                                                                      lVar38 * sVar6 +
                                                                      lVar32 * sVar8) << 0x10);
                                              auVar79._0_4_ = (fVar70 + 3.0) / 6.0;
                                              auVar79._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                              auVar73 = vmaxss_avx(auVar79,ZEXT816(0) << 0x40);
                                              auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                              fVar70 = auVar73._0_4_ * fVar70;
                                              if ((uint)ABS(fVar70) < 0x7f800001) {
                                                uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                                  ((uint)fVar70 >> 0x10 & 1) >> 0x10
                                                                 );
                                              }
                                              else {
                                                uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                                              }
                                              *(ushort *)
                                               ((long)pvVar12 +
                                               lVar35 * 2 +
                                               lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                                   uVar40;
                                              lVar35 = lVar35 + 1;
                                            } while (lVar36 != lVar35);
                                          }
                                          lVar53 = lVar53 + 1;
                                        } while (lVar53 != lVar33);
                                        return;
                                      }
                                      goto LAB_0012e6e5;
                                    }
                                    goto LAB_0012e6c9;
                                  }
                                }
                              }
                              else {
LAB_0012e170:
                                if ((gVar2 != GGML_TYPE_F16) || (pgVar42->type != GGML_TYPE_F32)) {
                                  pgVar45 = pgVar14;
                                  pgVar48 = pgVar42;
                                  ggml_compute_forward_hardswish_cold_1();
                                  pgVar50 = pgVar45->src[0];
                                  gVar2 = pgVar50->type;
                                  pgStack_428 = pgVar50;
                                  pgStack_3f8 = pgVar45;
                                  pgStack_3f0 = pgVar44;
                                  pgStack_3e8 = pgVar42;
                                  pgStack_3e0 = pgVar46;
                                  pgStack_3d8 = pgVar14;
                                  pgStack_3d0 = pgVar43;
                                  if ((gVar2 == GGML_TYPE_F32) && (pgVar45->type == GGML_TYPE_F32))
                                  {
                                    pgStack_430 = (ggml_tensor *)0x12ec0c;
                                    cVar30 = ggml_is_contiguous_1(pgVar50);
                                    if (cVar30 != '\0') {
                                      pgStack_430 = (ggml_tensor *)0x12ec1c;
                                      cVar30 = ggml_is_contiguous_1(pgVar45);
                                      if (cVar30 != '\0') {
                                        pgStack_430 = (ggml_tensor *)0x12ec2f;
                                        cVar30 = ggml_are_same_shape(pgVar50,pgVar45);
                                        if (cVar30 != '\0') {
                                          if (pgVar45->nb[0] != 4) goto LAB_0012ef51;
                                          if (pgVar50->nb[0] == 4) {
                                            lVar39 = pgVar50->ne[1];
                                            lVar54 = pgVar50->ne[2];
                                            sStack_400 = pgVar50->nb[1];
                                            sStack_408 = pgVar50->nb[2];
                                            sStack_410 = pgVar50->nb[3];
                                            lVar36 = pgVar45->ne[0];
                                            sStack_418 = pgVar45->nb[1];
                                            sVar6 = pgVar45->nb[2];
                                            sVar7 = pgVar45->nb[3];
                                            gVar2 = pgVar48->type;
                                            sStack_420 = (size_t)*(int *)&pgVar48->field_0x4;
                                            pgStack_430 = (ggml_tensor *)0x12eca5;
                                            lVar32 = ggml_nrows();
                                            lVar33 = (long)(sStack_420 + -1 + lVar32) /
                                                     (long)sStack_420;
                                            lVar53 = (int)gVar2 * lVar33;
                                            lVar33 = lVar33 + lVar53;
                                            if (lVar32 <= lVar33) {
                                              lVar33 = lVar32;
                                            }
                                            if (lVar33 <= lVar53) {
                                              return;
                                            }
                                            lVar54 = lVar54 * lVar39;
                                            pvVar12 = pgStack_3f8->data;
                                            pvVar13 = pgStack_428->data;
                                            do {
                                              lVar32 = lVar53 / lVar54;
                                              lVar38 = lVar53 % lVar54;
                                              lVar34 = lVar38 / lVar39;
                                              lVar38 = lVar38 % lVar39;
                                              if (0 < lVar36) {
                                                lVar35 = 0;
                                                do {
                                                  fVar70 = *(float *)((long)pvVar13 +
                                                                     lVar35 * 4 +
                                                                     lVar34 * sStack_408 +
                                                                     lVar38 * sStack_400 +
                                                                     lVar32 * sStack_410);
                                                  *(float *)((long)pvVar12 +
                                                            lVar35 * 4 +
                                                            lVar34 * sVar6 +
                                                            lVar38 * sStack_418 + lVar32 * sVar7) =
                                                       fVar70 * fVar70;
                                                  lVar35 = lVar35 + 1;
                                                } while (lVar36 != lVar35);
                                              }
                                              lVar53 = lVar53 + 1;
                                            } while (lVar53 != lVar33);
                                            return;
                                          }
LAB_0012ef6d:
                                          pcVar37 = "nb00 == sizeof(src0_t)";
                                          uVar41 = 0x56;
                                          goto LAB_0012ef87;
                                        }
                                      }
                                    }
                                  }
                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                          (pgVar45->type == GGML_TYPE_F16)) {
                                    pgStack_430 = (ggml_tensor *)0x12e75e;
                                    cVar30 = ggml_is_contiguous_1(pgVar50);
                                    if (cVar30 != '\0') {
                                      pgStack_430 = (ggml_tensor *)0x12e76e;
                                      cVar30 = ggml_is_contiguous_1(pgVar45);
                                      if (cVar30 != '\0') {
                                        pgStack_430 = (ggml_tensor *)0x12e781;
                                        cVar30 = ggml_are_same_shape(pgVar50,pgVar45);
                                        if (cVar30 != '\0') {
                                          if (pgVar45->nb[0] == 2) {
                                            if (pgVar50->nb[0] == 2) {
                                              lVar39 = pgVar50->ne[1];
                                              lVar54 = pgVar50->ne[2];
                                              sStack_400 = pgVar50->nb[1];
                                              sStack_408 = pgVar50->nb[2];
                                              sStack_410 = pgVar50->nb[3];
                                              lVar36 = pgVar45->ne[0];
                                              sStack_418 = pgVar45->nb[1];
                                              sStack_420 = pgVar45->nb[2];
                                              gVar2 = pgVar48->type;
                                              iVar3 = *(int *)&pgVar48->field_0x4;
                                              pgStack_430 = (ggml_tensor *)0x12e7f5;
                                              lVar32 = ggml_nrows();
                                              lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                              lVar53 = (int)gVar2 * lVar33;
                                              lVar33 = lVar33 + lVar53;
                                              if (lVar32 <= lVar33) {
                                                lVar33 = lVar32;
                                              }
                                              if (lVar33 <= lVar53) {
                                                return;
                                              }
                                              lVar54 = lVar54 * lVar39;
                                              do {
                                                lVar32 = lVar53 % lVar54;
                                                if (0 < lVar36) {
                                                  lVar34 = 0;
                                                  do {
                                                    auVar73 = vcvtps2ph_f16c(ZEXT416((uint)(*(float 
                                                  *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)pgStack_428->data +
                                                            lVar34 * 2 +
                                                            (lVar32 / lVar39) * sStack_408 +
                                                            (lVar32 % lVar39) * sStack_400 +
                                                            (lVar53 / lVar54) * sStack_410) * 4) *
                                                  *(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pgStack_428->data +
                                                                    lVar34 * 2 +
                                                                    (lVar32 / lVar39) * sStack_408 +
                                                                    (lVar32 % lVar39) * sStack_400 +
                                                                    (lVar53 / lVar54) * sStack_410)
                                                            * 4))),0);
                                                  vpextrw_avx(auVar73,0);
                                                  lVar34 = lVar34 + 1;
                                                  } while (lVar36 != lVar34);
                                                }
                                                lVar53 = lVar53 + 1;
                                              } while (lVar53 != lVar33);
                                              return;
                                            }
                                            goto LAB_0012ef6d;
                                          }
                                          goto LAB_0012ef51;
                                        }
                                      }
                                    }
                                  }
                                  else if (gVar2 == GGML_TYPE_BF16) {
                                    gVar5 = pgVar45->type;
                                    in_RCX = (ulong)gVar5;
                                    if (gVar5 == GGML_TYPE_F32) {
                                      pgStack_430 = (ggml_tensor *)0x12ed6d;
                                      cVar30 = ggml_is_contiguous_1(pgVar50);
                                      if (cVar30 != '\0') {
                                        pgStack_430 = (ggml_tensor *)0x12ed7d;
                                        cVar30 = ggml_is_contiguous_1(pgVar45);
                                        if (cVar30 != '\0') {
                                          pgStack_430 = (ggml_tensor *)0x12ed90;
                                          cVar30 = ggml_are_same_shape(pgVar50,pgVar45);
                                          if (cVar30 != '\0') {
                                            if (pgVar45->nb[0] == 4) {
                                              if (pgVar50->nb[0] == 2) {
                                                lVar39 = pgVar50->ne[1];
                                                lVar54 = pgVar50->ne[2];
                                                sStack_400 = pgVar50->nb[1];
                                                sStack_408 = pgVar50->nb[2];
                                                sStack_410 = pgVar50->nb[3];
                                                lVar36 = pgVar45->ne[0];
                                                sStack_418 = pgVar45->nb[1];
                                                sStack_420 = pgVar45->nb[2];
                                                pgStack_428 = (ggml_tensor *)pgVar45->nb[3];
                                                gVar2 = pgVar48->type;
                                                iVar3 = *(int *)&pgVar48->field_0x4;
                                                pgStack_430 = (ggml_tensor *)0x12ee09;
                                                lVar32 = ggml_nrows(pgVar50);
                                                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                                lVar53 = (int)gVar2 * lVar33;
                                                lVar33 = lVar33 + lVar53;
                                                if (lVar32 <= lVar33) {
                                                  lVar33 = lVar32;
                                                }
                                                if (lVar33 <= lVar53) {
                                                  return;
                                                }
                                                lVar54 = lVar54 * lVar39;
                                                pvVar12 = pgStack_3f8->data;
                                                pvVar13 = pgVar50->data;
                                                auVar69 = vpbroadcastq_avx512f();
                                                auVar65 = vpmovsxbq_avx512f(ZEXT816(
                                                  0xf0e0d0c0b0a0908));
                                                auVar66 = vpmovsxbq_avx512f(ZEXT816(
                                                  0x706050403020100));
                                                do {
                                                  lVar32 = lVar53 / lVar54;
                                                  lVar38 = lVar53 % lVar54;
                                                  lVar34 = lVar38 / lVar39;
                                                  lVar38 = lVar38 % lVar39;
                                                  if (0 < lVar36) {
                                                    uVar52 = 0;
                                                    do {
                                                      auVar67 = vpbroadcastq_avx512f();
                                                      auVar68 = vporq_avx512f(auVar67,auVar65);
                                                      auVar67 = vporq_avx512f(auVar67,auVar66);
                                                      uVar41 = vpcmpuq_avx512f(auVar67,auVar69,2);
                                                      bVar28 = (byte)uVar41;
                                                      uVar41 = vpcmpuq_avx512f(auVar68,auVar69,2);
                                                      bVar29 = (byte)uVar41;
                                                      uVar40 = CONCAT11(bVar29,bVar28);
                                                      auVar61 = vmovdqu16_avx512vl(*(undefined1
                                                                                     (*) [32])
                                                                                    ((long)pvVar13 +
                                                                                    uVar52 * 2 +
                                                                                    lVar34 * 
                                                  sStack_408 +
                                                  lVar38 * sStack_400 + lVar32 * sStack_410));
                                                  auVar60._2_2_ =
                                                       (ushort)((byte)(uVar40 >> 1) & 1) *
                                                       auVar61._2_2_;
                                                  auVar60._0_2_ =
                                                       (ushort)(bVar28 & 1) * auVar61._0_2_;
                                                  auVar60._4_2_ =
                                                       (ushort)((byte)(uVar40 >> 2) & 1) *
                                                       auVar61._4_2_;
                                                  auVar60._6_2_ =
                                                       (ushort)((byte)(uVar40 >> 3) & 1) *
                                                       auVar61._6_2_;
                                                  auVar60._8_2_ =
                                                       (ushort)((byte)(uVar40 >> 4) & 1) *
                                                       auVar61._8_2_;
                                                  auVar60._10_2_ =
                                                       (ushort)((byte)(uVar40 >> 5) & 1) *
                                                       auVar61._10_2_;
                                                  auVar60._12_2_ =
                                                       (ushort)((byte)(uVar40 >> 6) & 1) *
                                                       auVar61._12_2_;
                                                  auVar60._14_2_ =
                                                       (ushort)((byte)(uVar40 >> 7) & 1) *
                                                       auVar61._14_2_;
                                                  auVar60._16_2_ =
                                                       (ushort)(bVar29 & 1) * auVar61._16_2_;
                                                  auVar60._18_2_ =
                                                       (ushort)(bVar29 >> 1 & 1) * auVar61._18_2_;
                                                  auVar60._20_2_ =
                                                       (ushort)(bVar29 >> 2 & 1) * auVar61._20_2_;
                                                  auVar60._22_2_ =
                                                       (ushort)(bVar29 >> 3 & 1) * auVar61._22_2_;
                                                  auVar60._24_2_ =
                                                       (ushort)(bVar29 >> 4 & 1) * auVar61._24_2_;
                                                  auVar60._26_2_ =
                                                       (ushort)(bVar29 >> 5 & 1) * auVar61._26_2_;
                                                  auVar60._28_2_ =
                                                       (ushort)(bVar29 >> 6 & 1) * auVar61._28_2_;
                                                  auVar60._30_2_ =
                                                       (ushort)(bVar29 >> 7) * auVar61._30_2_;
                                                  auVar67 = vpmovzxwd_avx512f(auVar60);
                                                  auVar67 = vpslld_avx512f(auVar67,0x10);
                                                  auVar67 = vmulps_avx512f(auVar67,auVar67);
                                                  puVar1 = (uint *)((long)pvVar12 +
                                                                   uVar52 * 4 +
                                                                   lVar34 * sStack_420 +
                                                                   lVar38 * sStack_418 +
                                                                   lVar32 * (long)pgStack_428);
                                                  bVar15 = (bool)((byte)(uVar40 >> 1) & 1);
                                                  bVar16 = (bool)((byte)(uVar40 >> 2) & 1);
                                                  bVar17 = (bool)((byte)(uVar40 >> 3) & 1);
                                                  bVar18 = (bool)((byte)(uVar40 >> 4) & 1);
                                                  bVar19 = (bool)((byte)(uVar40 >> 5) & 1);
                                                  bVar20 = (bool)((byte)(uVar40 >> 6) & 1);
                                                  bVar21 = (bool)((byte)(uVar40 >> 7) & 1);
                                                  bVar22 = (bool)(bVar29 >> 1 & 1);
                                                  bVar23 = (bool)(bVar29 >> 2 & 1);
                                                  bVar24 = (bool)(bVar29 >> 3 & 1);
                                                  bVar25 = (bool)(bVar29 >> 4 & 1);
                                                  bVar26 = (bool)(bVar29 >> 5 & 1);
                                                  bVar27 = (bool)(bVar29 >> 6 & 1);
                                                  *puVar1 = (uint)(bVar28 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar28 & 1) * *puVar1;
                                                  puVar1[1] = (uint)bVar15 * auVar67._4_4_ |
                                                              (uint)!bVar15 * puVar1[1];
                                                  puVar1[2] = (uint)bVar16 * auVar67._8_4_ |
                                                              (uint)!bVar16 * puVar1[2];
                                                  puVar1[3] = (uint)bVar17 * auVar67._12_4_ |
                                                              (uint)!bVar17 * puVar1[3];
                                                  puVar1[4] = (uint)bVar18 * auVar67._16_4_ |
                                                              (uint)!bVar18 * puVar1[4];
                                                  puVar1[5] = (uint)bVar19 * auVar67._20_4_ |
                                                              (uint)!bVar19 * puVar1[5];
                                                  puVar1[6] = (uint)bVar20 * auVar67._24_4_ |
                                                              (uint)!bVar20 * puVar1[6];
                                                  puVar1[7] = (uint)bVar21 * auVar67._28_4_ |
                                                              (uint)!bVar21 * puVar1[7];
                                                  puVar1[8] = (uint)(bVar29 & 1) * auVar67._32_4_ |
                                                              (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                                  puVar1[9] = (uint)bVar22 * auVar67._36_4_ |
                                                              (uint)!bVar22 * puVar1[9];
                                                  puVar1[10] = (uint)bVar23 * auVar67._40_4_ |
                                                               (uint)!bVar23 * puVar1[10];
                                                  puVar1[0xb] = (uint)bVar24 * auVar67._44_4_ |
                                                                (uint)!bVar24 * puVar1[0xb];
                                                  puVar1[0xc] = (uint)bVar25 * auVar67._48_4_ |
                                                                (uint)!bVar25 * puVar1[0xc];
                                                  puVar1[0xd] = (uint)bVar26 * auVar67._52_4_ |
                                                                (uint)!bVar26 * puVar1[0xd];
                                                  puVar1[0xe] = (uint)bVar27 * auVar67._56_4_ |
                                                                (uint)!bVar27 * puVar1[0xe];
                                                  puVar1[0xf] = (uint)(bVar29 >> 7) * auVar67._60_4_
                                                                | (uint)!(bool)(bVar29 >> 7) *
                                                                  puVar1[0xf];
                                                  uVar52 = uVar52 + 0x10;
                                                  } while ((lVar36 + 0xfU & 0xfffffffffffffff0) !=
                                                           uVar52);
                                                  }
                                                  lVar53 = lVar53 + 1;
                                                } while (lVar53 != lVar33);
                                                return;
                                              }
                                              goto LAB_0012ef6d;
                                            }
                                            goto LAB_0012ef51;
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      if (gVar5 != GGML_TYPE_BF16) goto LAB_0012ea86;
                                      pgStack_430 = (ggml_tensor *)0x12e8ef;
                                      cVar30 = ggml_is_contiguous_1(pgVar50);
                                      if (cVar30 != '\0') {
                                        pgStack_430 = (ggml_tensor *)0x12e8ff;
                                        cVar30 = ggml_is_contiguous_1(pgVar45);
                                        if (cVar30 != '\0') {
                                          pgStack_430 = (ggml_tensor *)0x12e912;
                                          cVar30 = ggml_are_same_shape(pgVar50,pgVar45);
                                          if (cVar30 != '\0') {
                                            if (pgVar45->nb[0] == 2) {
                                              if (pgVar50->nb[0] == 2) {
                                                lVar39 = pgVar50->ne[1];
                                                lVar54 = pgVar50->ne[2];
                                                pgStack_428 = (ggml_tensor *)pgVar50->nb[1];
                                                sStack_400 = pgVar50->nb[2];
                                                sStack_408 = pgVar50->nb[3];
                                                lVar36 = pgVar45->ne[0];
                                                sStack_410 = pgVar45->nb[1];
                                                sStack_418 = pgVar45->nb[2];
                                                sStack_420 = pgVar45->nb[3];
                                                gVar2 = pgVar48->type;
                                                iVar3 = *(int *)&pgVar48->field_0x4;
                                                pgStack_430 = (ggml_tensor *)0x12e98b;
                                                lVar32 = ggml_nrows(pgVar50);
                                                lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                                lVar53 = (int)gVar2 * lVar33;
                                                lVar33 = lVar33 + lVar53;
                                                if (lVar32 <= lVar33) {
                                                  lVar33 = lVar32;
                                                }
                                                if (lVar33 <= lVar53) {
                                                  return;
                                                }
                                                lVar54 = lVar54 * lVar39;
                                                pvVar12 = pgStack_3f8->data;
                                                pvVar13 = pgVar50->data;
                                                do {
                                                  lVar32 = lVar53 / lVar54;
                                                  lVar38 = lVar53 % lVar54;
                                                  lVar34 = lVar38 / lVar39;
                                                  lVar38 = lVar38 % lVar39;
                                                  if (0 < lVar36) {
                                                    lVar35 = 0;
                                                    do {
                                                      fVar70 = (float)((uint)*(ushort *)
                                                                              ((long)pvVar13 +
                                                                              lVar35 * 2 +
                                                                              lVar34 * sStack_400 +
                                                                              lVar38 * (long)
                                                  pgStack_428 + lVar32 * sStack_408) << 0x10);
                                                  fVar70 = fVar70 * fVar70;
                                                  if ((uint)ABS(fVar70) < 0x7f800001) {
                                                    uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                                      ((uint)fVar70 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar12 +
                                                   lVar35 * 2 +
                                                   lVar34 * sStack_418 +
                                                   lVar38 * sStack_410 + lVar32 * sStack_420) =
                                                       uVar40;
                                                  lVar35 = lVar35 + 1;
                                                  } while (lVar36 != lVar35);
                                                  }
                                                  lVar53 = lVar53 + 1;
                                                } while (lVar53 != lVar33);
                                                return;
                                              }
                                              goto LAB_0012ef6d;
                                            }
                                            goto LAB_0012ef51;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  else {
LAB_0012ea86:
                                    if ((gVar2 != GGML_TYPE_F16) || (pgVar45->type != GGML_TYPE_F32)
                                       ) {
                                      pgStack_430 = (ggml_tensor *)ggml_compute_forward_sqrt;
                                      pgVar44 = pgVar50;
                                      pgVar49 = pgVar45;
                                      ggml_compute_forward_sqr_cold_1();
                                      pgVar42 = pgVar44->src[0];
                                      gVar2 = pgVar42->type;
                                      pgStack_470 = pgVar42;
                                      pgStack_468 = pgVar44;
                                      pgStack_458 = pgVar50;
                                      pgStack_450 = pgVar45;
                                      pgStack_448 = pgVar46;
                                      pgStack_440 = pgVar14;
                                      pgStack_438 = pgVar43;
                                      pgStack_430 = pgVar48;
                                      if ((gVar2 == GGML_TYPE_F32) &&
                                         (pgVar44->type == GGML_TYPE_F32)) {
                                        pgStack_4b8 = (ggml_tensor *)0x12f515;
                                        cVar30 = ggml_is_contiguous_1(pgVar42);
                                        if (cVar30 != '\0') {
                                          pgStack_4b8 = (ggml_tensor *)0x12f525;
                                          cVar30 = ggml_is_contiguous_1(pgVar44);
                                          if (cVar30 != '\0') {
                                            pgStack_4b8 = (ggml_tensor *)0x12f538;
                                            cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                            if (cVar30 != '\0') {
                                              if (pgVar44->nb[0] != 4) goto LAB_0012f851;
                                              if (pgVar42->nb[0] == 4) {
                                                lStack_4a8 = pgVar42->ne[1];
                                                lStack_4b0 = pgVar42->ne[2];
                                                sStack_478 = pgVar42->nb[1];
                                                sStack_480 = pgVar42->nb[2];
                                                sStack_488 = pgVar42->nb[3];
                                                lVar39 = pgVar44->ne[0];
                                                sStack_490 = pgVar44->nb[1];
                                                sStack_498 = pgVar44->nb[2];
                                                sStack_4a0 = pgVar44->nb[3];
                                                gVar2 = pgVar49->type;
                                                iVar3 = *(int *)&pgVar49->field_0x4;
                                                pgStack_4b8 = (ggml_tensor *)0x12f5b0;
                                                lVar36 = ggml_nrows(pgVar42);
                                                lVar54 = ((long)iVar3 + -1 + lVar36) / (long)iVar3;
                                                lVar33 = (int)gVar2 * lVar54;
                                                lVar54 = lVar54 + lVar33;
                                                if (lVar36 <= lVar54) {
                                                  lVar54 = lVar36;
                                                }
                                                if (lVar54 <= lVar33) {
                                                  return;
                                                }
                                                lStack_4b0 = lStack_4b0 * lStack_4a8;
                                                do {
                                                  lVar36 = (lVar33 % lStack_4b0) / lStack_4a8;
                                                  lVar32 = (lVar33 % lStack_4b0) % lStack_4a8;
                                                  if (0 < lVar39) {
                                                    lVar34 = (lVar33 / lStack_4b0) * sStack_4a0;
                                                    lVar38 = lVar36 * sStack_498;
                                                    lVar35 = lVar32 * sStack_490;
                                                    lVar53 = (lVar33 / lStack_4b0) * sStack_488;
                                                    lVar36 = lVar36 * sStack_480;
                                                    lVar32 = lVar32 * sStack_478;
                                                    pvVar12 = pgStack_468->data;
                                                    pvVar13 = pgStack_470->data;
                                                    lVar55 = 0;
                                                    do {
                                                      fVar70 = *(float *)((long)pvVar13 +
                                                                         lVar55 * 4 +
                                                                         lVar36 + lVar32 + lVar53);
                                                      if (fVar70 < 0.0) {
                                                        pgStack_4b8 = (ggml_tensor *)0x12f676;
                                                        fVar70 = sqrtf(fVar70);
                                                      }
                                                      else {
                                                        auVar73 = vsqrtss_avx(ZEXT416((uint)fVar70),
                                                                              ZEXT416((uint)fVar70))
                                                        ;
                                                        fVar70 = auVar73._0_4_;
                                                      }
                                                      *(float *)((long)pvVar12 +
                                                                lVar55 * 4 +
                                                                lVar38 + lVar35 + lVar34) = fVar70;
                                                      lVar55 = lVar55 + 1;
                                                    } while (lVar39 != lVar55);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                } while (lVar33 != lVar54);
                                                return;
                                              }
LAB_0012f86d:
                                              pcVar37 = "nb00 == sizeof(src0_t)";
                                              uVar41 = 0x56;
                                              goto LAB_0012f887;
                                            }
                                          }
                                        }
                                      }
                                      else if ((gVar2 == GGML_TYPE_F16) &&
                                              (pgVar44->type == GGML_TYPE_F16)) {
                                        pgStack_4b8 = (ggml_tensor *)0x12efe9;
                                        cVar30 = ggml_is_contiguous_1(pgVar42);
                                        if (cVar30 != '\0') {
                                          pgStack_4b8 = (ggml_tensor *)0x12eff9;
                                          cVar30 = ggml_is_contiguous_1(pgVar44);
                                          if (cVar30 != '\0') {
                                            pgStack_4b8 = (ggml_tensor *)0x12f00c;
                                            cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                            if (cVar30 != '\0') {
                                              if (pgVar44->nb[0] == 2) {
                                                if (pgVar42->nb[0] == 2) {
                                                  lStack_4a8 = pgVar42->ne[1];
                                                  lStack_4b0 = pgVar42->ne[2];
                                                  sStack_480 = pgVar42->nb[1];
                                                  sStack_488 = pgVar42->nb[2];
                                                  sStack_490 = pgVar42->nb[3];
                                                  lVar39 = pgVar44->ne[0];
                                                  sStack_498 = pgVar44->nb[1];
                                                  sStack_4a0 = pgVar44->nb[2];
                                                  sStack_460 = pgVar44->nb[3];
                                                  gVar2 = pgVar49->type;
                                                  iVar3 = *(int *)&pgVar49->field_0x4;
                                                  pgStack_4b8 = (ggml_tensor *)0x12f084;
                                                  lVar54 = ggml_nrows(pgVar42);
                                                  lVar36 = ((long)iVar3 + -1 + lVar54) / (long)iVar3
                                                  ;
                                                  lVar33 = (int)gVar2 * lVar36;
                                                  sStack_478 = lVar36 + lVar33;
                                                  if (lVar54 <= (long)sStack_478) {
                                                    sStack_478 = lVar54;
                                                  }
                                                  if ((long)sStack_478 <= lVar33) {
                                                    return;
                                                  }
                                                  lStack_4b0 = lStack_4b0 * lStack_4a8;
                                                  do {
                                                    if (0 < lVar39) {
                                                      lVar36 = (lVar33 / lStack_4b0) * sStack_490;
                                                      lVar54 = ((lVar33 % lStack_4b0) / lStack_4a8)
                                                               * sStack_488;
                                                      lVar32 = ((lVar33 % lStack_4b0) % lStack_4a8)
                                                               * sStack_480;
                                                      pvVar12 = pgStack_470->data;
                                                      lVar53 = 0;
                                                      do {
                                                        fVar70 = *(float *)(&ggml_table_f32_f16 +
                                                                           (ulong)*(ushort *)
                                                                                   ((long)pvVar12 +
                                                                                   lVar53 * 2 +
                                                                                   lVar54 + lVar32 +
                                                                                            lVar36)
                                                                           * 4);
                                                        if (fVar70 < 0.0) {
                                                          pgStack_4b8 = (ggml_tensor *)0x12f158;
                                                          auVar68._0_4_ = sqrtf(fVar70);
                                                          auVar68._4_60_ = extraout_var_02;
                                                          auVar73 = auVar68._0_16_;
                                                        }
                                                        else {
                                                          auVar73 = vsqrtss_avx(ZEXT416((uint)fVar70
                                                                                       ),ZEXT416((
                                                  uint)fVar70));
                                                  }
                                                  auVar73 = vcvtps2ph_f16c(auVar73,0);
                                                  vpextrw_avx(auVar73,0);
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_478);
                                                  return;
                                                }
                                                goto LAB_0012f86d;
                                              }
                                              goto LAB_0012f851;
                                            }
                                          }
                                        }
                                      }
                                      else if (gVar2 == GGML_TYPE_BF16) {
                                        gVar5 = pgVar44->type;
                                        in_RCX = (ulong)gVar5;
                                        if (gVar5 == GGML_TYPE_F32) {
                                          pgStack_4b8 = (ggml_tensor *)0x12f6a2;
                                          cVar30 = ggml_is_contiguous_1(pgVar42);
                                          if (cVar30 != '\0') {
                                            pgStack_4b8 = (ggml_tensor *)0x12f6b2;
                                            cVar30 = ggml_is_contiguous_1(pgVar44);
                                            if (cVar30 != '\0') {
                                              pgStack_4b8 = (ggml_tensor *)0x12f6c5;
                                              cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                              if (cVar30 != '\0') {
                                                if (pgVar44->nb[0] == 4) {
                                                  if (pgVar42->nb[0] == 2) {
                                                    lStack_4a8 = pgVar42->ne[1];
                                                    lStack_4b0 = pgVar42->ne[2];
                                                    sStack_478 = pgVar42->nb[1];
                                                    sStack_480 = pgVar42->nb[2];
                                                    sStack_488 = pgVar42->nb[3];
                                                    lVar39 = pgVar44->ne[0];
                                                    sStack_490 = pgVar44->nb[1];
                                                    sStack_498 = pgVar44->nb[2];
                                                    sStack_4a0 = pgVar44->nb[3];
                                                    gVar2 = pgVar49->type;
                                                    iVar3 = *(int *)&pgVar49->field_0x4;
                                                    pgStack_4b8 = (ggml_tensor *)0x12f73d;
                                                    lVar36 = ggml_nrows(pgVar42);
                                                    lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                             (long)iVar3;
                                                    lVar33 = (int)gVar2 * lVar54;
                                                    lVar54 = lVar54 + lVar33;
                                                    if (lVar36 <= lVar54) {
                                                      lVar54 = lVar36;
                                                    }
                                                    if (lVar54 <= lVar33) {
                                                      return;
                                                    }
                                                    lStack_4b0 = lStack_4b0 * lStack_4a8;
                                                    do {
                                                      lVar36 = (lVar33 % lStack_4b0) / lStack_4a8;
                                                      lVar32 = (lVar33 % lStack_4b0) % lStack_4a8;
                                                      if (0 < lVar39) {
                                                        lVar34 = (lVar33 / lStack_4b0) * sStack_4a0;
                                                        lVar35 = lVar36 * sStack_498;
                                                        lVar55 = lVar32 * sStack_490;
                                                        lVar53 = (lVar33 / lStack_4b0) * sStack_488;
                                                        lVar36 = lVar36 * sStack_480;
                                                        lVar32 = lVar32 * sStack_478;
                                                        pvVar12 = pgStack_468->data;
                                                        pvVar13 = pgStack_470->data;
                                                        lVar38 = 0;
                                                        do {
                                                          uVar40 = *(ushort *)
                                                                    ((long)pvVar13 +
                                                                    lVar38 * 2 +
                                                                    lVar36 + lVar32 + lVar53);
                                                          fVar70 = (float)((uint)uVar40 << 0x10);
                                                          if (fVar70 < 0.0) {
                                                            pgStack_4b8 = (ggml_tensor *)0x12f807;
                                                            fVar70 = sqrtf(fVar70);
                                                          }
                                                          else {
                                                            auVar73 = ZEXT216(uVar40) << 0x10;
                                                            auVar73 = vsqrtss_avx(auVar73,auVar73);
                                                            fVar70 = auVar73._0_4_;
                                                          }
                                                          *(float *)((long)pvVar12 +
                                                                    lVar38 * 4 +
                                                                    lVar35 + lVar55 + lVar34) =
                                                               fVar70;
                                                          lVar38 = lVar38 + 1;
                                                        } while (lVar39 != lVar38);
                                                      }
                                                      lVar33 = lVar33 + 1;
                                                    } while (lVar33 != lVar54);
                                                    return;
                                                  }
                                                  goto LAB_0012f86d;
                                                }
                                                goto LAB_0012f851;
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          if (gVar5 != GGML_TYPE_BF16) goto LAB_0012f35e;
                                          pgStack_4b8 = (ggml_tensor *)0x12f1a9;
                                          cVar30 = ggml_is_contiguous_1(pgVar42);
                                          if (cVar30 != '\0') {
                                            pgStack_4b8 = (ggml_tensor *)0x12f1b9;
                                            cVar30 = ggml_is_contiguous_1(pgVar44);
                                            if (cVar30 != '\0') {
                                              pgStack_4b8 = (ggml_tensor *)0x12f1cc;
                                              cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                              if (cVar30 != '\0') {
                                                if (pgVar44->nb[0] == 2) {
                                                  if (pgVar42->nb[0] == 2) {
                                                    lStack_4a8 = pgVar42->ne[1];
                                                    lStack_4b0 = pgVar42->ne[2];
                                                    sStack_478 = pgVar42->nb[1];
                                                    sStack_480 = pgVar42->nb[2];
                                                    sStack_488 = pgVar42->nb[3];
                                                    lVar39 = pgVar44->ne[0];
                                                    sStack_490 = pgVar44->nb[1];
                                                    sStack_498 = pgVar44->nb[2];
                                                    sStack_4a0 = pgVar44->nb[3];
                                                    gVar2 = pgVar49->type;
                                                    iVar3 = *(int *)&pgVar49->field_0x4;
                                                    pgStack_4b8 = (ggml_tensor *)0x12f244;
                                                    lVar36 = ggml_nrows(pgVar42);
                                                    lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                             (long)iVar3;
                                                    lVar33 = (int)gVar2 * lVar54;
                                                    lVar54 = lVar54 + lVar33;
                                                    if (lVar36 <= lVar54) {
                                                      lVar54 = lVar36;
                                                    }
                                                    if (lVar54 <= lVar33) {
                                                      return;
                                                    }
                                                    lStack_4b0 = lStack_4b0 * lStack_4a8;
                                                    do {
                                                      lVar36 = (lVar33 % lStack_4b0) / lStack_4a8;
                                                      lVar32 = (lVar33 % lStack_4b0) % lStack_4a8;
                                                      if (0 < lVar39) {
                                                        lVar34 = (lVar33 / lStack_4b0) * sStack_4a0;
                                                        lVar35 = lVar36 * sStack_498;
                                                        lVar38 = lVar32 * sStack_490;
                                                        lVar53 = (lVar33 / lStack_4b0) * sStack_488;
                                                        lVar36 = lVar36 * sStack_480;
                                                        lVar32 = lVar32 * sStack_478;
                                                        pvVar12 = pgStack_468->data;
                                                        pvVar13 = pgStack_470->data;
                                                        lVar55 = 0;
                                                        do {
                                                          uVar40 = *(ushort *)
                                                                    ((long)pvVar13 +
                                                                    lVar55 * 2 +
                                                                    lVar36 + lVar32 + lVar53);
                                                          fVar70 = (float)((uint)uVar40 << 0x10);
                                                          if (fVar70 < 0.0) {
                                                            pgStack_4b8 = (ggml_tensor *)0x12f311;
                                                            fVar70 = sqrtf(fVar70);
                                                          }
                                                          else {
                                                            auVar73 = ZEXT216(uVar40) << 0x10;
                                                            auVar73 = vsqrtss_avx(auVar73,auVar73);
                                                            fVar70 = auVar73._0_4_;
                                                          }
                                                          if ((uint)ABS(fVar70) < 0x7f800001) {
                                                            uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                                              ((uint)fVar70 >> 0x10
                                                                              & 1) >> 0x10);
                                                          }
                                                          else {
                                                            uVar40 = (ushort)((uint)fVar70 >> 0x10)
                                                                     | 0x40;
                                                          }
                                                          *(ushort *)
                                                           ((long)pvVar12 +
                                                           lVar55 * 2 + lVar35 + lVar38 + lVar34) =
                                                               uVar40;
                                                          lVar55 = lVar55 + 1;
                                                        } while (lVar39 != lVar55);
                                                      }
                                                      lVar33 = lVar33 + 1;
                                                    } while (lVar33 != lVar54);
                                                    return;
                                                  }
                                                  goto LAB_0012f86d;
                                                }
                                                goto LAB_0012f851;
                                              }
                                            }
                                          }
                                        }
                                      }
                                      else {
LAB_0012f35e:
                                        if ((gVar2 != GGML_TYPE_F16) ||
                                           (pgVar44->type != GGML_TYPE_F32)) {
                                          pgStack_4b8 = (ggml_tensor *)ggml_compute_forward_sin;
                                          pgVar46 = pgVar42;
                                          pgVar50 = pgVar44;
                                          ggml_compute_forward_sqrt_cold_1();
                                          pgVar43 = pgVar46->src[0];
                                          gVar2 = pgVar43->type;
                                          pgStack_4f8 = pgVar43;
                                          pgStack_4f0 = pgVar46;
                                          pgStack_4e0 = pgVar44;
                                          pgStack_4d8 = pgVar45;
                                          pgStack_4d0 = pgVar42;
                                          pgStack_4c8 = pgVar14;
                                          pgStack_4c0 = pgVar49;
                                          pgStack_4b8 = pgVar48;
                                          if ((gVar2 == GGML_TYPE_F32) &&
                                             (pgVar46->type == GGML_TYPE_F32)) {
                                            pgStack_540 = (ggml_tensor *)0x12fdd1;
                                            cVar30 = ggml_is_contiguous_1(pgVar43);
                                            if (cVar30 != '\0') {
                                              pgStack_540 = (ggml_tensor *)0x12fde1;
                                              cVar30 = ggml_is_contiguous_1(pgVar46);
                                              if (cVar30 != '\0') {
                                                pgStack_540 = (ggml_tensor *)0x12fdf4;
                                                cVar30 = ggml_are_same_shape(pgVar43,pgVar46);
                                                if (cVar30 != '\0') {
                                                  if (pgVar46->nb[0] != 4) goto LAB_001300dd;
                                                  if (pgVar43->nb[0] == 4) {
                                                    lStack_530 = pgVar43->ne[1];
                                                    lStack_538 = pgVar43->ne[2];
                                                    sStack_500 = pgVar43->nb[1];
                                                    sStack_508 = pgVar43->nb[2];
                                                    sStack_510 = pgVar43->nb[3];
                                                    lVar39 = pgVar46->ne[0];
                                                    sStack_518 = pgVar46->nb[1];
                                                    sStack_520 = pgVar46->nb[2];
                                                    sStack_528 = pgVar46->nb[3];
                                                    gVar2 = pgVar50->type;
                                                    iVar3 = *(int *)&pgVar50->field_0x4;
                                                    pgStack_540 = (ggml_tensor *)0x12fe6c;
                                                    lVar36 = ggml_nrows(pgVar43);
                                                    lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                             (long)iVar3;
                                                    lVar33 = (int)gVar2 * lVar54;
                                                    lVar54 = lVar54 + lVar33;
                                                    if (lVar36 <= lVar54) {
                                                      lVar54 = lVar36;
                                                    }
                                                    if (lVar54 <= lVar33) {
                                                      return;
                                                    }
                                                    lStack_538 = lStack_538 * lStack_530;
                                                    do {
                                                      lVar36 = (lVar33 % lStack_538) / lStack_530;
                                                      lVar32 = (lVar33 % lStack_538) % lStack_530;
                                                      if (0 < lVar39) {
                                                        lVar34 = (lVar33 / lStack_538) * sStack_528;
                                                        lVar38 = lVar36 * sStack_520;
                                                        lVar35 = lVar32 * sStack_518;
                                                        lVar53 = (lVar33 / lStack_538) * sStack_510;
                                                        lVar36 = lVar36 * sStack_508;
                                                        lVar32 = lVar32 * sStack_500;
                                                        pvVar12 = pgStack_4f0->data;
                                                        pvVar13 = pgStack_4f8->data;
                                                        lVar55 = 0;
                                                        do {
                                                          pgStack_540 = (ggml_tensor *)0x12ff1e;
                                                          fVar70 = sinf(*(float *)((long)pvVar13 +
                                                                                  lVar55 * 4 +
                                                                                  lVar36 + lVar32 + 
                                                  lVar53));
                                                  *(float *)((long)pvVar12 +
                                                            lVar55 * 4 + lVar38 + lVar35 + lVar34) =
                                                       fVar70;
                                                  lVar55 = lVar55 + 1;
                                                  } while (lVar39 != lVar55);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
LAB_001300f9:
                                                  pcVar37 = "nb00 == sizeof(src0_t)";
                                                  uVar41 = 0x56;
                                                  goto LAB_00130113;
                                                }
                                              }
                                            }
                                          }
                                          else if ((gVar2 == GGML_TYPE_F16) &&
                                                  (pgVar46->type == GGML_TYPE_F16)) {
                                            pgStack_540 = (ggml_tensor *)0x12f8e9;
                                            cVar30 = ggml_is_contiguous_1(pgVar43);
                                            if (cVar30 != '\0') {
                                              pgStack_540 = (ggml_tensor *)0x12f8f9;
                                              cVar30 = ggml_is_contiguous_1(pgVar46);
                                              if (cVar30 != '\0') {
                                                pgStack_540 = (ggml_tensor *)0x12f90c;
                                                cVar30 = ggml_are_same_shape(pgVar43,pgVar46);
                                                if (cVar30 != '\0') {
                                                  if (pgVar46->nb[0] == 2) {
                                                    if (pgVar43->nb[0] == 2) {
                                                      lStack_530 = pgVar43->ne[1];
                                                      lStack_538 = pgVar43->ne[2];
                                                      sStack_508 = pgVar43->nb[1];
                                                      sStack_510 = pgVar43->nb[2];
                                                      sStack_518 = pgVar43->nb[3];
                                                      lVar39 = pgVar46->ne[0];
                                                      sStack_520 = pgVar46->nb[1];
                                                      sStack_528 = pgVar46->nb[2];
                                                      sStack_4e8 = pgVar46->nb[3];
                                                      gVar2 = pgVar50->type;
                                                      iVar3 = *(int *)&pgVar50->field_0x4;
                                                      pgStack_540 = (ggml_tensor *)0x12f984;
                                                      lVar54 = ggml_nrows(pgVar43);
                                                      lVar36 = ((long)iVar3 + -1 + lVar54) /
                                                               (long)iVar3;
                                                      lVar33 = (int)gVar2 * lVar36;
                                                      sStack_500 = lVar36 + lVar33;
                                                      if (lVar54 <= (long)sStack_500) {
                                                        sStack_500 = lVar54;
                                                      }
                                                      if ((long)sStack_500 <= lVar33) {
                                                        return;
                                                      }
                                                      lStack_538 = lStack_538 * lStack_530;
                                                      do {
                                                        if (0 < lVar39) {
                                                          lVar36 = (lVar33 / lStack_538) *
                                                                   sStack_518;
                                                          lVar54 = ((lVar33 % lStack_538) /
                                                                   lStack_530) * sStack_510;
                                                          lVar32 = ((lVar33 % lStack_538) %
                                                                   lStack_530) * sStack_508;
                                                          pvVar12 = pgStack_4f8->data;
                                                          lVar53 = 0;
                                                          do {
                                                            pgStack_540 = (ggml_tensor *)0x12fa44;
                                                            auVar67._0_4_ =
                                                                 sinf(*(float *)(&ggml_table_f32_f16
                                                                                + (ulong)*(ushort *)
                                                                                          ((long)
                                                  pvVar12 + lVar53 * 2 + lVar54 + lVar32 + lVar36) *
                                                  4));
                                                  auVar67._4_60_ = extraout_var_03;
                                                  auVar73 = vcvtps2ph_f16c(auVar67._0_16_,0);
                                                  vpextrw_avx(auVar73,0);
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_500);
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
                                                  goto LAB_001300dd;
                                                }
                                              }
                                            }
                                          }
                                          else if (gVar2 == GGML_TYPE_BF16) {
                                            gVar5 = pgVar46->type;
                                            in_RCX = (ulong)gVar5;
                                            if (gVar5 == GGML_TYPE_F32) {
                                              pgStack_540 = (ggml_tensor *)0x12ff46;
                                              cVar30 = ggml_is_contiguous_1(pgVar43);
                                              if (cVar30 != '\0') {
                                                pgStack_540 = (ggml_tensor *)0x12ff56;
                                                cVar30 = ggml_is_contiguous_1(pgVar46);
                                                if (cVar30 != '\0') {
                                                  pgStack_540 = (ggml_tensor *)0x12ff69;
                                                  cVar30 = ggml_are_same_shape(pgVar43,pgVar46);
                                                  if (cVar30 != '\0') {
                                                    if (pgVar46->nb[0] == 4) {
                                                      if (pgVar43->nb[0] == 2) {
                                                        lStack_530 = pgVar43->ne[1];
                                                        lStack_538 = pgVar43->ne[2];
                                                        sStack_500 = pgVar43->nb[1];
                                                        sStack_508 = pgVar43->nb[2];
                                                        sStack_510 = pgVar43->nb[3];
                                                        lVar39 = pgVar46->ne[0];
                                                        sStack_518 = pgVar46->nb[1];
                                                        sStack_520 = pgVar46->nb[2];
                                                        sStack_528 = pgVar46->nb[3];
                                                        gVar2 = pgVar50->type;
                                                        iVar3 = *(int *)&pgVar50->field_0x4;
                                                        pgStack_540 = (ggml_tensor *)0x12ffe1;
                                                        lVar36 = ggml_nrows(pgVar43);
                                                        lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                 (long)iVar3;
                                                        lVar33 = (int)gVar2 * lVar54;
                                                        lVar54 = lVar54 + lVar33;
                                                        if (lVar36 <= lVar54) {
                                                          lVar54 = lVar36;
                                                        }
                                                        if (lVar54 <= lVar33) {
                                                          return;
                                                        }
                                                        lStack_538 = lStack_538 * lStack_530;
                                                        do {
                                                          lVar36 = (lVar33 % lStack_538) /
                                                                   lStack_530;
                                                          lVar32 = (lVar33 % lStack_538) %
                                                                   lStack_530;
                                                          if (0 < lVar39) {
                                                            lVar34 = (lVar33 / lStack_538) *
                                                                     sStack_528;
                                                            lVar35 = lVar36 * sStack_520;
                                                            lVar55 = lVar32 * sStack_518;
                                                            lVar53 = (lVar33 / lStack_538) *
                                                                     sStack_510;
                                                            lVar36 = lVar36 * sStack_508;
                                                            lVar32 = lVar32 * sStack_500;
                                                            pvVar12 = pgStack_4f0->data;
                                                            pvVar13 = pgStack_4f8->data;
                                                            lVar38 = 0;
                                                            do {
                                                              pgStack_540 = (ggml_tensor *)0x130097;
                                                              fVar70 = sinf((float)((uint)*(ushort *
                                                  )((long)pvVar13 +
                                                   lVar38 * 2 + lVar36 + lVar32 + lVar53) << 0x10));
                                                  *(float *)((long)pvVar12 +
                                                            lVar38 * 4 + lVar35 + lVar55 + lVar34) =
                                                       fVar70;
                                                  lVar38 = lVar38 + 1;
                                                  } while (lVar39 != lVar38);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
                                                  goto LAB_001300dd;
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              if (gVar5 != GGML_TYPE_BF16) goto LAB_0012fc32;
                                              pgStack_540 = (ggml_tensor *)0x12fa91;
                                              cVar30 = ggml_is_contiguous_1(pgVar43);
                                              if (cVar30 != '\0') {
                                                pgStack_540 = (ggml_tensor *)0x12faa1;
                                                cVar30 = ggml_is_contiguous_1(pgVar46);
                                                if (cVar30 != '\0') {
                                                  pgStack_540 = (ggml_tensor *)0x12fab4;
                                                  cVar30 = ggml_are_same_shape(pgVar43,pgVar46);
                                                  if (cVar30 != '\0') {
                                                    if (pgVar46->nb[0] == 2) {
                                                      if (pgVar43->nb[0] == 2) {
                                                        lStack_530 = pgVar43->ne[1];
                                                        lStack_538 = pgVar43->ne[2];
                                                        sStack_500 = pgVar43->nb[1];
                                                        sStack_508 = pgVar43->nb[2];
                                                        sStack_510 = pgVar43->nb[3];
                                                        lVar39 = pgVar46->ne[0];
                                                        sStack_518 = pgVar46->nb[1];
                                                        sStack_520 = pgVar46->nb[2];
                                                        sStack_528 = pgVar46->nb[3];
                                                        gVar2 = pgVar50->type;
                                                        iVar3 = *(int *)&pgVar50->field_0x4;
                                                        pgStack_540 = (ggml_tensor *)0x12fb2c;
                                                        lVar36 = ggml_nrows(pgVar43);
                                                        lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                 (long)iVar3;
                                                        lVar33 = (int)gVar2 * lVar54;
                                                        lVar54 = lVar54 + lVar33;
                                                        if (lVar36 <= lVar54) {
                                                          lVar54 = lVar36;
                                                        }
                                                        if (lVar54 <= lVar33) {
                                                          return;
                                                        }
                                                        lStack_538 = lStack_538 * lStack_530;
                                                        do {
                                                          lVar36 = (lVar33 % lStack_538) /
                                                                   lStack_530;
                                                          lVar32 = (lVar33 % lStack_538) %
                                                                   lStack_530;
                                                          if (0 < lVar39) {
                                                            lVar34 = (lVar33 / lStack_538) *
                                                                     sStack_528;
                                                            lVar35 = lVar36 * sStack_520;
                                                            lVar38 = lVar32 * sStack_518;
                                                            lVar53 = (lVar33 / lStack_538) *
                                                                     sStack_510;
                                                            lVar36 = lVar36 * sStack_508;
                                                            lVar32 = lVar32 * sStack_500;
                                                            pvVar12 = pgStack_4f0->data;
                                                            pvVar13 = pgStack_4f8->data;
                                                            lVar55 = 0;
                                                            do {
                                                              pgStack_540 = (ggml_tensor *)0x12fbe9;
                                                              fVar70 = sinf((float)((uint)*(ushort *
                                                  )((long)pvVar13 +
                                                   lVar55 * 2 + lVar36 + lVar32 + lVar53) << 0x10));
                                                  if ((uint)ABS(fVar70) < 0x7f800001) {
                                                    uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                                      ((uint)fVar70 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar12 +
                                                   lVar55 * 2 + lVar35 + lVar38 + lVar34) = uVar40;
                                                  lVar55 = lVar55 + 1;
                                                  } while (lVar39 != lVar55);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
                                                  goto LAB_001300dd;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
LAB_0012fc32:
                                            if ((gVar2 != GGML_TYPE_F16) ||
                                               (pgVar46->type != GGML_TYPE_F32)) {
                                              pgStack_540 = (ggml_tensor *)ggml_compute_forward_cos;
                                              pgVar44 = pgVar43;
                                              pgVar49 = pgVar46;
                                              ggml_compute_forward_sin_cold_1();
                                              pgVar42 = pgVar44->src[0];
                                              gVar2 = pgVar42->type;
                                              pgStack_580 = pgVar42;
                                              pgStack_578 = pgVar44;
                                              pgStack_568 = pgVar46;
                                              pgStack_560 = pgVar45;
                                              pgStack_558 = pgVar43;
                                              pgStack_550 = pgVar14;
                                              pgStack_548 = pgVar50;
                                              pgStack_540 = pgVar48;
                                              if ((gVar2 == GGML_TYPE_F32) &&
                                                 (pgVar44->type == GGML_TYPE_F32)) {
                                                pgStack_5c8 = (ggml_tensor *)0x13065d;
                                                cVar30 = ggml_is_contiguous_1(pgVar42);
                                                if (cVar30 != '\0') {
                                                  pgStack_5c8 = (ggml_tensor *)0x13066d;
                                                  cVar30 = ggml_is_contiguous_1(pgVar44);
                                                  if (cVar30 != '\0') {
                                                    pgStack_5c8 = (ggml_tensor *)0x130680;
                                                    cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                                    if (cVar30 != '\0') {
                                                      if (pgVar44->nb[0] != 4) goto LAB_00130969;
                                                      if (pgVar42->nb[0] == 4) {
                                                        lStack_5b8 = pgVar42->ne[1];
                                                        lStack_5c0 = pgVar42->ne[2];
                                                        sStack_588 = pgVar42->nb[1];
                                                        sStack_590 = pgVar42->nb[2];
                                                        sStack_598 = pgVar42->nb[3];
                                                        lVar39 = pgVar44->ne[0];
                                                        sStack_5a0 = pgVar44->nb[1];
                                                        sStack_5a8 = pgVar44->nb[2];
                                                        sStack_5b0 = pgVar44->nb[3];
                                                        gVar2 = pgVar49->type;
                                                        iVar3 = *(int *)&pgVar49->field_0x4;
                                                        pgStack_5c8 = (ggml_tensor *)0x1306f8;
                                                        lVar36 = ggml_nrows(pgVar42);
                                                        lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                 (long)iVar3;
                                                        lVar33 = (int)gVar2 * lVar54;
                                                        lVar54 = lVar54 + lVar33;
                                                        if (lVar36 <= lVar54) {
                                                          lVar54 = lVar36;
                                                        }
                                                        if (lVar54 <= lVar33) {
                                                          return;
                                                        }
                                                        lStack_5c0 = lStack_5c0 * lStack_5b8;
                                                        do {
                                                          lVar36 = (lVar33 % lStack_5c0) /
                                                                   lStack_5b8;
                                                          lVar32 = (lVar33 % lStack_5c0) %
                                                                   lStack_5b8;
                                                          if (0 < lVar39) {
                                                            lVar34 = (lVar33 / lStack_5c0) *
                                                                     sStack_5b0;
                                                            lVar38 = lVar36 * sStack_5a8;
                                                            lVar35 = lVar32 * sStack_5a0;
                                                            lVar53 = (lVar33 / lStack_5c0) *
                                                                     sStack_598;
                                                            lVar36 = lVar36 * sStack_590;
                                                            lVar32 = lVar32 * sStack_588;
                                                            pvVar12 = pgStack_578->data;
                                                            pvVar13 = pgStack_580->data;
                                                            lVar55 = 0;
                                                            do {
                                                              pgStack_5c8 = (ggml_tensor *)0x1307aa;
                                                              fVar70 = cosf(*(float *)((long)pvVar13
                                                                                      + lVar55 * 4 +
                                                                                        lVar36 + 
                                                  lVar32 + lVar53));
                                                  *(float *)((long)pvVar12 +
                                                            lVar55 * 4 + lVar38 + lVar35 + lVar34) =
                                                       fVar70;
                                                  lVar55 = lVar55 + 1;
                                                  } while (lVar39 != lVar55);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
LAB_00130985:
                                                  pcVar37 = "nb00 == sizeof(src0_t)";
                                                  uVar41 = 0x56;
                                                  goto LAB_0013099f;
                                                  }
                                                  }
                                                }
                                              }
                                              else if ((gVar2 == GGML_TYPE_F16) &&
                                                      (pgVar44->type == GGML_TYPE_F16)) {
                                                pgStack_5c8 = (ggml_tensor *)0x130175;
                                                cVar30 = ggml_is_contiguous_1(pgVar42);
                                                if (cVar30 != '\0') {
                                                  pgStack_5c8 = (ggml_tensor *)0x130185;
                                                  cVar30 = ggml_is_contiguous_1(pgVar44);
                                                  if (cVar30 != '\0') {
                                                    pgStack_5c8 = (ggml_tensor *)0x130198;
                                                    cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                                    if (cVar30 != '\0') {
                                                      if (pgVar44->nb[0] == 2) {
                                                        if (pgVar42->nb[0] == 2) {
                                                          lStack_5b8 = pgVar42->ne[1];
                                                          lStack_5c0 = pgVar42->ne[2];
                                                          sStack_590 = pgVar42->nb[1];
                                                          sStack_598 = pgVar42->nb[2];
                                                          sStack_5a0 = pgVar42->nb[3];
                                                          lVar39 = pgVar44->ne[0];
                                                          sStack_5a8 = pgVar44->nb[1];
                                                          sStack_5b0 = pgVar44->nb[2];
                                                          sStack_570 = pgVar44->nb[3];
                                                          gVar2 = pgVar49->type;
                                                          iVar3 = *(int *)&pgVar49->field_0x4;
                                                          pgStack_5c8 = (ggml_tensor *)0x130210;
                                                          lVar54 = ggml_nrows(pgVar42);
                                                          lVar36 = ((long)iVar3 + -1 + lVar54) /
                                                                   (long)iVar3;
                                                          lVar33 = (int)gVar2 * lVar36;
                                                          sStack_588 = lVar36 + lVar33;
                                                          if (lVar54 <= (long)sStack_588) {
                                                            sStack_588 = lVar54;
                                                          }
                                                          if ((long)sStack_588 <= lVar33) {
                                                            return;
                                                          }
                                                          lStack_5c0 = lStack_5c0 * lStack_5b8;
                                                          do {
                                                            if (0 < lVar39) {
                                                              lVar36 = (lVar33 / lStack_5c0) *
                                                                       sStack_5a0;
                                                              lVar54 = ((lVar33 % lStack_5c0) /
                                                                       lStack_5b8) * sStack_598;
                                                              lVar32 = ((lVar33 % lStack_5c0) %
                                                                       lStack_5b8) * sStack_590;
                                                              pvVar12 = pgStack_580->data;
                                                              lVar53 = 0;
                                                              do {
                                                                pgStack_5c8 = (ggml_tensor *)
                                                                              0x1302d0;
                                                                auVar66._0_4_ =
                                                                     cosf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar12 +
                                                          lVar53 * 2 + lVar54 + lVar32 + lVar36) * 4
                                                  ));
                                                  auVar66._4_60_ = extraout_var_04;
                                                  auVar73 = vcvtps2ph_f16c(auVar66._0_16_,0);
                                                  vpextrw_avx(auVar73,0);
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_588);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
                                                  goto LAB_00130969;
                                                  }
                                                  }
                                                }
                                              }
                                              else if (gVar2 == GGML_TYPE_BF16) {
                                                gVar5 = pgVar44->type;
                                                in_RCX = (ulong)gVar5;
                                                if (gVar5 == GGML_TYPE_F32) {
                                                  pgStack_5c8 = (ggml_tensor *)0x1307d2;
                                                  cVar30 = ggml_is_contiguous_1(pgVar42);
                                                  if (cVar30 != '\0') {
                                                    pgStack_5c8 = (ggml_tensor *)0x1307e2;
                                                    cVar30 = ggml_is_contiguous_1(pgVar44);
                                                    if (cVar30 != '\0') {
                                                      pgStack_5c8 = (ggml_tensor *)0x1307f5;
                                                      cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                                      if (cVar30 != '\0') {
                                                        if (pgVar44->nb[0] == 4) {
                                                          if (pgVar42->nb[0] == 2) {
                                                            lStack_5b8 = pgVar42->ne[1];
                                                            lStack_5c0 = pgVar42->ne[2];
                                                            sStack_588 = pgVar42->nb[1];
                                                            sStack_590 = pgVar42->nb[2];
                                                            sStack_598 = pgVar42->nb[3];
                                                            lVar39 = pgVar44->ne[0];
                                                            sStack_5a0 = pgVar44->nb[1];
                                                            sStack_5a8 = pgVar44->nb[2];
                                                            sStack_5b0 = pgVar44->nb[3];
                                                            gVar2 = pgVar49->type;
                                                            iVar3 = *(int *)&pgVar49->field_0x4;
                                                            pgStack_5c8 = (ggml_tensor *)0x13086d;
                                                            lVar36 = ggml_nrows(pgVar42);
                                                            lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                     (long)iVar3;
                                                            lVar33 = (int)gVar2 * lVar54;
                                                            lVar54 = lVar54 + lVar33;
                                                            if (lVar36 <= lVar54) {
                                                              lVar54 = lVar36;
                                                            }
                                                            if (lVar54 <= lVar33) {
                                                              return;
                                                            }
                                                            lStack_5c0 = lStack_5c0 * lStack_5b8;
                                                            do {
                                                              lVar36 = (lVar33 % lStack_5c0) /
                                                                       lStack_5b8;
                                                              lVar32 = (lVar33 % lStack_5c0) %
                                                                       lStack_5b8;
                                                              if (0 < lVar39) {
                                                                lVar34 = (lVar33 / lStack_5c0) *
                                                                         sStack_5b0;
                                                                lVar35 = lVar36 * sStack_5a8;
                                                                lVar55 = lVar32 * sStack_5a0;
                                                                lVar53 = (lVar33 / lStack_5c0) *
                                                                         sStack_598;
                                                                lVar36 = lVar36 * sStack_590;
                                                                lVar32 = lVar32 * sStack_588;
                                                                pvVar12 = pgStack_578->data;
                                                                pvVar13 = pgStack_580->data;
                                                                lVar38 = 0;
                                                                do {
                                                                  pgStack_5c8 = (ggml_tensor *)
                                                                                0x130923;
                                                                  fVar70 = cosf((float)((uint)*(
                                                  ushort *)((long)pvVar13 +
                                                           lVar38 * 2 + lVar36 + lVar32 + lVar53) <<
                                                  0x10));
                                                  *(float *)((long)pvVar12 +
                                                            lVar38 * 4 + lVar35 + lVar55 + lVar34) =
                                                       fVar70;
                                                  lVar38 = lVar38 + 1;
                                                  } while (lVar39 != lVar38);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
                                                  goto LAB_00130969;
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  if (gVar5 != GGML_TYPE_BF16) goto LAB_001304be;
                                                  pgStack_5c8 = (ggml_tensor *)0x13031d;
                                                  cVar30 = ggml_is_contiguous_1(pgVar42);
                                                  if (cVar30 != '\0') {
                                                    pgStack_5c8 = (ggml_tensor *)0x13032d;
                                                    cVar30 = ggml_is_contiguous_1(pgVar44);
                                                    if (cVar30 != '\0') {
                                                      pgStack_5c8 = (ggml_tensor *)0x130340;
                                                      cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                                      if (cVar30 != '\0') {
                                                        if (pgVar44->nb[0] == 2) {
                                                          if (pgVar42->nb[0] == 2) {
                                                            lStack_5b8 = pgVar42->ne[1];
                                                            lStack_5c0 = pgVar42->ne[2];
                                                            sStack_588 = pgVar42->nb[1];
                                                            sStack_590 = pgVar42->nb[2];
                                                            sStack_598 = pgVar42->nb[3];
                                                            lVar39 = pgVar44->ne[0];
                                                            sStack_5a0 = pgVar44->nb[1];
                                                            sStack_5a8 = pgVar44->nb[2];
                                                            sStack_5b0 = pgVar44->nb[3];
                                                            gVar2 = pgVar49->type;
                                                            iVar3 = *(int *)&pgVar49->field_0x4;
                                                            pgStack_5c8 = (ggml_tensor *)0x1303b8;
                                                            lVar36 = ggml_nrows(pgVar42);
                                                            lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                     (long)iVar3;
                                                            lVar33 = (int)gVar2 * lVar54;
                                                            lVar54 = lVar54 + lVar33;
                                                            if (lVar36 <= lVar54) {
                                                              lVar54 = lVar36;
                                                            }
                                                            if (lVar54 <= lVar33) {
                                                              return;
                                                            }
                                                            lStack_5c0 = lStack_5c0 * lStack_5b8;
                                                            do {
                                                              lVar36 = (lVar33 % lStack_5c0) /
                                                                       lStack_5b8;
                                                              lVar32 = (lVar33 % lStack_5c0) %
                                                                       lStack_5b8;
                                                              if (0 < lVar39) {
                                                                lVar34 = (lVar33 / lStack_5c0) *
                                                                         sStack_5b0;
                                                                lVar35 = lVar36 * sStack_5a8;
                                                                lVar38 = lVar32 * sStack_5a0;
                                                                lVar53 = (lVar33 / lStack_5c0) *
                                                                         sStack_598;
                                                                lVar36 = lVar36 * sStack_590;
                                                                lVar32 = lVar32 * sStack_588;
                                                                pvVar12 = pgStack_578->data;
                                                                pvVar13 = pgStack_580->data;
                                                                lVar55 = 0;
                                                                do {
                                                                  pgStack_5c8 = (ggml_tensor *)
                                                                                0x130475;
                                                                  fVar70 = cosf((float)((uint)*(
                                                  ushort *)((long)pvVar13 +
                                                           lVar55 * 2 + lVar36 + lVar32 + lVar53) <<
                                                  0x10));
                                                  if ((uint)ABS(fVar70) < 0x7f800001) {
                                                    uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                                      ((uint)fVar70 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar12 +
                                                   lVar55 * 2 + lVar35 + lVar38 + lVar34) = uVar40;
                                                  lVar55 = lVar55 + 1;
                                                  } while (lVar39 != lVar55);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
                                                  goto LAB_00130969;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              else {
LAB_001304be:
                                                if ((gVar2 != GGML_TYPE_F16) ||
                                                   (pgVar44->type != GGML_TYPE_F32)) {
                                                  pgStack_5c8 = (ggml_tensor *)
                                                                ggml_compute_forward_log;
                                                  pgVar46 = pgVar42;
                                                  pgVar50 = pgVar44;
                                                  ggml_compute_forward_cos_cold_1();
                                                  pgVar43 = pgVar46->src[0];
                                                  gVar2 = pgVar43->type;
                                                  pgStack_608 = pgVar43;
                                                  pgStack_600 = pgVar46;
                                                  pgStack_5f0 = pgVar44;
                                                  pgStack_5e8 = pgVar45;
                                                  pgStack_5e0 = pgVar42;
                                                  pgStack_5d8 = pgVar14;
                                                  pgStack_5d0 = pgVar49;
                                                  pgStack_5c8 = pgVar48;
                                                  if ((gVar2 == GGML_TYPE_F32) &&
                                                     (pgVar46->type == GGML_TYPE_F32)) {
                                                    pgStack_650 = (ggml_tensor *)0x130ee9;
                                                    cVar30 = ggml_is_contiguous_1(pgVar43);
                                                    if (cVar30 != '\0') {
                                                      pgStack_650 = (ggml_tensor *)0x130ef9;
                                                      cVar30 = ggml_is_contiguous_1(pgVar46);
                                                      if (cVar30 != '\0') {
                                                        pgStack_650 = (ggml_tensor *)0x130f0c;
                                                        cVar30 = ggml_are_same_shape(pgVar43,pgVar46
                                                                                    );
                                                        if (cVar30 != '\0') {
                                                          if (pgVar46->nb[0] != 4)
                                                          goto LAB_001311f5;
                                                          if (pgVar43->nb[0] == 4) {
                                                            lStack_640 = pgVar43->ne[1];
                                                            lStack_648 = pgVar43->ne[2];
                                                            sStack_610 = pgVar43->nb[1];
                                                            sStack_618 = pgVar43->nb[2];
                                                            sStack_620 = pgVar43->nb[3];
                                                            lVar39 = pgVar46->ne[0];
                                                            sStack_628 = pgVar46->nb[1];
                                                            sStack_630 = pgVar46->nb[2];
                                                            sStack_638 = pgVar46->nb[3];
                                                            gVar2 = pgVar50->type;
                                                            iVar3 = *(int *)&pgVar50->field_0x4;
                                                            pgStack_650 = (ggml_tensor *)0x130f84;
                                                            lVar36 = ggml_nrows(pgVar43);
                                                            lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                     (long)iVar3;
                                                            lVar33 = (int)gVar2 * lVar54;
                                                            lVar54 = lVar54 + lVar33;
                                                            if (lVar36 <= lVar54) {
                                                              lVar54 = lVar36;
                                                            }
                                                            if (lVar54 <= lVar33) {
                                                              return;
                                                            }
                                                            lStack_648 = lStack_648 * lStack_640;
                                                            do {
                                                              lVar36 = (lVar33 % lStack_648) /
                                                                       lStack_640;
                                                              lVar32 = (lVar33 % lStack_648) %
                                                                       lStack_640;
                                                              if (0 < lVar39) {
                                                                lVar34 = (lVar33 / lStack_648) *
                                                                         sStack_638;
                                                                lVar38 = lVar36 * sStack_630;
                                                                lVar35 = lVar32 * sStack_628;
                                                                lVar53 = (lVar33 / lStack_648) *
                                                                         sStack_620;
                                                                lVar36 = lVar36 * sStack_618;
                                                                lVar32 = lVar32 * sStack_610;
                                                                pvVar12 = pgStack_600->data;
                                                                pvVar13 = pgStack_608->data;
                                                                lVar55 = 0;
                                                                do {
                                                                  pgStack_650 = (ggml_tensor *)
                                                                                0x131036;
                                                                  fVar70 = logf(*(float *)((long)
                                                  pvVar13 + lVar55 * 4 + lVar36 + lVar32 + lVar53));
                                                  *(float *)((long)pvVar12 +
                                                            lVar55 * 4 + lVar38 + lVar35 + lVar34) =
                                                       fVar70;
                                                  lVar55 = lVar55 + 1;
                                                  } while (lVar39 != lVar55);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
LAB_00131211:
                                                  pcVar37 = "nb00 == sizeof(src0_t)";
                                                  uVar41 = 0x56;
                                                  goto LAB_0013122b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if ((gVar2 == GGML_TYPE_F16) &&
                                                          (pgVar46->type == GGML_TYPE_F16)) {
                                                    pgStack_650 = (ggml_tensor *)0x130a01;
                                                    cVar30 = ggml_is_contiguous_1(pgVar43);
                                                    if (cVar30 != '\0') {
                                                      pgStack_650 = (ggml_tensor *)0x130a11;
                                                      cVar30 = ggml_is_contiguous_1(pgVar46);
                                                      if (cVar30 != '\0') {
                                                        pgStack_650 = (ggml_tensor *)0x130a24;
                                                        cVar30 = ggml_are_same_shape(pgVar43,pgVar46
                                                                                    );
                                                        if (cVar30 != '\0') {
                                                          if (pgVar46->nb[0] == 2) {
                                                            if (pgVar43->nb[0] == 2) {
                                                              lStack_640 = pgVar43->ne[1];
                                                              lStack_648 = pgVar43->ne[2];
                                                              sStack_618 = pgVar43->nb[1];
                                                              sStack_620 = pgVar43->nb[2];
                                                              sStack_628 = pgVar43->nb[3];
                                                              lVar39 = pgVar46->ne[0];
                                                              sStack_630 = pgVar46->nb[1];
                                                              sStack_638 = pgVar46->nb[2];
                                                              sStack_5f8 = pgVar46->nb[3];
                                                              gVar2 = pgVar50->type;
                                                              iVar3 = *(int *)&pgVar50->field_0x4;
                                                              pgStack_650 = (ggml_tensor *)0x130a9c;
                                                              lVar54 = ggml_nrows(pgVar43);
                                                              lVar36 = ((long)iVar3 + -1 + lVar54) /
                                                                       (long)iVar3;
                                                              lVar33 = (int)gVar2 * lVar36;
                                                              sStack_610 = lVar36 + lVar33;
                                                              if (lVar54 <= (long)sStack_610) {
                                                                sStack_610 = lVar54;
                                                              }
                                                              if ((long)sStack_610 <= lVar33) {
                                                                return;
                                                              }
                                                              lStack_648 = lStack_648 * lStack_640;
                                                              do {
                                                                if (0 < lVar39) {
                                                                  lVar36 = (lVar33 / lStack_648) *
                                                                           sStack_628;
                                                                  lVar54 = ((lVar33 % lStack_648) /
                                                                           lStack_640) * sStack_620;
                                                                  lVar32 = ((lVar33 % lStack_648) %
                                                                           lStack_640) * sStack_618;
                                                                  pvVar12 = pgStack_608->data;
                                                                  lVar53 = 0;
                                                                  do {
                                                                    pgStack_650 = (ggml_tensor *)
                                                                                  0x130b5c;
                                                                    auVar65._0_4_ =
                                                                         logf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar12 +
                                                          lVar53 * 2 + lVar54 + lVar32 + lVar36) * 4
                                                  ));
                                                  auVar65._4_60_ = extraout_var_05;
                                                  auVar73 = vcvtps2ph_f16c(auVar65._0_16_,0);
                                                  vpextrw_avx(auVar73,0);
                                                  lVar53 = lVar53 + 1;
                                                  } while (lVar39 != lVar53);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_610);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else if (gVar2 == GGML_TYPE_BF16) {
                                                    gVar5 = pgVar46->type;
                                                    in_RCX = (ulong)gVar5;
                                                    if (gVar5 == GGML_TYPE_F32) {
                                                      pgStack_650 = (ggml_tensor *)0x13105e;
                                                      cVar30 = ggml_is_contiguous_1(pgVar43);
                                                      if (cVar30 != '\0') {
                                                        pgStack_650 = (ggml_tensor *)0x13106e;
                                                        cVar30 = ggml_is_contiguous_1(pgVar46);
                                                        if (cVar30 != '\0') {
                                                          pgStack_650 = (ggml_tensor *)0x131081;
                                                          cVar30 = ggml_are_same_shape(pgVar43,
                                                  pgVar46);
                                                  if (cVar30 != '\0') {
                                                    if (pgVar46->nb[0] == 4) {
                                                      if (pgVar43->nb[0] == 2) {
                                                        lStack_640 = pgVar43->ne[1];
                                                        lStack_648 = pgVar43->ne[2];
                                                        sStack_610 = pgVar43->nb[1];
                                                        sStack_618 = pgVar43->nb[2];
                                                        sStack_620 = pgVar43->nb[3];
                                                        lVar39 = pgVar46->ne[0];
                                                        sStack_628 = pgVar46->nb[1];
                                                        sStack_630 = pgVar46->nb[2];
                                                        sStack_638 = pgVar46->nb[3];
                                                        gVar2 = pgVar50->type;
                                                        iVar3 = *(int *)&pgVar50->field_0x4;
                                                        pgStack_650 = (ggml_tensor *)0x1310f9;
                                                        lVar36 = ggml_nrows(pgVar43);
                                                        lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                 (long)iVar3;
                                                        lVar33 = (int)gVar2 * lVar54;
                                                        lVar54 = lVar54 + lVar33;
                                                        if (lVar36 <= lVar54) {
                                                          lVar54 = lVar36;
                                                        }
                                                        if (lVar54 <= lVar33) {
                                                          return;
                                                        }
                                                        lStack_648 = lStack_648 * lStack_640;
                                                        do {
                                                          lVar36 = (lVar33 % lStack_648) /
                                                                   lStack_640;
                                                          lVar32 = (lVar33 % lStack_648) %
                                                                   lStack_640;
                                                          if (0 < lVar39) {
                                                            lVar34 = (lVar33 / lStack_648) *
                                                                     sStack_638;
                                                            lVar35 = lVar36 * sStack_630;
                                                            lVar55 = lVar32 * sStack_628;
                                                            lVar53 = (lVar33 / lStack_648) *
                                                                     sStack_620;
                                                            lVar36 = lVar36 * sStack_618;
                                                            lVar32 = lVar32 * sStack_610;
                                                            pvVar12 = pgStack_600->data;
                                                            pvVar13 = pgStack_608->data;
                                                            lVar38 = 0;
                                                            do {
                                                              pgStack_650 = (ggml_tensor *)0x1311af;
                                                              fVar70 = logf((float)((uint)*(ushort *
                                                  )((long)pvVar13 +
                                                   lVar38 * 2 + lVar36 + lVar32 + lVar53) << 0x10));
                                                  *(float *)((long)pvVar12 +
                                                            lVar38 * 4 + lVar35 + lVar55 + lVar34) =
                                                       fVar70;
                                                  lVar38 = lVar38 + 1;
                                                  } while (lVar39 != lVar38);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    if (gVar5 != GGML_TYPE_BF16) goto LAB_00130d4a;
                                                    pgStack_650 = (ggml_tensor *)0x130ba9;
                                                    cVar30 = ggml_is_contiguous_1(pgVar43);
                                                    if (cVar30 != '\0') {
                                                      pgStack_650 = (ggml_tensor *)0x130bb9;
                                                      cVar30 = ggml_is_contiguous_1(pgVar46);
                                                      if (cVar30 != '\0') {
                                                        pgStack_650 = (ggml_tensor *)0x130bcc;
                                                        cVar30 = ggml_are_same_shape(pgVar43,pgVar46
                                                                                    );
                                                        if (cVar30 != '\0') {
                                                          if (pgVar46->nb[0] == 2) {
                                                            if (pgVar43->nb[0] == 2) {
                                                              lStack_640 = pgVar43->ne[1];
                                                              lStack_648 = pgVar43->ne[2];
                                                              sStack_610 = pgVar43->nb[1];
                                                              sStack_618 = pgVar43->nb[2];
                                                              sStack_620 = pgVar43->nb[3];
                                                              lVar39 = pgVar46->ne[0];
                                                              sStack_628 = pgVar46->nb[1];
                                                              sStack_630 = pgVar46->nb[2];
                                                              sStack_638 = pgVar46->nb[3];
                                                              gVar2 = pgVar50->type;
                                                              iVar3 = *(int *)&pgVar50->field_0x4;
                                                              pgStack_650 = (ggml_tensor *)0x130c44;
                                                              lVar36 = ggml_nrows(pgVar43);
                                                              lVar54 = ((long)iVar3 + -1 + lVar36) /
                                                                       (long)iVar3;
                                                              lVar33 = (int)gVar2 * lVar54;
                                                              lVar54 = lVar54 + lVar33;
                                                              if (lVar36 <= lVar54) {
                                                                lVar54 = lVar36;
                                                              }
                                                              if (lVar54 <= lVar33) {
                                                                return;
                                                              }
                                                              lStack_648 = lStack_648 * lStack_640;
                                                              do {
                                                                lVar36 = (lVar33 % lStack_648) /
                                                                         lStack_640;
                                                                lVar32 = (lVar33 % lStack_648) %
                                                                         lStack_640;
                                                                if (0 < lVar39) {
                                                                  lVar34 = (lVar33 / lStack_648) *
                                                                           sStack_638;
                                                                  lVar35 = lVar36 * sStack_630;
                                                                  lVar38 = lVar32 * sStack_628;
                                                                  lVar53 = (lVar33 / lStack_648) *
                                                                           sStack_620;
                                                                  lVar36 = lVar36 * sStack_618;
                                                                  lVar32 = lVar32 * sStack_610;
                                                                  pvVar12 = pgStack_600->data;
                                                                  pvVar13 = pgStack_608->data;
                                                                  lVar55 = 0;
                                                                  do {
                                                                    pgStack_650 = (ggml_tensor *)
                                                                                  0x130d01;
                                                                    fVar70 = logf((float)((uint)*(
                                                  ushort *)((long)pvVar13 +
                                                           lVar55 * 2 + lVar36 + lVar32 + lVar53) <<
                                                  0x10));
                                                  if ((uint)ABS(fVar70) < 0x7f800001) {
                                                    uVar40 = (ushort)((int)fVar70 + 0x7fff +
                                                                      ((uint)fVar70 >> 0x10 & 1) >>
                                                                     0x10);
                                                  }
                                                  else {
                                                    uVar40 = (ushort)((uint)fVar70 >> 0x10) | 0x40;
                                                  }
                                                  *(ushort *)
                                                   ((long)pvVar12 +
                                                   lVar55 * 2 + lVar35 + lVar38 + lVar34) = uVar40;
                                                  lVar55 = lVar55 + 1;
                                                  } while (lVar39 != lVar55);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != lVar54);
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
                                                  goto LAB_001311f5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_00130d4a:
                                                    if ((gVar2 != GGML_TYPE_F16) ||
                                                       (pgVar46->type != GGML_TYPE_F32)) {
                                                      pgStack_650 = (ggml_tensor *)0x13123d;
                                                      pgVar42 = pgVar46;
                                                      ggml_compute_forward_log_cold_1();
                                                      pgStack_650 = pgVar48;
                                                      pgStack_658 = pgVar14;
                                                      pgStack_660 = pgVar46;
                                                      uVar47 = (uint)pgVar42;
                                                      uVar31 = uVar47 & 0xffffffc0;
                                                      uStack_700 = 0;
                                                      uStack_6f8 = 0;
                                                      uStack_6f0 = 0;
                                                      uStack_6e8 = 0;
                                                      uStack_6e0 = 0;
                                                      uStack_6d8 = 0;
                                                      uStack_6d0 = 0;
                                                      uStack_6c8 = 0;
                                                      uStack_740 = 0;
                                                      uStack_738 = 0;
                                                      uStack_730 = 0;
                                                      uStack_728 = 0;
                                                      uStack_720 = 0;
                                                      uStack_718 = 0;
                                                      uStack_710 = 0;
                                                      uStack_708 = 0;
                                                      uStack_780 = 0;
                                                      uStack_778 = 0;
                                                      uStack_770 = 0;
                                                      uStack_768 = 0;
                                                      uStack_760 = 0;
                                                      uStack_758 = 0;
                                                      uStack_750 = 0;
                                                      uStack_748 = 0;
                                                      auStack_7c0 = ZEXT1664(ZEXT816(0));
                                                      if (0 < (int)uVar31) {
                                                        uVar51 = 0;
                                                        lVar39 = in_R9;
                                                        uVar52 = in_RCX;
                                                        do {
                                                          lVar54 = 0;
                                                          do {
                                                            auVar69 = vfmadd213ps_avx512f(*(
                                                  undefined1 (*) [64])(lVar39 + lVar54),
                                                  *(undefined1 (*) [64])(uVar52 + lVar54),
                                                  *(undefined1 (*) [64])(auStack_7c0 + lVar54));
                                                  *(undefined1 (*) [64])(auStack_7c0 + lVar54) =
                                                       auVar69;
                                                  lVar54 = lVar54 + 0x40;
                                                  } while (lVar54 != 0x100);
                                                  uVar51 = uVar51 + 0x40;
                                                  lVar39 = lVar39 + 0x100;
                                                  uVar52 = uVar52 + 0x100;
                                                  } while (uVar51 < uVar31);
                                                  }
                                                  lVar39 = 0;
                                                  do {
                                                    auVar69 = vaddps_avx512f(*(undefined1 (*) [64])
                                                                              (auStack_7c0 + lVar39)
                                                                             ,*(undefined1 (*) [64])
                                                                               ((long)&uStack_740 +
                                                                               lVar39));
                                                    *(undefined1 (*) [64])(auStack_7c0 + lVar39) =
                                                         auVar69;
                                                    lVar39 = lVar39 + 0x40;
                                                  } while (lVar39 == 0x40);
                                                  auVar69._8_8_ = uStack_778;
                                                  auVar69._0_8_ = uStack_780;
                                                  auVar69._16_8_ = uStack_770;
                                                  auVar69._24_8_ = uStack_768;
                                                  auVar69._32_8_ = uStack_760;
                                                  auVar69._40_8_ = uStack_758;
                                                  auVar69._48_8_ = uStack_750;
                                                  auVar69._56_8_ = uStack_748;
                                                  auVar69 = vaddps_avx512f(auStack_7c0,auVar69);
                                                  auVar61 = vextractf64x4_avx512f(auVar69,1);
                                                  auVar69 = vaddps_avx512f(auVar69,ZEXT3264(auVar61)
                                                                          );
                                                  auVar71._0_4_ = auVar69._0_4_ + auVar69._16_4_;
                                                  auVar71._4_4_ = auVar69._4_4_ + auVar69._20_4_;
                                                  auVar71._8_4_ = auVar69._8_4_ + auVar69._24_4_;
                                                  auVar71._12_4_ = auVar69._12_4_ + auVar69._28_4_;
                                                  auVar73 = vshufpd_avx(auVar71,auVar71,1);
                                                  auVar72._0_4_ = auVar71._0_4_ + auVar73._0_4_;
                                                  auVar72._4_4_ = auVar71._4_4_ + auVar73._4_4_;
                                                  auVar72._8_4_ = auVar71._8_4_ + auVar73._8_4_;
                                                  auVar72._12_4_ = auVar71._12_4_ + auVar73._12_4_;
                                                  auVar73 = vhaddps_avx(auVar72,auVar72);
                                                  auVar69 = ZEXT1664(auVar73);
                                                  if (uVar31 != uVar47) {
                                                    lVar39 = (long)(int)uVar31;
                                                    do {
                                                      auVar73 = vfmadd231ss_fma(auVar69._0_16_,
                                                                                ZEXT416(*(uint *)(
                                                  in_RCX + lVar39 * 4)),
                                                  ZEXT416(*(uint *)(in_R9 + lVar39 * 4)));
                                                  auVar69 = ZEXT1664(auVar73);
                                                  lVar39 = lVar39 + 1;
                                                  } while (lVar39 < (int)uVar47);
                                                  }
                                                  pgVar43->type = auVar69._0_4_;
                                                  return;
                                                  }
                                                  pgStack_650 = (ggml_tensor *)0x130d64;
                                                  cVar30 = ggml_is_contiguous_1(pgVar43);
                                                  if (cVar30 != '\0') {
                                                    pgStack_650 = (ggml_tensor *)0x130d74;
                                                    cVar30 = ggml_is_contiguous_1(pgVar46);
                                                    if (cVar30 != '\0') {
                                                      pgStack_650 = (ggml_tensor *)0x130d87;
                                                      cVar30 = ggml_are_same_shape(pgVar43,pgVar46);
                                                      if (cVar30 != '\0') {
                                                        if (pgVar46->nb[0] == 4) {
                                                          if (pgVar43->nb[0] == 2) {
                                                            lStack_640 = pgVar43->ne[1];
                                                            lStack_648 = pgVar43->ne[2];
                                                            sStack_618 = pgVar43->nb[1];
                                                            sStack_620 = pgVar43->nb[2];
                                                            sStack_628 = pgVar43->nb[3];
                                                            lVar39 = pgVar46->ne[0];
                                                            sStack_630 = pgVar46->nb[1];
                                                            sStack_638 = pgVar46->nb[2];
                                                            sStack_5f8 = pgVar46->nb[3];
                                                            gVar2 = pgVar50->type;
                                                            iVar3 = *(int *)&pgVar50->field_0x4;
                                                            pgStack_650 = (ggml_tensor *)0x130dff;
                                                            lVar54 = ggml_nrows(pgVar43);
                                                            lVar36 = ((long)iVar3 + -1 + lVar54) /
                                                                     (long)iVar3;
                                                            lVar33 = (int)gVar2 * lVar36;
                                                            sStack_610 = lVar36 + lVar33;
                                                            if (lVar54 <= (long)sStack_610) {
                                                              sStack_610 = lVar54;
                                                            }
                                                            if (lVar33 < (long)sStack_610) {
                                                              lStack_648 = lStack_648 * lStack_640;
                                                              do {
                                                                lVar54 = (lVar33 % lStack_648) /
                                                                         lStack_640;
                                                                lVar36 = (lVar33 % lStack_648) %
                                                                         lStack_640;
                                                                if (0 < lVar39) {
                                                                  lVar53 = (lVar33 / lStack_648) *
                                                                           sStack_5f8;
                                                                  lVar34 = lVar54 * sStack_638;
                                                                  lVar38 = lVar36 * sStack_630;
                                                                  lVar32 = (lVar33 / lStack_648) *
                                                                           sStack_628;
                                                                  lVar54 = lVar54 * sStack_620;
                                                                  lVar36 = lVar36 * sStack_618;
                                                                  pvVar12 = pgStack_600->data;
                                                                  pvVar13 = pgStack_608->data;
                                                                  lVar35 = 0;
                                                                  do {
                                                                    pgStack_650 = (ggml_tensor *)
                                                                                  0x130ebf;
                                                                    fVar70 = logf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar35 * 2 + lVar54 + lVar36 + lVar32) * 4
                                                  ));
                                                  *(float *)((long)pvVar12 +
                                                            lVar35 * 4 + lVar34 + lVar38 + lVar53) =
                                                       fVar70;
                                                  lVar35 = lVar35 + 1;
                                                  } while (lVar39 != lVar35);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_610);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_00131211;
                                                  }
LAB_001311f5:
                                                  pcVar37 = "nb0 == sizeof(dst_t)";
                                                  uVar41 = 0x55;
                                                  goto LAB_0013122b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  pcVar37 = 
                                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                                  ;
                                                  uVar41 = 0x51;
LAB_0013122b:
                                                  pgStack_650 = (ggml_tensor *)0x131232;
                                                  ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                                                }
                                                pgStack_5c8 = (ggml_tensor *)0x1304d8;
                                                cVar30 = ggml_is_contiguous_1(pgVar42);
                                                if (cVar30 != '\0') {
                                                  pgStack_5c8 = (ggml_tensor *)0x1304e8;
                                                  cVar30 = ggml_is_contiguous_1(pgVar44);
                                                  if (cVar30 != '\0') {
                                                    pgStack_5c8 = (ggml_tensor *)0x1304fb;
                                                    cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                                    if (cVar30 != '\0') {
                                                      if (pgVar44->nb[0] == 4) {
                                                        if (pgVar42->nb[0] == 2) {
                                                          lStack_5b8 = pgVar42->ne[1];
                                                          lStack_5c0 = pgVar42->ne[2];
                                                          sStack_590 = pgVar42->nb[1];
                                                          sStack_598 = pgVar42->nb[2];
                                                          sStack_5a0 = pgVar42->nb[3];
                                                          lVar39 = pgVar44->ne[0];
                                                          sStack_5a8 = pgVar44->nb[1];
                                                          sStack_5b0 = pgVar44->nb[2];
                                                          sStack_570 = pgVar44->nb[3];
                                                          gVar2 = pgVar49->type;
                                                          iVar3 = *(int *)&pgVar49->field_0x4;
                                                          pgStack_5c8 = (ggml_tensor *)0x130573;
                                                          lVar54 = ggml_nrows(pgVar42);
                                                          lVar36 = ((long)iVar3 + -1 + lVar54) /
                                                                   (long)iVar3;
                                                          lVar33 = (int)gVar2 * lVar36;
                                                          sStack_588 = lVar36 + lVar33;
                                                          if (lVar54 <= (long)sStack_588) {
                                                            sStack_588 = lVar54;
                                                          }
                                                          if (lVar33 < (long)sStack_588) {
                                                            lStack_5c0 = lStack_5c0 * lStack_5b8;
                                                            do {
                                                              lVar54 = (lVar33 % lStack_5c0) /
                                                                       lStack_5b8;
                                                              lVar36 = (lVar33 % lStack_5c0) %
                                                                       lStack_5b8;
                                                              if (0 < lVar39) {
                                                                lVar53 = (lVar33 / lStack_5c0) *
                                                                         sStack_570;
                                                                lVar34 = lVar54 * sStack_5b0;
                                                                lVar38 = lVar36 * sStack_5a8;
                                                                lVar32 = (lVar33 / lStack_5c0) *
                                                                         sStack_5a0;
                                                                lVar54 = lVar54 * sStack_598;
                                                                lVar36 = lVar36 * sStack_590;
                                                                pvVar12 = pgStack_578->data;
                                                                pvVar13 = pgStack_580->data;
                                                                lVar35 = 0;
                                                                do {
                                                                  pgStack_5c8 = (ggml_tensor *)
                                                                                0x130633;
                                                                  fVar70 = cosf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar35 * 2 + lVar54 + lVar36 + lVar32) * 4
                                                  ));
                                                  *(float *)((long)pvVar12 +
                                                            lVar35 * 4 + lVar34 + lVar38 + lVar53) =
                                                       fVar70;
                                                  lVar35 = lVar35 + 1;
                                                  } while (lVar39 != lVar35);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_588);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_00130985;
                                                  }
LAB_00130969:
                                                  pcVar37 = "nb0 == sizeof(dst_t)";
                                                  uVar41 = 0x55;
                                                  goto LAB_0013099f;
                                                  }
                                                  }
                                                }
                                              }
                                              pcVar37 = 
                                              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                              ;
                                              uVar41 = 0x51;
LAB_0013099f:
                                              pgStack_5c8 = (ggml_tensor *)0x1309a6;
                                              ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                                            }
                                            pgStack_540 = (ggml_tensor *)0x12fc4c;
                                            cVar30 = ggml_is_contiguous_1(pgVar43);
                                            if (cVar30 != '\0') {
                                              pgStack_540 = (ggml_tensor *)0x12fc5c;
                                              cVar30 = ggml_is_contiguous_1(pgVar46);
                                              if (cVar30 != '\0') {
                                                pgStack_540 = (ggml_tensor *)0x12fc6f;
                                                cVar30 = ggml_are_same_shape(pgVar43,pgVar46);
                                                if (cVar30 != '\0') {
                                                  if (pgVar46->nb[0] == 4) {
                                                    if (pgVar43->nb[0] == 2) {
                                                      lStack_530 = pgVar43->ne[1];
                                                      lStack_538 = pgVar43->ne[2];
                                                      sStack_508 = pgVar43->nb[1];
                                                      sStack_510 = pgVar43->nb[2];
                                                      sStack_518 = pgVar43->nb[3];
                                                      lVar39 = pgVar46->ne[0];
                                                      sStack_520 = pgVar46->nb[1];
                                                      sStack_528 = pgVar46->nb[2];
                                                      sStack_4e8 = pgVar46->nb[3];
                                                      gVar2 = pgVar50->type;
                                                      iVar3 = *(int *)&pgVar50->field_0x4;
                                                      pgStack_540 = (ggml_tensor *)0x12fce7;
                                                      lVar54 = ggml_nrows(pgVar43);
                                                      lVar36 = ((long)iVar3 + -1 + lVar54) /
                                                               (long)iVar3;
                                                      lVar33 = (int)gVar2 * lVar36;
                                                      sStack_500 = lVar36 + lVar33;
                                                      if (lVar54 <= (long)sStack_500) {
                                                        sStack_500 = lVar54;
                                                      }
                                                      if (lVar33 < (long)sStack_500) {
                                                        lStack_538 = lStack_538 * lStack_530;
                                                        do {
                                                          lVar54 = (lVar33 % lStack_538) /
                                                                   lStack_530;
                                                          lVar36 = (lVar33 % lStack_538) %
                                                                   lStack_530;
                                                          if (0 < lVar39) {
                                                            lVar53 = (lVar33 / lStack_538) *
                                                                     sStack_4e8;
                                                            lVar34 = lVar54 * sStack_528;
                                                            lVar38 = lVar36 * sStack_520;
                                                            lVar32 = (lVar33 / lStack_538) *
                                                                     sStack_518;
                                                            lVar54 = lVar54 * sStack_510;
                                                            lVar36 = lVar36 * sStack_508;
                                                            pvVar12 = pgStack_4f0->data;
                                                            pvVar13 = pgStack_4f8->data;
                                                            lVar35 = 0;
                                                            do {
                                                              pgStack_540 = (ggml_tensor *)0x12fda7;
                                                              fVar70 = sinf(*(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar35 * 2 + lVar54 + lVar36 + lVar32) * 4
                                                  ));
                                                  *(float *)((long)pvVar12 +
                                                            lVar35 * 4 + lVar34 + lVar38 + lVar53) =
                                                       fVar70;
                                                  lVar35 = lVar35 + 1;
                                                  } while (lVar39 != lVar35);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_500);
                                                  }
                                                  return;
                                                  }
                                                  goto LAB_001300f9;
                                                  }
LAB_001300dd:
                                                  pcVar37 = "nb0 == sizeof(dst_t)";
                                                  uVar41 = 0x55;
                                                  goto LAB_00130113;
                                                }
                                              }
                                            }
                                          }
                                          pcVar37 = 
                                          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                          ;
                                          uVar41 = 0x51;
LAB_00130113:
                                          pgStack_540 = (ggml_tensor *)0x13011a;
                                          ggml_abort(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                                  ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                                        }
                                        pgStack_4b8 = (ggml_tensor *)0x12f378;
                                        cVar30 = ggml_is_contiguous_1(pgVar42);
                                        if (cVar30 != '\0') {
                                          pgStack_4b8 = (ggml_tensor *)0x12f388;
                                          cVar30 = ggml_is_contiguous_1(pgVar44);
                                          if (cVar30 != '\0') {
                                            pgStack_4b8 = (ggml_tensor *)0x12f39b;
                                            cVar30 = ggml_are_same_shape(pgVar42,pgVar44);
                                            if (cVar30 != '\0') {
                                              if (pgVar44->nb[0] == 4) {
                                                if (pgVar42->nb[0] == 2) {
                                                  lStack_4a8 = pgVar42->ne[1];
                                                  lStack_4b0 = pgVar42->ne[2];
                                                  sStack_480 = pgVar42->nb[1];
                                                  sStack_488 = pgVar42->nb[2];
                                                  sStack_490 = pgVar42->nb[3];
                                                  lVar39 = pgVar44->ne[0];
                                                  sStack_498 = pgVar44->nb[1];
                                                  sStack_4a0 = pgVar44->nb[2];
                                                  sStack_460 = pgVar44->nb[3];
                                                  gVar2 = pgVar49->type;
                                                  iVar3 = *(int *)&pgVar49->field_0x4;
                                                  pgStack_4b8 = (ggml_tensor *)0x12f413;
                                                  lVar54 = ggml_nrows(pgVar42);
                                                  lVar36 = ((long)iVar3 + -1 + lVar54) / (long)iVar3
                                                  ;
                                                  lVar33 = (int)gVar2 * lVar36;
                                                  sStack_478 = lVar36 + lVar33;
                                                  if (lVar54 <= (long)sStack_478) {
                                                    sStack_478 = lVar54;
                                                  }
                                                  if (lVar33 < (long)sStack_478) {
                                                    lStack_4b0 = lStack_4b0 * lStack_4a8;
                                                    do {
                                                      lVar54 = (lVar33 % lStack_4b0) / lStack_4a8;
                                                      lVar36 = (lVar33 % lStack_4b0) % lStack_4a8;
                                                      if (0 < lVar39) {
                                                        lVar53 = (lVar33 / lStack_4b0) * sStack_460;
                                                        lVar34 = lVar54 * sStack_4a0;
                                                        lVar38 = lVar36 * sStack_498;
                                                        lVar32 = (lVar33 / lStack_4b0) * sStack_490;
                                                        lVar54 = lVar54 * sStack_488;
                                                        lVar36 = lVar36 * sStack_480;
                                                        pvVar12 = pgStack_468->data;
                                                        pvVar13 = pgStack_470->data;
                                                        lVar35 = 0;
                                                        do {
                                                          fVar70 = *(float *)(&ggml_table_f32_f16 +
                                                                             (ulong)*(ushort *)
                                                                                     ((long)pvVar13
                                                                                     + lVar35 * 2 +
                                                                                       lVar54 + 
                                                  lVar36 + lVar32) * 4);
                                                  if (fVar70 < 0.0) {
                                                    pgStack_4b8 = (ggml_tensor *)0x12f4e7;
                                                    fVar70 = sqrtf(fVar70);
                                                  }
                                                  else {
                                                    auVar73 = vsqrtss_avx(ZEXT416((uint)fVar70),
                                                                          ZEXT416((uint)fVar70));
                                                    fVar70 = auVar73._0_4_;
                                                  }
                                                  *(float *)((long)pvVar12 +
                                                            lVar35 * 4 + lVar34 + lVar38 + lVar53) =
                                                       fVar70;
                                                  lVar35 = lVar35 + 1;
                                                  } while (lVar39 != lVar35);
                                                  }
                                                  lVar33 = lVar33 + 1;
                                                  } while (lVar33 != sStack_478);
                                                  }
                                                  return;
                                                }
                                                goto LAB_0012f86d;
                                              }
LAB_0012f851:
                                              pcVar37 = "nb0 == sizeof(dst_t)";
                                              uVar41 = 0x55;
                                              goto LAB_0012f887;
                                            }
                                          }
                                        }
                                      }
                                      pcVar37 = 
                                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                      ;
                                      uVar41 = 0x51;
LAB_0012f887:
                                      pgStack_4b8 = (ggml_tensor *)0x12f88e;
                                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                                 ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                                    }
                                    pgStack_430 = (ggml_tensor *)0x12eaa2;
                                    cVar30 = ggml_is_contiguous_1(pgVar50);
                                    if (cVar30 != '\0') {
                                      pgStack_430 = (ggml_tensor *)0x12eab2;
                                      cVar30 = ggml_is_contiguous_1(pgVar45);
                                      if (cVar30 != '\0') {
                                        pgStack_430 = (ggml_tensor *)0x12eac5;
                                        cVar30 = ggml_are_same_shape(pgVar50,pgVar45);
                                        if (cVar30 != '\0') {
                                          if (pgVar45->nb[0] == 4) {
                                            if (pgVar50->nb[0] == 2) {
                                              lVar39 = pgVar50->ne[1];
                                              lVar54 = pgVar50->ne[2];
                                              sStack_400 = pgVar50->nb[1];
                                              sStack_408 = pgVar50->nb[2];
                                              sStack_410 = pgVar50->nb[3];
                                              lVar36 = pgVar45->ne[0];
                                              sStack_418 = pgVar45->nb[1];
                                              sStack_420 = pgVar45->nb[2];
                                              sVar6 = pgVar45->nb[3];
                                              gVar2 = pgVar48->type;
                                              pgStack_428 = (ggml_tensor *)
                                                            (long)*(int *)&pgVar48->field_0x4;
                                              pgStack_430 = (ggml_tensor *)0x12eb3b;
                                              lVar32 = ggml_nrows(pgVar50);
                                              lVar33 = ((long)pgStack_428 + -1 + lVar32) /
                                                       (long)pgStack_428;
                                              lVar53 = (int)gVar2 * lVar33;
                                              lVar33 = lVar33 + lVar53;
                                              if (lVar32 <= lVar33) {
                                                lVar33 = lVar32;
                                              }
                                              if (lVar53 < lVar33) {
                                                lVar54 = lVar54 * lVar39;
                                                pvVar12 = pgStack_3f8->data;
                                                pvVar13 = pgVar50->data;
                                                do {
                                                  lVar32 = lVar53 / lVar54;
                                                  lVar38 = lVar53 % lVar54;
                                                  lVar34 = lVar38 / lVar39;
                                                  lVar38 = lVar38 % lVar39;
                                                  if (0 < lVar36) {
                                                    lVar35 = 0;
                                                    do {
                                                      *(float *)((long)pvVar12 +
                                                                lVar35 * 4 +
                                                                lVar34 * sStack_420 +
                                                                lVar38 * sStack_418 + lVar32 * sVar6
                                                                ) = *(float *)(&ggml_table_f32_f16 +
                                                                              (ulong)*(ushort *)
                                                                                      ((long)pvVar13
                                                                                      + lVar35 * 2 +
                                                                                        lVar34 * 
                                                  sStack_408 +
                                                  lVar38 * sStack_400 + lVar32 * sStack_410) * 4) *
                                                  *(float *)(&ggml_table_f32_f16 +
                                                            (ulong)*(ushort *)
                                                                    ((long)pvVar13 +
                                                                    lVar35 * 2 +
                                                                    lVar34 * sStack_408 +
                                                                    lVar38 * sStack_400 +
                                                                    lVar32 * sStack_410) * 4);
                                                  lVar35 = lVar35 + 1;
                                                  } while (lVar36 != lVar35);
                                                  }
                                                  lVar53 = lVar53 + 1;
                                                } while (lVar53 != lVar33);
                                              }
                                              return;
                                            }
                                            goto LAB_0012ef6d;
                                          }
LAB_0012ef51:
                                          pcVar37 = "nb0 == sizeof(dst_t)";
                                          uVar41 = 0x55;
                                          goto LAB_0012ef87;
                                        }
                                      }
                                    }
                                  }
                                  pcVar37 = 
                                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                                  ;
                                  uVar41 = 0x51;
LAB_0012ef87:
                                  pgStack_430 = (ggml_tensor *)0x12ef8e;
                                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                             ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                                }
                                cVar30 = ggml_is_contiguous_1(pgVar14);
                                if (((cVar30 != '\0') &&
                                    (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                                   (cVar30 = ggml_are_same_shape(pgVar14,pgVar42), cVar30 != '\0'))
                                {
                                  if (pgVar42->nb[0] == 4) {
                                    if (pgVar14->nb[0] == 2) {
                                      lVar39 = pgVar14->ne[1];
                                      lVar54 = pgVar14->ne[2];
                                      sVar6 = pgVar14->nb[1];
                                      sVar7 = pgVar14->nb[2];
                                      sVar8 = pgVar14->nb[3];
                                      lVar36 = pgVar42->ne[0];
                                      sVar9 = pgVar42->nb[1];
                                      sVar10 = pgVar42->nb[2];
                                      sVar11 = pgVar42->nb[3];
                                      gVar2 = pgVar44->type;
                                      iVar3 = *(int *)&pgVar44->field_0x4;
                                      lVar32 = ggml_nrows();
                                      lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                      lVar53 = (int)gVar2 * lVar33;
                                      lVar33 = lVar33 + lVar53;
                                      if (lVar32 <= lVar33) {
                                        lVar33 = lVar32;
                                      }
                                      if (lVar53 < lVar33) {
                                        lVar54 = lVar54 * lVar39;
                                        pvVar12 = pgVar42->data;
                                        pvVar13 = pgVar14->data;
                                        do {
                                          lVar32 = lVar53 / lVar54;
                                          lVar38 = lVar53 % lVar54;
                                          lVar34 = lVar38 / lVar39;
                                          lVar38 = lVar38 % lVar39;
                                          if (0 < lVar36) {
                                            lVar35 = 0;
                                            do {
                                              auVar73._0_4_ =
                                                   (*(float *)(&ggml_table_f32_f16 +
                                                              (ulong)*(ushort *)
                                                                      ((long)pvVar13 +
                                                                      lVar35 * 2 +
                                                                      lVar34 * sVar7 +
                                                                      lVar38 * sVar6 +
                                                                      lVar32 * sVar8) * 4) + 3.0) /
                                                   6.0;
                                              auVar73._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                              auVar73 = vmaxss_avx(auVar73,ZEXT816(0) << 0x40);
                                              auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(
                                                  0x3f800000),0));
                                              *(float *)((long)pvVar12 +
                                                        lVar35 * 4 +
                                                        lVar34 * sVar10 +
                                                        lVar38 * sVar9 + lVar32 * sVar11) =
                                                   *(float *)(&ggml_table_f32_f16 +
                                                             (ulong)*(ushort *)
                                                                     ((long)pvVar13 +
                                                                     lVar35 * 2 +
                                                                     lVar34 * sVar7 +
                                                                     lVar38 * sVar6 + lVar32 * sVar8
                                                                     ) * 4) * auVar73._0_4_;
                                              lVar35 = lVar35 + 1;
                                            } while (lVar36 != lVar35);
                                          }
                                          lVar53 = lVar53 + 1;
                                        } while (lVar53 != lVar33);
                                      }
                                      return;
                                    }
                                    goto LAB_0012e6e5;
                                  }
LAB_0012e6c9:
                                  pcVar37 = "nb0 == sizeof(dst_t)";
                                  uVar41 = 0x55;
                                  goto LAB_0012e6ff;
                                }
                              }
                              pcVar37 = 
                              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                              ;
                              uVar41 = 0x51;
LAB_0012e6ff:
                              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                         ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                            }
                            cVar30 = ggml_is_contiguous_1(pgVar42);
                            if (((cVar30 != '\0') &&
                                (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0')) &&
                               (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                              if (pgVar44->nb[0] == 4) {
                                if (pgVar42->nb[0] == 2) {
                                  lVar39 = pgVar42->ne[1];
                                  lVar54 = pgVar42->ne[2];
                                  sVar6 = pgVar42->nb[1];
                                  sVar7 = pgVar42->nb[2];
                                  sVar8 = pgVar42->nb[3];
                                  lVar36 = pgVar44->ne[0];
                                  sVar9 = pgVar44->nb[1];
                                  sVar10 = pgVar44->nb[2];
                                  sVar11 = pgVar44->nb[3];
                                  gVar2 = pgVar43->type;
                                  iVar3 = *(int *)&pgVar43->field_0x4;
                                  lVar32 = ggml_nrows(pgVar42);
                                  lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                                  lVar53 = (int)gVar2 * lVar33;
                                  lVar33 = lVar33 + lVar53;
                                  if (lVar32 <= lVar33) {
                                    lVar33 = lVar32;
                                  }
                                  if (lVar53 < lVar33) {
                                    lVar54 = lVar54 * lVar39;
                                    pvVar12 = pgVar44->data;
                                    pvVar13 = pgVar42->data;
                                    do {
                                      lVar32 = lVar53 / lVar54;
                                      lVar38 = lVar53 % lVar54;
                                      lVar34 = lVar38 / lVar39;
                                      lVar38 = lVar38 % lVar39;
                                      if (0 < lVar36) {
                                        lVar35 = 0;
                                        do {
                                          fVar70 = expf(*(float *)(&ggml_table_f32_f16 +
                                                                  (ulong)*(ushort *)
                                                                          ((long)pvVar13 +
                                                                          lVar35 * 2 +
                                                                          lVar34 * sVar7 +
                                                                          lVar38 * sVar6 +
                                                                          lVar32 * sVar8) * 4));
                                          *(float *)((long)pvVar12 +
                                                    lVar35 * 4 +
                                                    lVar34 * sVar10 +
                                                    lVar38 * sVar9 + lVar32 * sVar11) = fVar70;
                                          lVar35 = lVar35 + 1;
                                        } while (lVar36 != lVar35);
                                      }
                                      lVar53 = lVar53 + 1;
                                    } while (lVar53 != lVar33);
                                  }
                                  return;
                                }
                                goto LAB_0012dd7a;
                              }
LAB_0012dd5e:
                              pcVar37 = "nb0 == sizeof(dst_t)";
                              uVar41 = 0x55;
                              goto LAB_0012dd94;
                            }
                          }
                          pcVar37 = 
                          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                          ;
                          uVar41 = 0x51;
LAB_0012dd94:
                          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                     ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                        }
                        cVar30 = ggml_is_contiguous_1(pgVar44);
                        if (((cVar30 != '\0') &&
                            (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
                           (cVar30 = ggml_are_same_shape(pgVar44,pgVar43), cVar30 != '\0')) {
                          if (pgVar43->nb[0] == 4) {
                            if (pgVar44->nb[0] == 2) {
                              lVar39 = pgVar44->ne[1];
                              lVar54 = pgVar44->ne[2];
                              sVar6 = pgVar44->nb[1];
                              sVar7 = pgVar44->nb[2];
                              sVar8 = pgVar44->nb[3];
                              lVar36 = pgVar43->ne[0];
                              sVar9 = pgVar43->nb[1];
                              sVar10 = pgVar43->nb[2];
                              sVar11 = pgVar43->nb[3];
                              gVar2 = pgVar42->type;
                              iVar3 = *(int *)&pgVar42->field_0x4;
                              lVar32 = ggml_nrows();
                              lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                              lVar53 = (int)gVar2 * lVar33;
                              lVar33 = lVar33 + lVar53;
                              if (lVar32 <= lVar33) {
                                lVar33 = lVar32;
                              }
                              if (lVar53 < lVar33) {
                                lVar54 = lVar54 * lVar39;
                                pvVar12 = pgVar43->data;
                                pvVar13 = pgVar44->data;
                                do {
                                  lVar32 = lVar53 / lVar54;
                                  lVar38 = lVar53 % lVar54;
                                  lVar34 = lVar38 / lVar39;
                                  lVar38 = lVar38 % lVar39;
                                  if (0 < lVar36) {
                                    lVar35 = 0;
                                    do {
                                      auVar76._0_4_ =
                                           (*(float *)(&ggml_table_f32_f16 +
                                                      (ulong)*(ushort *)
                                                              ((long)pvVar13 +
                                                              lVar35 * 2 +
                                                              lVar34 * sVar7 +
                                                              lVar38 * sVar6 + lVar32 * sVar8) * 4)
                                           + 3.0) / 6.0;
                                      auVar76._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                      auVar73 = vmaxss_avx(auVar76,ZEXT816(0) << 0x40);
                                      auVar73 = vminss_avx(auVar73,SUB6416(ZEXT464(0x3f800000),0));
                                      *(int *)((long)pvVar12 +
                                              lVar35 * 4 +
                                              lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                           auVar73._0_4_;
                                      lVar35 = lVar35 + 1;
                                    } while (lVar36 != lVar35);
                                  }
                                  lVar53 = lVar53 + 1;
                                } while (lVar53 != lVar33);
                              }
                              return;
                            }
                            goto LAB_0012d49a;
                          }
LAB_0012d47e:
                          pcVar37 = "nb0 == sizeof(dst_t)";
                          uVar41 = 0x55;
                          goto LAB_0012d4b4;
                        }
                      }
                      pcVar37 = 
                      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                      ;
                      uVar41 = 0x51;
LAB_0012d4b4:
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                                 ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                    }
                    cVar30 = ggml_is_contiguous_1(pgVar43);
                    if (((cVar30 != '\0') &&
                        (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
                       (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
                      if (pgVar42->nb[0] == 4) {
                        if (pgVar43->nb[0] == 2) {
                          lVar39 = pgVar43->ne[1];
                          lVar54 = pgVar43->ne[2];
                          sVar6 = pgVar43->nb[1];
                          sVar7 = pgVar43->nb[2];
                          sVar8 = pgVar43->nb[3];
                          lVar36 = pgVar42->ne[0];
                          sVar9 = pgVar42->nb[1];
                          sVar10 = pgVar42->nb[2];
                          sVar11 = pgVar42->nb[3];
                          gVar2 = pgVar44->type;
                          iVar3 = *(int *)&pgVar44->field_0x4;
                          lVar32 = ggml_nrows(pgVar43);
                          lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                          lVar53 = (int)gVar2 * lVar33;
                          lVar33 = lVar33 + lVar53;
                          if (lVar32 <= lVar33) {
                            lVar33 = lVar32;
                          }
                          if (lVar53 < lVar33) {
                            lVar54 = lVar54 * lVar39;
                            pvVar12 = pgVar42->data;
                            pvVar13 = pgVar43->data;
                            do {
                              lVar32 = lVar53 / lVar54;
                              lVar38 = lVar53 % lVar54;
                              lVar34 = lVar38 / lVar39;
                              lVar38 = lVar38 % lVar39;
                              if (0 < lVar36) {
                                lVar35 = 0;
                                do {
                                  fVar70 = expf(-*(float *)(&ggml_table_f32_f16 +
                                                           (ulong)*(ushort *)
                                                                   ((long)pvVar13 +
                                                                   lVar35 * 2 +
                                                                   lVar34 * sVar7 +
                                                                   lVar38 * sVar6 + lVar32 * sVar8)
                                                           * 4));
                                  *(float *)((long)pvVar12 +
                                            lVar35 * 4 +
                                            lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                       1.0 / (fVar70 + 1.0);
                                  lVar35 = lVar35 + 1;
                                } while (lVar36 != lVar35);
                              }
                              lVar53 = lVar53 + 1;
                            } while (lVar53 != lVar33);
                          }
                          return;
                        }
                        goto LAB_0012cb55;
                      }
LAB_0012cb39:
                      pcVar37 = "nb0 == sizeof(dst_t)";
                      uVar41 = 0x55;
                      goto LAB_0012cb6f;
                    }
                  }
                  pcVar37 = 
                  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
                  ;
                  uVar41 = 0x51;
LAB_0012cb6f:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                             ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
                }
                cVar30 = ggml_is_contiguous_1(pgVar42);
                if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar44), cVar30 != '\0'))
                   && (cVar30 = ggml_are_same_shape(pgVar42,pgVar44), cVar30 != '\0')) {
                  if (pgVar44->nb[0] == 4) {
                    if (pgVar42->nb[0] == 2) {
                      lVar39 = pgVar42->ne[1];
                      lVar54 = pgVar42->ne[2];
                      sVar6 = pgVar42->nb[1];
                      sVar7 = pgVar42->nb[2];
                      sVar8 = pgVar42->nb[3];
                      lVar36 = pgVar44->ne[0];
                      sVar9 = pgVar44->nb[1];
                      sVar10 = pgVar44->nb[2];
                      sVar11 = pgVar44->nb[3];
                      gVar2 = pgVar43->type;
                      iVar3 = *(int *)&pgVar43->field_0x4;
                      lVar32 = ggml_nrows();
                      lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                      lVar53 = (int)gVar2 * lVar33;
                      lVar33 = lVar33 + lVar53;
                      if (lVar32 <= lVar33) {
                        lVar33 = lVar32;
                      }
                      if (lVar53 < lVar33) {
                        lVar54 = lVar54 * lVar39;
                        pvVar12 = pgVar44->data;
                        pvVar13 = pgVar42->data;
                        do {
                          lVar32 = lVar53 / lVar54;
                          lVar38 = lVar53 % lVar54;
                          lVar34 = lVar38 / lVar39;
                          lVar38 = lVar38 % lVar39;
                          if (0 < lVar36) {
                            lVar35 = 0;
                            do {
                              auVar73 = vmaxss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                    (ulong)*(ushort *)
                                                                            ((long)pvVar13 +
                                                                            lVar35 * 2 +
                                                                            lVar34 * sVar7 +
                                                                            lVar38 * sVar6 +
                                                                            lVar32 * sVar8) * 4)),
                                                   ZEXT816(0) << 0x40);
                              *(int *)((long)pvVar12 +
                                      lVar35 * 4 +
                                      lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                                   auVar73._0_4_;
                              lVar35 = lVar35 + 1;
                            } while (lVar36 != lVar35);
                          }
                          lVar53 = lVar53 + 1;
                        } while (lVar53 != lVar33);
                      }
                      return;
                    }
                    goto LAB_0012c1d1;
                  }
LAB_0012c1b5:
                  pcVar37 = "nb0 == sizeof(dst_t)";
                  uVar41 = 0x55;
                  goto LAB_0012c1eb;
                }
              }
              pcVar37 = 
              "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
              ;
              uVar41 = 0x51;
LAB_0012c1eb:
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                         ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
            }
            cVar30 = ggml_is_contiguous_1(pgVar46);
            if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar43), cVar30 != '\0')) &&
               (cVar30 = ggml_are_same_shape(pgVar46,pgVar43), cVar30 != '\0')) {
              if (pgVar43->nb[0] == 4) {
                if (pgVar46->nb[0] == 2) {
                  lVar39 = pgVar46->ne[1];
                  lVar54 = pgVar46->ne[2];
                  sVar6 = pgVar46->nb[1];
                  sVar7 = pgVar46->nb[2];
                  sVar8 = pgVar46->nb[3];
                  lVar36 = pgVar43->ne[0];
                  sVar9 = pgVar43->nb[1];
                  sVar10 = pgVar43->nb[2];
                  sVar11 = pgVar43->nb[3];
                  gVar2 = pgVar42->type;
                  iVar3 = *(int *)&pgVar42->field_0x4;
                  lVar32 = ggml_nrows(pgVar46);
                  lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
                  lVar53 = (int)gVar2 * lVar33;
                  lVar33 = lVar33 + lVar53;
                  if (lVar32 <= lVar33) {
                    lVar33 = lVar32;
                  }
                  if (lVar53 < lVar33) {
                    lVar54 = lVar54 * lVar39;
                    do {
                      lVar32 = lVar53 / lVar54;
                      lVar38 = lVar53 % lVar54;
                      lVar34 = lVar38 / lVar39;
                      lVar38 = lVar38 % lVar39;
                      if (0 < lVar36) {
                        pvVar12 = pgVar43->data;
                        pvVar13 = pgVar46->data;
                        lVar35 = 0;
                        do {
                          fVar70 = *(float *)(&ggml_table_f32_f16 +
                                             (ulong)*(ushort *)
                                                     ((long)pvVar13 +
                                                     lVar35 * 2 +
                                                     lVar34 * sVar7 +
                                                     lVar38 * sVar6 + lVar32 * sVar8) * 4);
                          if (fVar70 <= 0.0) {
                            fVar70 = expm1f(fVar70);
                          }
                          *(float *)((long)pvVar12 +
                                    lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11)
                               = fVar70;
                          lVar35 = lVar35 + 1;
                        } while (lVar36 != lVar35);
                      }
                      lVar53 = lVar53 + 1;
                    } while (lVar53 != lVar33);
                  }
                  return;
                }
                goto LAB_0012b94b;
              }
LAB_0012b92f:
              pcVar37 = "nb0 == sizeof(dst_t)";
              uVar41 = 0x55;
              goto LAB_0012b965;
            }
          }
          pcVar37 = 
          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
          ;
          uVar41 = 0x51;
LAB_0012b965:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                     ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
        }
        cVar30 = ggml_is_contiguous_1(pgVar43);
        if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(pgVar42), cVar30 != '\0')) &&
           (cVar30 = ggml_are_same_shape(pgVar43,pgVar42), cVar30 != '\0')) {
          if (pgVar42->nb[0] == 4) {
            if (pgVar43->nb[0] == 2) {
              lVar39 = pgVar43->ne[1];
              lVar54 = pgVar43->ne[2];
              sVar6 = pgVar43->nb[1];
              sVar7 = pgVar43->nb[2];
              sVar8 = pgVar43->nb[3];
              lVar36 = pgVar42->ne[0];
              sVar9 = pgVar42->nb[1];
              sVar10 = pgVar42->nb[2];
              sVar11 = pgVar42->nb[3];
              gVar2 = dst->type;
              iVar3 = *(int *)&dst->field_0x4;
              lVar32 = ggml_nrows(pgVar43);
              lVar33 = ((long)iVar3 + -1 + lVar32) / (long)iVar3;
              lVar53 = (int)gVar2 * lVar33;
              lVar33 = lVar33 + lVar53;
              if (lVar32 <= lVar33) {
                lVar33 = lVar32;
              }
              if (lVar53 < lVar33) {
                lVar54 = lVar54 * lVar39;
                do {
                  lVar32 = lVar53 / lVar54;
                  lVar38 = lVar53 % lVar54;
                  lVar34 = lVar38 / lVar39;
                  lVar38 = lVar38 % lVar39;
                  if (0 < lVar36) {
                    pvVar12 = pgVar42->data;
                    pvVar13 = pgVar43->data;
                    lVar35 = 0;
                    do {
                      fVar70 = tanhf(*(float *)(&ggml_table_f32_f16 +
                                               (ulong)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar35 * 2 +
                                                       lVar34 * sVar7 +
                                                       lVar38 * sVar6 + lVar32 * sVar8) * 4));
                      *(float *)((long)pvVar12 +
                                lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                           fVar70;
                      lVar35 = lVar35 + 1;
                    } while (lVar36 != lVar35);
                  }
                  lVar53 = lVar53 + 1;
                } while (lVar53 != lVar33);
              }
              return;
            }
            goto LAB_0012b071;
          }
LAB_0012b055:
          pcVar37 = "nb0 == sizeof(dst_t)";
          uVar41 = 0x55;
          goto LAB_0012b08b;
        }
      }
      pcVar37 = 
      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
      uVar41 = 0x51;
LAB_0012b08b:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                 ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
    }
    cVar30 = ggml_is_contiguous_1(pgVar42);
    if (((cVar30 != '\0') && (cVar30 = ggml_is_contiguous_1(dst), cVar30 != '\0')) &&
       (cVar30 = ggml_are_same_shape(pgVar42,dst), cVar30 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar42->nb[0] == 2) {
          lVar39 = pgVar42->ne[1];
          lVar54 = pgVar42->ne[2];
          sVar6 = pgVar42->nb[1];
          sVar7 = pgVar42->nb[2];
          sVar8 = pgVar42->nb[3];
          lVar36 = dst->ne[0];
          sVar9 = dst->nb[1];
          sVar10 = dst->nb[2];
          sVar11 = dst->nb[3];
          iVar3 = params->ith;
          iVar4 = params->nth;
          lVar32 = ggml_nrows();
          lVar33 = ((long)iVar4 + -1 + lVar32) / (long)iVar4;
          lVar53 = iVar3 * lVar33;
          lVar33 = lVar33 + lVar53;
          if (lVar32 <= lVar33) {
            lVar33 = lVar32;
          }
          if (lVar53 < lVar33) {
            lVar54 = lVar54 * lVar39;
            pvVar12 = dst->data;
            pvVar13 = pgVar42->data;
            do {
              lVar32 = lVar53 / lVar54;
              lVar38 = lVar53 % lVar54;
              lVar34 = lVar38 / lVar39;
              lVar38 = lVar38 % lVar39;
              if (0 < lVar36) {
                lVar35 = 0;
                do {
                  uVar41 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                          ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                           (ulong)*(ushort *)
                                                                   ((long)pvVar13 +
                                                                   lVar35 * 2 +
                                                                   lVar34 * sVar7 +
                                                                   lVar38 * sVar6 + lVar32 * sVar8)
                                                           * 4)),1);
                  *(uint *)((long)pvVar12 +
                           lVar35 * 4 + lVar34 * sVar10 + lVar38 * sVar9 + lVar32 * sVar11) =
                       (uint)((byte)uVar41 & 1) * 0x3f800000;
                  lVar35 = lVar35 + 1;
                } while (lVar36 != lVar35);
              }
              lVar53 = lVar53 + 1;
            } while (lVar53 != lVar33);
          }
          return;
        }
        goto LAB_0012a7e5;
      }
LAB_0012a7c9:
      pcVar37 = "nb0 == sizeof(dst_t)";
      uVar41 = 0x55;
      goto LAB_0012a7ff;
    }
  }
  pcVar37 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar41 = 0x51;
LAB_0012a7ff:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar41,"GGML_ASSERT(%s) failed",pcVar37);
}

Assistant:

void ggml_compute_forward_step(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_step>(params, dst);
}